

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [28];
  undefined8 uVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  Primitive PVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [28];
  undefined1 auVar114 [28];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  undefined1 auVar118 [24];
  uint uVar119;
  uint uVar120;
  ulong uVar121;
  uint uVar122;
  ulong uVar123;
  uint uVar124;
  long lVar125;
  long lVar126;
  RayHit *pRVar127;
  long lVar128;
  undefined1 auVar129 [8];
  undefined4 uVar130;
  undefined8 unaff_R13;
  long lVar131;
  float fVar132;
  float fVar151;
  float fVar153;
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar160;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar152;
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar163;
  float fVar178;
  float fVar181;
  float fVar184;
  undefined1 auVar166 [16];
  float fVar164;
  float fVar165;
  undefined1 auVar169 [16];
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar170 [32];
  float fVar187;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar191;
  float fVar209;
  float fVar212;
  vint4 bi_2;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar192;
  float fVar193;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar210;
  float fVar214;
  undefined1 auVar205 [32];
  float fVar211;
  float fVar213;
  float fVar215;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar216;
  float fVar225;
  float fVar226;
  vint4 bi;
  undefined1 auVar221 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar227;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar234;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar237;
  float fVar239;
  float fVar241;
  float fVar242;
  undefined1 auVar231 [32];
  float fVar235;
  float fVar236;
  float fVar238;
  float fVar240;
  undefined1 auVar232 [32];
  float fVar243;
  float fVar244;
  undefined1 auVar233 [32];
  float fVar245;
  float fVar252;
  vint4 ai_1;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar253;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar262;
  float fVar265;
  vint4 bi_1;
  undefined1 auVar257 [16];
  float fVar267;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar263;
  float fVar266;
  float fVar268;
  float fVar270;
  float fVar271;
  float fVar273;
  undefined1 auVar260 [32];
  float fVar264;
  float fVar269;
  float fVar272;
  float fVar274;
  undefined1 auVar261 [32];
  vint4 ai_2;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar281;
  float fVar282;
  float fVar290;
  float fVar292;
  undefined1 auVar283 [16];
  float fVar291;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar293;
  float fVar295;
  float fVar298;
  undefined1 auVar287 [32];
  float fVar296;
  undefined1 auVar288 [32];
  float fVar294;
  float fVar297;
  float fVar299;
  float fVar300;
  undefined1 auVar289 [64];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar307;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar308;
  float fVar309;
  float fVar317;
  float fVar320;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar318;
  float fVar321;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar319 [12];
  undefined1 auVar316 [64];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  undefined1 auVar337 [16];
  float fVar342;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar343;
  undefined1 auVar341 [64];
  float fVar344;
  float fVar348;
  float fVar349;
  undefined1 auVar345 [16];
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar354;
  float fVar358;
  float fVar359;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  RayHit *local_7c0;
  ulong local_7b8;
  uint local_7ac;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  undefined1 auStack_798 [8];
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 local_750 [8];
  undefined8 uStack_748;
  Primitive *local_740;
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined8 local_610;
  undefined4 local_608;
  float local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [2] [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  uint local_1e0;
  uint local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_160 [4];
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar198 [16];
  undefined1 auVar248 [16];
  undefined1 auVar278 [32];
  undefined1 auVar284 [16];
  undefined1 auVar306 [64];
  undefined1 auVar355 [16];
  
  PVar13 = prim[1];
  uVar121 = (ulong)(byte)PVar13;
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 4 + 6)));
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 5 + 6)));
  local_738 = pre;
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 6 + 6)));
  lVar125 = uVar121 * 0x25;
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0x11 + 6)));
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0x1a + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0x1b + 6)));
  fVar308 = *(float *)(prim + lVar125 + 0x12);
  auVar25 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar125 + 6));
  auVar228._0_4_ = fVar308 * auVar25._0_4_;
  auVar228._4_4_ = fVar308 * auVar25._4_4_;
  auVar228._8_4_ = fVar308 * auVar25._8_4_;
  auVar228._12_4_ = fVar308 * auVar25._12_4_;
  auVar310._0_4_ = fVar308 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar310._4_4_ = fVar308 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar310._8_4_ = fVar308 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar310._12_4_ = fVar308 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar25 = vcvtdq2ps_avx(auVar201);
  auVar18 = vcvtdq2ps_avx(auVar202);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar202 = vshufps_avx(auVar310,auVar310,0x55);
  auVar24 = vshufps_avx(auVar310,auVar310,0xaa);
  fVar254 = auVar24._0_4_;
  fVar262 = auVar24._4_4_;
  fVar265 = auVar24._8_4_;
  fVar267 = auVar24._12_4_;
  fVar308 = auVar202._0_4_;
  fVar317 = auVar202._4_4_;
  fVar320 = auVar202._8_4_;
  fVar321 = auVar202._12_4_;
  auVar24 = vcvtdq2ps_avx(auVar168);
  auVar19 = vcvtdq2ps_avx(auVar221);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar20 = vcvtdq2ps_avx(auVar201);
  auVar168 = vshufps_avx(auVar310,auVar310,0);
  fVar163 = auVar168._0_4_;
  fVar178 = auVar168._4_4_;
  fVar181 = auVar168._8_4_;
  fVar184 = auVar168._12_4_;
  auVar283._0_4_ = fVar163 * auVar24._0_4_ + fVar308 * auVar25._0_4_ + fVar254 * auVar18._0_4_;
  auVar283._4_4_ = fVar178 * auVar24._4_4_ + fVar317 * auVar25._4_4_ + fVar262 * auVar18._4_4_;
  auVar283._8_4_ = fVar181 * auVar24._8_4_ + fVar320 * auVar25._8_4_ + fVar265 * auVar18._8_4_;
  auVar283._12_4_ = fVar184 * auVar24._12_4_ + fVar321 * auVar25._12_4_ + fVar267 * auVar18._12_4_;
  auVar194._0_4_ = fVar163 * auVar19._0_4_ + fVar308 * auVar21._0_4_ + fVar254 * auVar22._0_4_;
  auVar194._4_4_ = fVar178 * auVar19._4_4_ + fVar317 * auVar21._4_4_ + fVar262 * auVar22._4_4_;
  auVar194._8_4_ = fVar181 * auVar19._8_4_ + fVar320 * auVar21._8_4_ + fVar265 * auVar22._8_4_;
  auVar194._12_4_ = fVar184 * auVar19._12_4_ + fVar321 * auVar21._12_4_ + fVar267 * auVar22._12_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar121 * 7 + 6);
  auVar134 = vpmovsxwd_avx(auVar168);
  auVar168 = vcvtdq2ps_avx(auVar133);
  auVar311._0_4_ = fVar308 * auVar23._0_4_ + fVar254 * auVar20._0_4_ + fVar163 * auVar168._0_4_;
  auVar311._4_4_ = fVar317 * auVar23._4_4_ + fVar262 * auVar20._4_4_ + fVar178 * auVar168._4_4_;
  auVar311._8_4_ = fVar320 * auVar23._8_4_ + fVar265 * auVar20._8_4_ + fVar181 * auVar168._8_4_;
  auVar311._12_4_ = fVar321 * auVar23._12_4_ + fVar267 * auVar20._12_4_ + fVar184 * auVar168._12_4_;
  auVar201 = vshufps_avx(auVar228,auVar228,0xaa);
  fVar254 = auVar201._0_4_;
  fVar262 = auVar201._4_4_;
  fVar265 = auVar201._8_4_;
  fVar267 = auVar201._12_4_;
  auVar201 = vshufps_avx(auVar228,auVar228,0x55);
  fVar308 = auVar201._0_4_;
  fVar320 = auVar201._4_4_;
  fVar163 = auVar201._8_4_;
  fVar181 = auVar201._12_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar121 * 0xb + 6);
  auVar133 = vpmovsxwd_avx(auVar201);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar121 * 9 + 6);
  auVar135 = vpmovsxwd_avx(auVar202);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar121 * 0xd + 6);
  auVar221 = vpmovsxwd_avx(auVar221);
  auVar201 = vshufps_avx(auVar228,auVar228,0);
  fVar317 = auVar201._0_4_;
  fVar321 = auVar201._4_4_;
  fVar178 = auVar201._8_4_;
  fVar184 = auVar201._12_4_;
  auVar301._0_4_ = auVar24._0_4_ * fVar317 + auVar25._0_4_ * fVar308 + fVar254 * auVar18._0_4_;
  auVar301._4_4_ = auVar24._4_4_ * fVar321 + auVar25._4_4_ * fVar320 + fVar262 * auVar18._4_4_;
  auVar301._8_4_ = auVar24._8_4_ * fVar178 + auVar25._8_4_ * fVar163 + fVar265 * auVar18._8_4_;
  auVar301._12_4_ = auVar24._12_4_ * fVar184 + auVar25._12_4_ * fVar181 + fVar267 * auVar18._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar121 * 0x12 + 6);
  auVar25 = vpmovsxwd_avx(auVar25);
  auVar275._0_4_ = auVar22._0_4_ * fVar254 + auVar21._0_4_ * fVar308 + fVar317 * auVar19._0_4_;
  auVar275._4_4_ = auVar22._4_4_ * fVar262 + auVar21._4_4_ * fVar320 + fVar321 * auVar19._4_4_;
  auVar275._8_4_ = auVar22._8_4_ * fVar265 + auVar21._8_4_ * fVar163 + fVar178 * auVar19._8_4_;
  auVar275._12_4_ = auVar22._12_4_ * fVar267 + auVar21._12_4_ * fVar181 + fVar184 * auVar19._12_4_;
  auVar229._0_4_ = auVar168._0_4_ * fVar317 + fVar308 * auVar23._0_4_ + fVar254 * auVar20._0_4_;
  auVar229._4_4_ = auVar168._4_4_ * fVar321 + fVar320 * auVar23._4_4_ + fVar262 * auVar20._4_4_;
  auVar229._8_4_ = auVar168._8_4_ * fVar178 + fVar163 * auVar23._8_4_ + fVar265 * auVar20._8_4_;
  auVar229._12_4_ = auVar168._12_4_ * fVar184 + fVar181 * auVar23._12_4_ + fVar267 * auVar20._12_4_;
  auVar345._8_4_ = 0x7fffffff;
  auVar345._0_8_ = 0x7fffffff7fffffff;
  auVar345._12_4_ = 0x7fffffff;
  auVar168 = vandps_avx(auVar283,auVar345);
  auVar322._8_4_ = 0x219392ef;
  auVar322._0_8_ = 0x219392ef219392ef;
  auVar322._12_4_ = 0x219392ef;
  auVar168 = vcmpps_avx(auVar168,auVar322,1);
  auVar201 = vblendvps_avx(auVar283,auVar322,auVar168);
  auVar168 = vandps_avx(auVar345,auVar194);
  auVar168 = vcmpps_avx(auVar168,auVar322,1);
  auVar202 = vblendvps_avx(auVar194,auVar322,auVar168);
  auVar168 = vandps_avx(auVar311,auVar345);
  auVar168 = vcmpps_avx(auVar168,auVar322,1);
  auVar168 = vblendvps_avx(auVar311,auVar322,auVar168);
  auVar18 = vrcpps_avx(auVar201);
  fVar254 = auVar18._0_4_;
  auVar257._0_4_ = fVar254 * auVar201._0_4_;
  fVar262 = auVar18._4_4_;
  auVar257._4_4_ = fVar262 * auVar201._4_4_;
  fVar265 = auVar18._8_4_;
  auVar257._8_4_ = fVar265 * auVar201._8_4_;
  fVar267 = auVar18._12_4_;
  auVar257._12_4_ = fVar267 * auVar201._12_4_;
  auVar323._8_4_ = 0x3f800000;
  auVar323._0_8_ = 0x3f8000003f800000;
  auVar323._12_4_ = 0x3f800000;
  auVar201 = vsubps_avx(auVar323,auVar257);
  fVar254 = fVar254 + fVar254 * auVar201._0_4_;
  fVar262 = fVar262 + fVar262 * auVar201._4_4_;
  fVar265 = fVar265 + fVar265 * auVar201._8_4_;
  fVar267 = fVar267 + fVar267 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar202);
  fVar281 = auVar201._0_4_;
  auVar195._0_4_ = fVar281 * auVar202._0_4_;
  fVar290 = auVar201._4_4_;
  auVar195._4_4_ = fVar290 * auVar202._4_4_;
  fVar292 = auVar201._8_4_;
  auVar195._8_4_ = fVar292 * auVar202._8_4_;
  fVar294 = auVar201._12_4_;
  auVar195._12_4_ = fVar294 * auVar202._12_4_;
  auVar201 = vsubps_avx(auVar323,auVar195);
  fVar281 = fVar281 + fVar281 * auVar201._0_4_;
  fVar290 = fVar290 + fVar290 * auVar201._4_4_;
  fVar292 = fVar292 + fVar292 * auVar201._8_4_;
  fVar294 = fVar294 + fVar294 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar168);
  fVar308 = auVar201._0_4_;
  auVar312._0_4_ = auVar168._0_4_ * fVar308;
  fVar317 = auVar201._4_4_;
  auVar312._4_4_ = auVar168._4_4_ * fVar317;
  fVar320 = auVar201._8_4_;
  auVar312._8_4_ = auVar168._8_4_ * fVar320;
  fVar321 = auVar201._12_4_;
  auVar312._12_4_ = auVar168._12_4_ * fVar321;
  auVar168 = vsubps_avx(auVar323,auVar312);
  fVar308 = auVar168._0_4_ * fVar308 + fVar308;
  fVar317 = auVar168._4_4_ * fVar317 + fVar317;
  fVar320 = auVar168._8_4_ * fVar320 + fVar320;
  fVar321 = auVar168._12_4_ * fVar321 + fVar321;
  auVar202 = vpermilps_avx(ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                                          *(float *)(prim + lVar125 + 0x16)) *
                                         *(float *)(prim + lVar125 + 0x1a))),0);
  auVar168 = vcvtdq2ps_avx(auVar134);
  auVar201 = vcvtdq2ps_avx(auVar133);
  auVar201 = vsubps_avx(auVar201,auVar168);
  fVar163 = auVar202._0_4_;
  fVar178 = auVar202._4_4_;
  fVar181 = auVar202._8_4_;
  fVar184 = auVar202._12_4_;
  auVar133._0_4_ = fVar163 * auVar201._0_4_ + auVar168._0_4_;
  auVar133._4_4_ = fVar178 * auVar201._4_4_ + auVar168._4_4_;
  auVar133._8_4_ = fVar181 * auVar201._8_4_ + auVar168._8_4_;
  auVar133._12_4_ = fVar184 * auVar201._12_4_ + auVar168._12_4_;
  auVar168 = vcvtdq2ps_avx(auVar135);
  auVar201 = vcvtdq2ps_avx(auVar221);
  auVar201 = vsubps_avx(auVar201,auVar168);
  auVar217._0_4_ = fVar163 * auVar201._0_4_ + auVar168._0_4_;
  auVar217._4_4_ = fVar178 * auVar201._4_4_ + auVar168._4_4_;
  auVar217._8_4_ = fVar181 * auVar201._8_4_ + auVar168._8_4_;
  auVar217._12_4_ = fVar184 * auVar201._12_4_ + auVar168._12_4_;
  auVar168 = vcvtdq2ps_avx(auVar25);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar121 * 0x16 + 6);
  auVar201 = vpmovsxwd_avx(auVar18);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar168);
  auVar246._0_4_ = auVar201._0_4_ * fVar163 + auVar168._0_4_;
  auVar246._4_4_ = auVar201._4_4_ * fVar178 + auVar168._4_4_;
  auVar246._8_4_ = auVar201._8_4_ * fVar181 + auVar168._8_4_;
  auVar246._12_4_ = auVar201._12_4_ * fVar184 + auVar168._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar121 * 0x14 + 6);
  auVar168 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar121 * 0x18 + 6);
  auVar201 = vpmovsxwd_avx(auVar22);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar168);
  auVar324._0_4_ = auVar201._0_4_ * fVar163 + auVar168._0_4_;
  auVar324._4_4_ = auVar201._4_4_ * fVar178 + auVar168._4_4_;
  auVar324._8_4_ = auVar201._8_4_ * fVar181 + auVar168._8_4_;
  auVar324._12_4_ = auVar201._12_4_ * fVar184 + auVar168._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar121 * 0x1d + 6);
  auVar168 = vpmovsxwd_avx(auVar24);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar121 * 0x21 + 6);
  auVar201 = vpmovsxwd_avx(auVar19);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar168);
  auVar329._0_4_ = auVar201._0_4_ * fVar163 + auVar168._0_4_;
  auVar329._4_4_ = auVar201._4_4_ * fVar178 + auVar168._4_4_;
  auVar329._8_4_ = auVar201._8_4_ * fVar181 + auVar168._8_4_;
  auVar329._12_4_ = auVar201._12_4_ * fVar184 + auVar168._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar121 * 0x1f + 6);
  auVar168 = vpmovsxwd_avx(auVar23);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar121 * 0x23 + 6);
  auVar201 = vpmovsxwd_avx(auVar20);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar168);
  auVar196._0_4_ = auVar168._0_4_ + auVar201._0_4_ * fVar163;
  auVar196._4_4_ = auVar168._4_4_ + auVar201._4_4_ * fVar178;
  auVar196._8_4_ = auVar168._8_4_ + auVar201._8_4_ * fVar181;
  auVar196._12_4_ = auVar168._12_4_ + auVar201._12_4_ * fVar184;
  auVar168 = vsubps_avx(auVar133,auVar301);
  auVar134._0_4_ = fVar254 * auVar168._0_4_;
  auVar134._4_4_ = fVar262 * auVar168._4_4_;
  auVar134._8_4_ = fVar265 * auVar168._8_4_;
  auVar134._12_4_ = fVar267 * auVar168._12_4_;
  auVar168 = vsubps_avx(auVar217,auVar301);
  auVar218._0_4_ = fVar254 * auVar168._0_4_;
  auVar218._4_4_ = fVar262 * auVar168._4_4_;
  auVar218._8_4_ = fVar265 * auVar168._8_4_;
  auVar218._12_4_ = fVar267 * auVar168._12_4_;
  auVar168 = vsubps_avx(auVar246,auVar275);
  auVar247._0_4_ = fVar281 * auVar168._0_4_;
  auVar247._4_4_ = fVar290 * auVar168._4_4_;
  auVar247._8_4_ = fVar292 * auVar168._8_4_;
  auVar247._12_4_ = fVar294 * auVar168._12_4_;
  auVar168 = vsubps_avx(auVar324,auVar275);
  auVar258._0_4_ = fVar281 * auVar168._0_4_;
  auVar258._4_4_ = fVar290 * auVar168._4_4_;
  auVar258._8_4_ = fVar292 * auVar168._8_4_;
  auVar258._12_4_ = fVar294 * auVar168._12_4_;
  auVar168 = vsubps_avx(auVar329,auVar229);
  auVar276._0_4_ = fVar308 * auVar168._0_4_;
  auVar276._4_4_ = fVar317 * auVar168._4_4_;
  auVar276._8_4_ = fVar320 * auVar168._8_4_;
  auVar276._12_4_ = fVar321 * auVar168._12_4_;
  auVar168 = vsubps_avx(auVar196,auVar229);
  auVar197._0_4_ = fVar308 * auVar168._0_4_;
  auVar197._4_4_ = fVar317 * auVar168._4_4_;
  auVar197._8_4_ = fVar320 * auVar168._8_4_;
  auVar197._12_4_ = fVar321 * auVar168._12_4_;
  auVar168 = vpminsd_avx(auVar134,auVar218);
  auVar201 = vpminsd_avx(auVar247,auVar258);
  auVar168 = vmaxps_avx(auVar168,auVar201);
  auVar201 = vpminsd_avx(auVar276,auVar197);
  uVar130 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar302._4_4_ = uVar130;
  auVar302._0_4_ = uVar130;
  auVar302._8_4_ = uVar130;
  auVar302._12_4_ = uVar130;
  auVar306 = ZEXT1664(auVar302);
  auVar201 = vmaxps_avx(auVar201,auVar302);
  auVar168 = vmaxps_avx(auVar168,auVar201);
  auVar289 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
  local_250._0_4_ = auVar168._0_4_ * 0.99999964;
  local_250._4_4_ = auVar168._4_4_ * 0.99999964;
  local_250._8_4_ = auVar168._8_4_ * 0.99999964;
  local_250._12_4_ = auVar168._12_4_ * 0.99999964;
  auVar168 = vpmaxsd_avx(auVar134,auVar218);
  auVar201 = vpmaxsd_avx(auVar247,auVar258);
  auVar168 = vminps_avx(auVar168,auVar201);
  auVar201 = vpmaxsd_avx(auVar276,auVar197);
  fVar308 = (ray->super_RayK<1>).tfar;
  auVar219._4_4_ = fVar308;
  auVar219._0_4_ = fVar308;
  auVar219._8_4_ = fVar308;
  auVar219._12_4_ = fVar308;
  auVar201 = vminps_avx(auVar201,auVar219);
  auVar168 = vminps_avx(auVar168,auVar201);
  auVar135._0_4_ = auVar168._0_4_ * 1.0000004;
  auVar135._4_4_ = auVar168._4_4_ * 1.0000004;
  auVar135._8_4_ = auVar168._8_4_ * 1.0000004;
  auVar135._12_4_ = auVar168._12_4_ * 1.0000004;
  auVar168 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar201 = vpcmpgtd_avx(auVar168,_DAT_01f4ad30);
  auVar168 = vcmpps_avx(local_250,auVar135,2);
  auVar168 = vandps_avx(auVar168,auVar201);
  uVar130 = vmovmskps_avx(auVar168);
  uVar121 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar130);
  local_480[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_480[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_480[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_480[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_740 = prim;
  local_7c0 = ray;
  do {
    if (uVar121 == 0) {
      return;
    }
    local_680 = auVar306._0_32_;
    local_6e0 = auVar289._0_32_;
    lVar125 = 0;
    if (uVar121 != 0) {
      for (; (uVar121 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
      }
    }
    uVar122 = *(uint *)(prim + 2);
    uVar120 = *(uint *)(prim + lVar125 * 4 + 6);
    local_7b8 = (ulong)uVar122;
    pGVar14 = (context->scene->geometries).items[uVar122].ptr;
    local_7a8 = (ulong)uVar120;
    uVar123 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                              (ulong)uVar120 *
                              pGVar14[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar308 = (pGVar14->time_range).lower;
    fVar308 = pGVar14->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar308) /
              ((pGVar14->time_range).upper - fVar308));
    auVar168 = vroundss_avx(ZEXT416((uint)fVar308),ZEXT416((uint)fVar308),9);
    auVar168 = vminss_avx(auVar168,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
    auVar168 = vmaxss_avx(ZEXT816(0) << 0x20,auVar168);
    fVar308 = fVar308 - auVar168._0_4_;
    _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar128 = (long)(int)auVar168._0_4_ * 0x38;
    lVar125 = *(long *)(_Var15 + 0x10 + lVar128);
    lVar131 = *(long *)(_Var15 + 0x38 + lVar128);
    lVar126 = *(long *)(_Var15 + 0x48 + lVar128);
    auVar168 = vshufps_avx(ZEXT416((uint)fVar308),ZEXT416((uint)fVar308),0);
    pfVar1 = (float *)(lVar131 + uVar123 * lVar126);
    fVar163 = auVar168._0_4_;
    fVar178 = auVar168._4_4_;
    fVar181 = auVar168._8_4_;
    fVar184 = auVar168._12_4_;
    pfVar2 = (float *)(lVar131 + (uVar123 + 1) * lVar126);
    pfVar3 = (float *)(lVar131 + (uVar123 + 2) * lVar126);
    pfVar4 = (float *)(lVar131 + lVar126 * (uVar123 + 3));
    lVar131 = *(long *)(_Var15 + lVar128);
    auVar168 = vshufps_avx(ZEXT416((uint)(1.0 - fVar308)),ZEXT416((uint)(1.0 - fVar308)),0);
    pfVar5 = (float *)(lVar131 + lVar125 * uVar123);
    fVar308 = auVar168._0_4_;
    fVar317 = auVar168._4_4_;
    fVar320 = auVar168._8_4_;
    fVar321 = auVar168._12_4_;
    pfVar6 = (float *)(lVar131 + lVar125 * (uVar123 + 1));
    fVar245 = fVar163 * *pfVar1 + fVar308 * *pfVar5;
    fVar252 = fVar178 * pfVar1[1] + fVar317 * pfVar5[1];
    auVar248._0_8_ = CONCAT44(fVar252,fVar245);
    auVar248._8_4_ = fVar181 * pfVar1[2] + fVar320 * pfVar5[2];
    auVar248._12_4_ = fVar184 * pfVar1[3] + fVar321 * pfVar5[3];
    fVar282 = fVar308 * *pfVar6 + fVar163 * *pfVar2;
    fVar291 = fVar317 * pfVar6[1] + fVar178 * pfVar2[1];
    auVar284._0_8_ = CONCAT44(fVar291,fVar282);
    auVar284._8_4_ = fVar320 * pfVar6[2] + fVar181 * pfVar2[2];
    auVar284._12_4_ = fVar321 * pfVar6[3] + fVar184 * pfVar2[3];
    pfVar1 = (float *)(lVar131 + lVar125 * (uVar123 + 2));
    pfVar2 = (float *)(lVar131 + lVar125 * (uVar123 + 3));
    fVar354 = fVar308 * *pfVar1 + fVar163 * *pfVar3;
    fVar358 = fVar317 * pfVar1[1] + fVar178 * pfVar3[1];
    auVar355._0_8_ = CONCAT44(fVar358,fVar354);
    auVar355._8_4_ = fVar320 * pfVar1[2] + fVar181 * pfVar3[2];
    auVar355._12_4_ = fVar321 * pfVar1[3] + fVar184 * pfVar3[3];
    fVar191 = fVar308 * *pfVar2 + fVar163 * *pfVar4;
    fVar209 = fVar317 * pfVar2[1] + fVar178 * pfVar4[1];
    auVar198._0_8_ = CONCAT44(fVar209,fVar191);
    auVar198._8_4_ = fVar320 * pfVar2[2] + fVar181 * pfVar4[2];
    auVar198._12_4_ = fVar321 * pfVar2[3] + fVar184 * pfVar4[3];
    uVar124 = (uint)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar12 = (local_7c0->super_RayK<1>).org.field_0;
    auVar202 = vsubps_avx(auVar248,(undefined1  [16])aVar12);
    _local_750 = auVar248;
    auVar22 = _local_750;
    auVar168 = vshufps_avx(auVar202,auVar202,0);
    auVar201 = vshufps_avx(auVar202,auVar202,0x55);
    auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
    fVar308 = (local_738->ray_space).vx.field_0.m128[0];
    fVar317 = (local_738->ray_space).vx.field_0.m128[1];
    fVar320 = (local_738->ray_space).vx.field_0.m128[2];
    fVar321 = (local_738->ray_space).vx.field_0.m128[3];
    fVar163 = (local_738->ray_space).vy.field_0.m128[0];
    fVar178 = (local_738->ray_space).vy.field_0.m128[1];
    fVar181 = (local_738->ray_space).vy.field_0.m128[2];
    fVar184 = (local_738->ray_space).vy.field_0.m128[3];
    fVar254 = (local_738->ray_space).vz.field_0.m128[0];
    fVar262 = (local_738->ray_space).vz.field_0.m128[1];
    fVar265 = (local_738->ray_space).vz.field_0.m128[2];
    fVar267 = (local_738->ray_space).vz.field_0.m128[3];
    auVar220._0_4_ = auVar168._0_4_ * fVar308 + auVar202._0_4_ * fVar254 + auVar201._0_4_ * fVar163;
    auVar220._4_4_ = auVar168._4_4_ * fVar317 + auVar202._4_4_ * fVar262 + auVar201._4_4_ * fVar178;
    auVar220._8_4_ = auVar168._8_4_ * fVar320 + auVar202._8_4_ * fVar265 + auVar201._8_4_ * fVar181;
    auVar220._12_4_ =
         auVar168._12_4_ * fVar321 + auVar202._12_4_ * fVar267 + auVar201._12_4_ * fVar184;
    auVar168 = vblendps_avx(auVar220,auVar248,8);
    _local_760 = auVar284;
    auVar21 = _local_760;
    auVar221 = vsubps_avx(auVar284,(undefined1  [16])aVar12);
    auVar201 = vshufps_avx(auVar221,auVar221,0);
    auVar202 = vshufps_avx(auVar221,auVar221,0x55);
    auVar221 = vshufps_avx(auVar221,auVar221,0xaa);
    auVar337._0_4_ = auVar201._0_4_ * fVar308 + auVar221._0_4_ * fVar254 + auVar202._0_4_ * fVar163;
    auVar337._4_4_ = auVar201._4_4_ * fVar317 + auVar221._4_4_ * fVar262 + auVar202._4_4_ * fVar178;
    auVar337._8_4_ = auVar201._8_4_ * fVar320 + auVar221._8_4_ * fVar265 + auVar202._8_4_ * fVar181;
    auVar337._12_4_ =
         auVar201._12_4_ * fVar321 + auVar221._12_4_ * fVar267 + auVar202._12_4_ * fVar184;
    auVar201 = vblendps_avx(auVar337,auVar284,8);
    local_5c0._0_16_ = (undefined1  [16])aVar12;
    auVar25 = vsubps_avx(auVar355,(undefined1  [16])aVar12);
    auVar202 = vshufps_avx(auVar25,auVar25,0);
    auVar221 = vshufps_avx(auVar25,auVar25,0x55);
    auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
    auVar259._0_4_ = auVar202._0_4_ * fVar308 + auVar221._0_4_ * fVar163 + auVar25._0_4_ * fVar254;
    auVar259._4_4_ = auVar202._4_4_ * fVar317 + auVar221._4_4_ * fVar178 + auVar25._4_4_ * fVar262;
    auVar259._8_4_ = auVar202._8_4_ * fVar320 + auVar221._8_4_ * fVar181 + auVar25._8_4_ * fVar265;
    auVar259._12_4_ =
         auVar202._12_4_ * fVar321 + auVar221._12_4_ * fVar184 + auVar25._12_4_ * fVar267;
    auVar202 = vblendps_avx(auVar259,auVar355,8);
    auVar18 = vsubps_avx(auVar198,(undefined1  [16])aVar12);
    auVar221 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar25 = vshufps_avx(auVar18,auVar18,0);
    auVar18 = vshufps_avx(auVar18,auVar18,0x55);
    auVar166._0_4_ = auVar25._0_4_ * fVar308 + auVar221._0_4_ * fVar254 + auVar18._0_4_ * fVar163;
    auVar166._4_4_ = auVar25._4_4_ * fVar317 + auVar221._4_4_ * fVar262 + auVar18._4_4_ * fVar178;
    auVar166._8_4_ = auVar25._8_4_ * fVar320 + auVar221._8_4_ * fVar265 + auVar18._8_4_ * fVar181;
    auVar166._12_4_ =
         auVar25._12_4_ * fVar321 + auVar221._12_4_ * fVar267 + auVar18._12_4_ * fVar184;
    auVar221 = vblendps_avx(auVar166,auVar198,8);
    auVar230._8_4_ = 0x7fffffff;
    auVar230._0_8_ = 0x7fffffff7fffffff;
    auVar230._12_4_ = 0x7fffffff;
    auVar168 = vandps_avx(auVar168,auVar230);
    auVar201 = vandps_avx(auVar201,auVar230);
    auVar25 = vmaxps_avx(auVar168,auVar201);
    auVar168 = vandps_avx(auVar202,auVar230);
    auVar201 = vandps_avx(auVar221,auVar230);
    auVar168 = vmaxps_avx(auVar168,auVar201);
    auVar168 = vmaxps_avx(auVar25,auVar168);
    auVar201 = vmovshdup_avx(auVar168);
    auVar201 = vmaxss_avx(auVar201,auVar168);
    auVar168 = vshufpd_avx(auVar168,auVar168,1);
    auVar168 = vmaxss_avx(auVar168,auVar201);
    lVar125 = (long)(int)uVar124;
    lVar131 = lVar125 * 0x44;
    fVar292 = *(float *)(catmullrom_basis0 + lVar131 + 0x908);
    fVar294 = *(float *)(catmullrom_basis0 + lVar131 + 0x90c);
    fVar325 = *(float *)(catmullrom_basis0 + lVar131 + 0x910);
    fVar188 = *(float *)(catmullrom_basis0 + lVar131 + 0x914);
    fVar326 = *(float *)(catmullrom_basis0 + lVar131 + 0x918);
    fVar342 = *(float *)(catmullrom_basis0 + lVar131 + 0x91c);
    fVar327 = *(float *)(catmullrom_basis0 + lVar131 + 0x920);
    auVar201 = vshufps_avx(auVar259,auVar259,0);
    register0x00001250 = auVar201;
    _local_6c0 = auVar201;
    pauVar8 = (undefined1 (*) [32])(catmullrom_basis0 + lVar131 + 0xd8c);
    fVar308 = *(float *)*pauVar8;
    fVar317 = *(float *)(catmullrom_basis0 + lVar131 + 0xd90);
    fVar320 = *(float *)(catmullrom_basis0 + lVar131 + 0xd94);
    fVar321 = *(float *)(catmullrom_basis0 + lVar131 + 0xd98);
    fVar163 = *(float *)(catmullrom_basis0 + lVar131 + 0xd9c);
    fVar178 = *(float *)(catmullrom_basis0 + lVar131 + 0xda0);
    fVar181 = *(float *)(catmullrom_basis0 + lVar131 + 0xda4);
    auVar113 = *(undefined1 (*) [28])*pauVar8;
    _auStack_4f0 = SUB3216(*pauVar8,0x10);
    auVar202 = vshufps_avx(auVar166,auVar166,0);
    register0x00001590 = auVar202;
    _local_380 = auVar202;
    fVar241 = auVar202._0_4_;
    fVar293 = auVar202._4_4_;
    fVar295 = auVar202._8_4_;
    fVar297 = auVar202._12_4_;
    fVar164 = auVar201._0_4_;
    fVar179 = auVar201._4_4_;
    fVar182 = auVar201._8_4_;
    fVar185 = auVar201._12_4_;
    auVar201 = vshufps_avx(auVar259,auVar259,0x55);
    register0x000012d0 = auVar201;
    _local_780 = auVar201;
    auVar202 = vshufps_avx(auVar166,auVar166,0x55);
    register0x000014d0 = auVar202;
    _local_4a0 = auVar202;
    fVar159 = auVar202._0_4_;
    fVar161 = auVar202._4_4_;
    fVar256 = auVar202._8_4_;
    fVar264 = auVar202._12_4_;
    fVar216 = auVar201._0_4_;
    fVar225 = auVar201._4_4_;
    fVar226 = auVar201._8_4_;
    fVar227 = auVar201._12_4_;
    _local_690 = auVar355;
    auVar19 = _local_690;
    auVar201 = vshufps_avx(auVar355,auVar355,0xff);
    register0x00001390 = auVar201;
    _local_e0 = auVar201;
    _local_6a0 = auVar198;
    auVar24 = _local_6a0;
    auVar202 = vshufps_avx(auVar198,auVar198,0xff);
    register0x00001450 = auVar202;
    _local_80 = auVar202;
    fVar265 = auVar202._0_4_;
    fVar267 = auVar202._4_4_;
    fVar281 = auVar202._8_4_;
    fVar290 = auVar202._12_4_;
    fVar184 = auVar201._0_4_;
    fVar254 = auVar201._4_4_;
    fVar262 = auVar201._8_4_;
    local_560._0_16_ = auVar337;
    auVar202 = vshufps_avx(auVar337,auVar337,0);
    register0x00001290 = auVar202;
    _local_360 = auVar202;
    fVar190 = *(float *)(catmullrom_basis0 + lVar131 + 0x484);
    fVar328 = *(float *)(catmullrom_basis0 + lVar131 + 0x488);
    fVar343 = *(float *)(catmullrom_basis0 + lVar131 + 0x48c);
    fVar271 = *(float *)(catmullrom_basis0 + lVar131 + 0x490);
    fVar235 = *(float *)(catmullrom_basis0 + lVar131 + 0x494);
    fVar187 = *(float *)(catmullrom_basis0 + lVar131 + 0x498);
    fVar273 = *(float *)(catmullrom_basis0 + lVar131 + 0x49c);
    fVar157 = auVar202._0_4_;
    fVar269 = auVar202._4_4_;
    fVar270 = auVar202._8_4_;
    fVar272 = auVar202._12_4_;
    auVar202 = vshufps_avx(auVar337,auVar337,0x55);
    register0x00001290 = auVar202;
    _local_640 = auVar202;
    fVar192 = auVar202._0_4_;
    fVar210 = auVar202._4_4_;
    fVar212 = auVar202._8_4_;
    fVar214 = auVar202._12_4_;
    auVar202 = vpermilps_avx(auVar284,0xff);
    register0x000015d0 = auVar202;
    _local_a0 = auVar202;
    fVar193 = auVar202._0_4_;
    fVar211 = auVar202._4_4_;
    fVar213 = auVar202._8_4_;
    fVar215 = auVar202._12_4_;
    auVar202 = vshufps_avx(auVar220,auVar220,0);
    register0x00001250 = auVar202;
    _local_5a0 = auVar202;
    local_2c0 = *(float *)(catmullrom_basis0 + lVar131);
    fStack_2bc = *(float *)(catmullrom_basis0 + lVar131 + 4);
    fStack_2b8 = *(float *)(catmullrom_basis0 + lVar131 + 8);
    fStack_2b4 = *(float *)(catmullrom_basis0 + lVar131 + 0xc);
    fStack_2b0 = *(float *)(catmullrom_basis0 + lVar131 + 0x10);
    fStack_2ac = *(float *)(catmullrom_basis0 + lVar131 + 0x14);
    fStack_2a8 = *(float *)(catmullrom_basis0 + lVar131 + 0x18);
    fVar165 = auVar202._0_4_;
    fVar180 = auVar202._4_4_;
    fVar183 = auVar202._8_4_;
    fVar186 = auVar202._12_4_;
    auVar277._0_4_ = fVar165 * local_2c0 + fVar157 * fVar190 + fVar164 * fVar292 + fVar241 * fVar308
    ;
    auVar277._4_4_ =
         fVar180 * fStack_2bc + fVar269 * fVar328 + fVar179 * fVar294 + fVar293 * fVar317;
    auVar277._8_4_ =
         fVar183 * fStack_2b8 + fVar270 * fVar343 + fVar182 * fVar325 + fVar295 * fVar320;
    auVar277._12_4_ =
         fVar186 * fStack_2b4 + fVar272 * fVar271 + fVar185 * fVar188 + fVar297 * fVar321;
    auVar278._16_4_ =
         fVar165 * fStack_2b0 + fVar157 * fVar235 + fVar164 * fVar326 + fVar241 * fVar163;
    auVar278._0_16_ = auVar277;
    auVar278._20_4_ =
         fVar180 * fStack_2ac + fVar269 * fVar187 + fVar179 * fVar342 + fVar293 * fVar178;
    auVar278._24_4_ =
         fVar183 * fStack_2a8 + fVar270 * fVar273 + fVar182 * fVar327 + fVar295 * fVar181;
    auVar278._28_4_ =
         *(float *)(catmullrom_basis0 + lVar131 + 0xda8) +
         *(float *)(catmullrom_basis0 + lVar131 + 0x924) + fVar185 + 0.0;
    auVar202 = vshufps_avx(auVar220,auVar220,0x55);
    register0x00001410 = auVar202;
    _local_660 = auVar202;
    fVar234 = auVar202._0_4_;
    fVar236 = auVar202._4_4_;
    fVar237 = auVar202._8_4_;
    fVar239 = auVar202._12_4_;
    auVar331._0_4_ = fVar234 * local_2c0 + fVar192 * fVar190 + fVar216 * fVar292 + fVar159 * fVar308
    ;
    auVar331._4_4_ =
         fVar236 * fStack_2bc + fVar210 * fVar328 + fVar225 * fVar294 + fVar161 * fVar317;
    auVar331._8_4_ =
         fVar237 * fStack_2b8 + fVar212 * fVar343 + fVar226 * fVar325 + fVar256 * fVar320;
    auVar331._12_4_ =
         fVar239 * fStack_2b4 + fVar214 * fVar271 + fVar227 * fVar188 + fVar264 * fVar321;
    auVar331._16_4_ =
         fVar234 * fStack_2b0 + fVar192 * fVar235 + fVar216 * fVar326 + fVar159 * fVar163;
    auVar331._20_4_ =
         fVar236 * fStack_2ac + fVar210 * fVar187 + fVar225 * fVar342 + fVar161 * fVar178;
    auVar331._24_4_ =
         fVar237 * fStack_2a8 + fVar212 * fVar273 + fVar226 * fVar327 + fVar256 * fVar181;
    auVar331._28_4_ = fVar227 + 0.0 + 0.0 + 0.0;
    auVar202 = vpermilps_avx(auVar248,0xff);
    register0x00001490 = auVar202;
    _local_100 = auVar202;
    fStack_2a4 = (float)*(undefined4 *)(catmullrom_basis0 + lVar131 + 0x1c);
    fVar309 = auVar202._0_4_;
    fVar318 = auVar202._4_4_;
    auVar330._0_4_ = auVar202._8_4_;
    local_7a0._0_4_ =
         fVar309 * local_2c0 + fVar193 * fVar190 + fVar184 * fVar292 + fVar265 * fVar308;
    local_7a0._4_4_ =
         fVar318 * fStack_2bc + fVar211 * fVar328 + fVar254 * fVar294 + fVar267 * fVar317;
    auStack_798._0_4_ =
         auVar330._0_4_ * fStack_2b8 + fVar213 * fVar343 + fVar262 * fVar325 + fVar281 * fVar320;
    auStack_798._4_4_ =
         auVar202._12_4_ * fStack_2b4 +
         fVar215 * fVar271 + auVar201._12_4_ * fVar188 + fVar290 * fVar321;
    fStack_790 = fVar309 * fStack_2b0 + fVar193 * fVar235 + fVar184 * fVar326 + fVar265 * fVar163;
    fStack_78c = fVar318 * fStack_2ac + fVar211 * fVar187 + fVar254 * fVar342 + fVar267 * fVar178;
    fStack_788 = auVar330._0_4_ * fStack_2a8 +
                 fVar213 * fVar273 + fVar262 * fVar327 + fVar281 * fVar181;
    fStack_784 = 0.0;
    fVar156 = *(float *)(catmullrom_basis1 + lVar131 + 0x908);
    fVar158 = *(float *)(catmullrom_basis1 + lVar131 + 0x90c);
    fVar160 = *(float *)(catmullrom_basis1 + lVar131 + 0x910);
    fVar296 = *(float *)(catmullrom_basis1 + lVar131 + 0x914);
    fVar298 = *(float *)(catmullrom_basis1 + lVar131 + 0x918);
    fVar238 = *(float *)(catmullrom_basis1 + lVar131 + 0x91c);
    fVar189 = *(float *)(catmullrom_basis1 + lVar131 + 0x920);
    fVar308 = *(float *)*(undefined1 (*) [28])(catmullrom_basis1 + lVar131 + 0xd8c);
    fVar317 = *(float *)(catmullrom_basis1 + lVar131 + 0xd90);
    fVar320 = *(float *)(catmullrom_basis1 + lVar131 + 0xd94);
    fVar321 = *(float *)(catmullrom_basis1 + lVar131 + 0xd98);
    fVar163 = *(float *)(catmullrom_basis1 + lVar131 + 0xd9c);
    fVar178 = *(float *)(catmullrom_basis1 + lVar131 + 0xda0);
    fVar181 = *(float *)(catmullrom_basis1 + lVar131 + 0xda4);
    auVar114 = *(undefined1 (*) [28])(catmullrom_basis1 + lVar131 + 0xd8c);
    fVar299 = *(float *)(catmullrom_basis1 + lVar131 + 0x484);
    fVar300 = *(float *)(catmullrom_basis1 + lVar131 + 0x488);
    fVar240 = *(float *)(catmullrom_basis1 + lVar131 + 0x48c);
    fVar162 = *(float *)(catmullrom_basis1 + lVar131 + 0x490);
    fVar132 = *(float *)(catmullrom_basis1 + lVar131 + 0x494);
    fVar152 = *(float *)(catmullrom_basis1 + lVar131 + 0x498);
    fVar244 = *(float *)(catmullrom_basis1 + lVar131 + 0x49c);
    fVar253 = fVar290 + 0.0 + 0.0;
    fVar243 = *(float *)(catmullrom_basis1 + lVar131);
    fVar274 = *(float *)(catmullrom_basis1 + lVar131 + 4);
    fVar307 = *(float *)(catmullrom_basis1 + lVar131 + 8);
    fVar151 = *(float *)(catmullrom_basis1 + lVar131 + 0xc);
    fVar153 = *(float *)(catmullrom_basis1 + lVar131 + 0x10);
    fVar154 = *(float *)(catmullrom_basis1 + lVar131 + 0x14);
    fVar155 = *(float *)(catmullrom_basis1 + lVar131 + 0x18);
    local_580._0_4_ = fVar165 * fVar243 + fVar157 * fVar299 + fVar156 * fVar164 + fVar241 * fVar308;
    local_580._4_4_ = fVar180 * fVar274 + fVar269 * fVar300 + fVar158 * fVar179 + fVar293 * fVar317;
    fStack_578 = fVar183 * fVar307 + fVar270 * fVar240 + fVar160 * fVar182 + fVar295 * fVar320;
    fStack_574 = fVar186 * fVar151 + fVar272 * fVar162 + fVar296 * fVar185 + fVar297 * fVar321;
    fStack_570 = fVar165 * fVar153 + fVar157 * fVar132 + fVar298 * fVar164 + fVar241 * fVar163;
    fStack_56c = fVar180 * fVar154 + fVar269 * fVar152 + fVar238 * fVar179 + fVar293 * fVar178;
    fStack_568 = fVar183 * fVar155 + fVar270 * fVar244 + fVar189 * fVar182 + fVar295 * fVar181;
    fStack_564 = fVar215 + fVar297 + 0.0;
    local_3a0._0_4_ = fVar234 * fVar243 + fVar299 * fVar192 + fVar156 * fVar216 + fVar159 * fVar308;
    local_3a0._4_4_ = fVar236 * fVar274 + fVar300 * fVar210 + fVar158 * fVar225 + fVar161 * fVar317;
    fStack_398 = fVar237 * fVar307 + fVar240 * fVar212 + fVar160 * fVar226 + fVar256 * fVar320;
    fStack_394 = fVar239 * fVar151 + fVar162 * fVar214 + fVar296 * fVar227 + fVar264 * fVar321;
    fStack_390 = fVar234 * fVar153 + fVar132 * fVar192 + fVar298 * fVar216 + fVar159 * fVar163;
    fStack_38c = fVar236 * fVar154 + fVar152 * fVar210 + fVar238 * fVar225 + fVar161 * fVar178;
    fStack_388 = fVar237 * fVar155 + fVar244 * fVar212 + fVar189 * fVar226 + fVar256 * fVar181;
    register0x0000159c = fVar297 + 0.0 + 0.0;
    local_420._0_4_ = fVar309 * fVar243 + fVar193 * fVar299 + fVar156 * fVar184 + fVar265 * fVar308;
    local_420._4_4_ = fVar318 * fVar274 + fVar211 * fVar300 + fVar158 * fVar254 + fVar267 * fVar317;
    fStack_418 = auVar330._0_4_ * fVar307 +
                 fVar213 * fVar240 + fVar160 * fVar262 + fVar281 * fVar320;
    fStack_414 = auVar202._12_4_ * fVar151 +
                 fVar215 * fVar162 + fVar296 * auVar201._12_4_ + fVar290 * fVar321;
    fStack_410 = fVar309 * fVar153 + fVar193 * fVar132 + fVar298 * fVar184 + fVar265 * fVar163;
    fStack_40c = fVar318 * fVar154 + fVar211 * fVar152 + fVar238 * fVar254 + fVar267 * fVar178;
    fStack_408 = auVar330._0_4_ * fVar155 +
                 fVar213 * fVar244 + fVar189 * fVar262 + fVar281 * fVar181;
    fStack_404 = fVar253 + 0.0;
    auVar26 = vsubps_avx(_local_580,auVar278);
    auVar27 = vsubps_avx(_local_3a0,auVar331);
    fVar308 = auVar26._0_4_;
    fVar320 = auVar26._4_4_;
    auVar145._4_4_ = auVar331._4_4_ * fVar320;
    auVar145._0_4_ = auVar331._0_4_ * fVar308;
    fVar163 = auVar26._8_4_;
    auVar145._8_4_ = auVar331._8_4_ * fVar163;
    fVar181 = auVar26._12_4_;
    auVar145._12_4_ = auVar331._12_4_ * fVar181;
    fVar254 = auVar26._16_4_;
    auVar145._16_4_ = auVar331._16_4_ * fVar254;
    fVar265 = auVar26._20_4_;
    auVar145._20_4_ = auVar331._20_4_ * fVar265;
    fVar281 = auVar26._24_4_;
    auVar145._24_4_ = auVar331._24_4_ * fVar281;
    auVar145._28_4_ = 0;
    fVar317 = auVar27._0_4_;
    fVar321 = auVar27._4_4_;
    auVar28._4_4_ = auVar277._4_4_ * fVar321;
    auVar28._0_4_ = auVar277._0_4_ * fVar317;
    fVar178 = auVar27._8_4_;
    auVar28._8_4_ = auVar277._8_4_ * fVar178;
    fVar184 = auVar27._12_4_;
    auVar28._12_4_ = auVar277._12_4_ * fVar184;
    fVar262 = auVar27._16_4_;
    auVar28._16_4_ = auVar278._16_4_ * fVar262;
    fVar267 = auVar27._20_4_;
    auVar28._20_4_ = auVar278._20_4_ * fVar267;
    fVar290 = auVar27._24_4_;
    auVar28._24_4_ = auVar278._24_4_ * fVar290;
    auVar28._28_4_ = fVar253;
    auVar28 = vsubps_avx(auVar145,auVar28);
    auVar145 = vmaxps_avx(_local_7a0,_local_420);
    auVar34._4_4_ = auVar145._4_4_ * auVar145._4_4_ * (fVar320 * fVar320 + fVar321 * fVar321);
    auVar34._0_4_ = auVar145._0_4_ * auVar145._0_4_ * (fVar308 * fVar308 + fVar317 * fVar317);
    auVar34._8_4_ = auVar145._8_4_ * auVar145._8_4_ * (fVar163 * fVar163 + fVar178 * fVar178);
    auVar34._12_4_ = auVar145._12_4_ * auVar145._12_4_ * (fVar181 * fVar181 + fVar184 * fVar184);
    auVar34._16_4_ = auVar145._16_4_ * auVar145._16_4_ * (fVar254 * fVar254 + fVar262 * fVar262);
    auVar34._20_4_ = auVar145._20_4_ * auVar145._20_4_ * (fVar265 * fVar265 + fVar267 * fVar267);
    auVar34._24_4_ = auVar145._24_4_ * auVar145._24_4_ * (fVar281 * fVar281 + fVar290 * fVar290);
    auVar34._28_4_ = fStack_564 + fVar253;
    auVar17._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar17._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar17._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar17._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar17._16_4_ = auVar28._16_4_ * auVar28._16_4_;
    auVar17._20_4_ = auVar28._20_4_ * auVar28._20_4_;
    auVar17._24_4_ = auVar28._24_4_ * auVar28._24_4_;
    auVar17._28_4_ = auVar28._28_4_;
    auVar145 = vcmpps_avx(auVar17,auVar34,2);
    auVar330._0_4_ = (float)(int)uVar124;
    auVar330._4_12_ = auVar277._4_12_;
    auVar201 = vshufps_avx(auVar330,auVar330,0);
    auVar249._16_16_ = auVar201;
    auVar249._0_16_ = auVar201;
    auVar28 = vcmpps_avx(_DAT_01f7b060,auVar249,1);
    auVar201 = vpermilps_avx(auVar220,0xaa);
    auVar205._16_16_ = auVar201;
    auVar205._0_16_ = auVar201;
    auVar202 = vpermilps_avx(auVar337,0xaa);
    register0x00001590 = auVar202;
    _local_280 = auVar202;
    auVar221 = vpermilps_avx(auVar259,0xaa);
    register0x000015d0 = auVar221;
    _local_2a0 = auVar221;
    auVar25 = vpermilps_avx(auVar166,0xaa);
    register0x00001390 = auVar25;
    _local_540 = auVar25;
    auVar34 = auVar28 & auVar145;
    auVar18 = vpermilps_avx((undefined1  [16])aVar12,0xff);
    _local_700 = ZEXT1632(auVar18);
    auVar168 = ZEXT416((uint)(auVar168._0_4_ * 4.7683716e-07));
    ray = local_7c0;
    fVar308 = fVar159;
    fVar317 = fVar161;
    fVar320 = fVar256;
    fVar321 = fVar264;
    fVar163 = fVar165;
    fVar178 = fVar180;
    fVar181 = fVar183;
    fVar184 = fVar186;
    fVar254 = fVar192;
    fVar262 = fVar210;
    fVar265 = fVar212;
    fVar267 = fVar164;
    fVar281 = fVar179;
    fVar290 = fVar182;
    fVar253 = fVar216;
    fVar309 = fVar225;
    fVar318 = fVar226;
    _local_700 = auVar18;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0x7f,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar34 >> 0xbf,0) == '\0') &&
        (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f]) {
      auVar289 = ZEXT3264(local_6e0);
      auVar306 = ZEXT3264(local_680);
      auVar341 = ZEXT3264(_local_660);
    }
    else {
      local_560._0_16_ = auVar330;
      local_5c0._0_16_ = auVar168;
      local_2e0 = vandps_avx(auVar145,auVar28);
      fVar193 = auVar201._0_4_;
      fVar211 = auVar201._4_4_;
      fVar213 = auVar201._8_4_;
      fVar215 = auVar201._12_4_;
      fVar344 = auVar202._0_4_;
      fVar348 = auVar202._4_4_;
      fVar349 = auVar202._8_4_;
      fVar350 = auVar202._12_4_;
      fVar351 = auVar221._0_4_;
      fVar352 = auVar221._4_4_;
      fVar353 = auVar221._8_4_;
      fVar359 = auVar221._12_4_;
      local_400._0_4_ = auVar114._0_4_;
      local_400._4_4_ = auVar114._4_4_;
      fStack_3f8 = auVar114._8_4_;
      fStack_3f4 = auVar114._12_4_;
      fStack_3f0 = auVar114._16_4_;
      fStack_3ec = auVar114._20_4_;
      fStack_3e8 = auVar114._24_4_;
      fVar255 = auVar25._0_4_;
      fVar263 = auVar25._4_4_;
      fVar266 = auVar25._8_4_;
      fVar268 = auVar25._12_4_;
      fVar242 = auVar145._28_4_ + auVar28._28_4_ + fVar268;
      local_400._0_4_ =
           fVar193 * fVar243 +
           fVar344 * fVar299 + fVar351 * fVar156 + fVar255 * (float)local_400._0_4_;
      local_400._4_4_ =
           fVar211 * fVar274 +
           fVar348 * fVar300 + fVar352 * fVar158 + fVar263 * (float)local_400._4_4_;
      fStack_3f8 = fVar213 * fVar307 + fVar349 * fVar240 + fVar353 * fVar160 + fVar266 * fStack_3f8;
      fStack_3f4 = fVar215 * fVar151 + fVar350 * fVar162 + fVar359 * fVar296 + fVar268 * fStack_3f4;
      fStack_3f0 = fVar193 * fVar153 + fVar344 * fVar132 + fVar351 * fVar298 + fVar255 * fStack_3f0;
      fStack_3ec = fVar211 * fVar154 + fVar348 * fVar152 + fVar352 * fVar238 + fVar263 * fStack_3ec;
      fStack_3e8 = fVar213 * fVar155 + fVar349 * fVar244 + fVar353 * fVar189 + fVar266 * fStack_3e8;
      fStack_3e4 = *(float *)(catmullrom_basis1 + lVar131 + 0x1c) + fVar242;
      local_500._0_4_ = auVar113._0_4_;
      local_500._4_4_ = auVar113._4_4_;
      fStack_4f8 = auVar113._8_4_;
      fStack_4f4 = auVar113._12_4_;
      auStack_4f0._0_4_ = auVar113._16_4_;
      auStack_4f0._4_4_ = auVar113._20_4_;
      fStack_4e8 = auVar113._24_4_;
      local_4e0 = fVar193 * local_2c0 +
                  fVar344 * fVar190 + fVar351 * fVar292 + fVar255 * (float)local_500._0_4_;
      fStack_4dc = fVar211 * fStack_2bc +
                   fVar348 * fVar328 + fVar352 * fVar294 + fVar263 * (float)local_500._4_4_;
      fStack_4d8 = fVar213 * fStack_2b8 +
                   fVar349 * fVar343 + fVar353 * fVar325 + fVar266 * fStack_4f8;
      fStack_4d4 = fVar215 * fStack_2b4 +
                   fVar350 * fVar271 + fVar359 * fVar188 + fVar268 * fStack_4f4;
      fStack_4d0 = fVar193 * fStack_2b0 +
                   fVar344 * fVar235 + fVar351 * fVar326 + fVar255 * (float)auStack_4f0._0_4_;
      fStack_4cc = fVar211 * fStack_2ac +
                   fVar348 * fVar187 + fVar352 * fVar342 + fVar263 * (float)auStack_4f0._4_4_;
      fStack_4c8 = fVar213 * fStack_2a8 +
                   fVar349 * fVar273 + fVar353 * fVar327 + fVar266 * fStack_4e8;
      fStack_4c4 = fStack_3e4 + fVar239 + *(float *)(catmullrom_basis1 + lVar131 + 0x1c) + fVar242;
      fVar292 = *(float *)(catmullrom_basis0 + lVar131 + 0x1210);
      fVar294 = *(float *)(catmullrom_basis0 + lVar131 + 0x1214);
      fVar325 = *(float *)(catmullrom_basis0 + lVar131 + 0x1218);
      fVar188 = *(float *)(catmullrom_basis0 + lVar131 + 0x121c);
      fVar326 = *(float *)(catmullrom_basis0 + lVar131 + 0x1220);
      fVar342 = *(float *)(catmullrom_basis0 + lVar131 + 0x1224);
      fVar327 = *(float *)(catmullrom_basis0 + lVar131 + 0x1228);
      fVar190 = *(float *)(catmullrom_basis0 + lVar131 + 0x1694);
      fVar328 = *(float *)(catmullrom_basis0 + lVar131 + 0x1698);
      fVar343 = *(float *)(catmullrom_basis0 + lVar131 + 0x169c);
      fVar271 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a0);
      fVar235 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a4);
      fVar187 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a8);
      fVar273 = *(float *)(catmullrom_basis0 + lVar131 + 0x16ac);
      fVar156 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b18);
      fVar158 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b1c);
      fVar160 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b20);
      fVar296 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b24);
      fVar298 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b28);
      fVar238 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b2c);
      fVar189 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b30);
      fVar299 = *(float *)(catmullrom_basis0 + lVar131 + 0x1f9c);
      fVar300 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa0);
      fVar240 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa4);
      fVar162 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa8);
      fVar132 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fac);
      fVar152 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fb0);
      fVar244 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fb4);
      fVar274 = *(float *)(catmullrom_basis1 + lVar131 + 0x4a0) + auVar278._28_4_;
      fVar243 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar131 + 0x1fb8);
      fVar307 = *(float *)(catmullrom_basis0 + lVar131 + 0x16b0) + fVar243;
      local_3e0 = fVar165 * fVar292 + fVar157 * fVar190 + fVar164 * fVar156 + fVar241 * fVar299;
      fStack_3dc = fVar180 * fVar294 + fVar269 * fVar328 + fVar179 * fVar158 + fVar293 * fVar300;
      fStack_3d8 = fVar183 * fVar325 + fVar270 * fVar343 + fVar182 * fVar160 + fVar295 * fVar240;
      fStack_3d4 = fVar186 * fVar188 + fVar272 * fVar271 + fVar185 * fVar296 + fVar297 * fVar162;
      fStack_3d0 = fVar165 * fVar326 + fVar157 * fVar235 + fVar164 * fVar298 + fVar241 * fVar132;
      fStack_3cc = fVar180 * fVar342 + fVar269 * fVar187 + fVar179 * fVar238 + fVar293 * fVar152;
      fStack_3c8 = fVar183 * fVar327 + fVar270 * fVar273 + fVar182 * fVar189 + fVar295 * fVar244;
      fStack_3c4 = *(float *)(catmullrom_basis0 + lVar131 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar131 + 0x1fb8) + fVar274;
      auVar170._0_4_ = fVar234 * fVar292 + fVar192 * fVar190 + fVar216 * fVar156 + fVar159 * fVar299
      ;
      auVar170._4_4_ = fVar236 * fVar294 + fVar210 * fVar328 + fVar225 * fVar158 + fVar161 * fVar300
      ;
      auVar170._8_4_ = fVar237 * fVar325 + fVar212 * fVar343 + fVar226 * fVar160 + fVar256 * fVar240
      ;
      auVar170._12_4_ =
           fVar239 * fVar188 + fVar214 * fVar271 + fVar227 * fVar296 + fVar264 * fVar162;
      auVar170._16_4_ =
           fVar234 * fVar326 + fVar192 * fVar235 + fVar216 * fVar298 + fVar159 * fVar132;
      auVar170._20_4_ =
           fVar236 * fVar342 + fVar210 * fVar187 + fVar225 * fVar238 + fVar161 * fVar152;
      auVar170._24_4_ =
           fVar237 * fVar327 + fVar212 * fVar273 + fVar226 * fVar189 + fVar256 * fVar244;
      auVar170._28_4_ =
           fVar243 + fVar274 + *(float *)(catmullrom_basis1 + lVar131 + 0x4a0) + fVar268;
      auVar222._0_4_ = fVar344 * fVar190 + fVar351 * fVar156 + fVar255 * fVar299 + fVar193 * fVar292
      ;
      auVar222._4_4_ = fVar348 * fVar328 + fVar352 * fVar158 + fVar263 * fVar300 + fVar211 * fVar294
      ;
      auVar222._8_4_ = fVar349 * fVar343 + fVar353 * fVar160 + fVar266 * fVar240 + fVar213 * fVar325
      ;
      auVar222._12_4_ =
           fVar350 * fVar271 + fVar359 * fVar296 + fVar268 * fVar162 + fVar215 * fVar188;
      auVar222._16_4_ =
           fVar344 * fVar235 + fVar351 * fVar298 + fVar255 * fVar132 + fVar193 * fVar326;
      auVar222._20_4_ =
           fVar348 * fVar187 + fVar352 * fVar238 + fVar263 * fVar152 + fVar211 * fVar342;
      auVar222._24_4_ =
           fVar349 * fVar273 + fVar353 * fVar189 + fVar266 * fVar244 + fVar213 * fVar327;
      auVar222._28_4_ = fVar307 + *(float *)(catmullrom_basis0 + lVar131 + 0x122c);
      fVar292 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b18);
      fVar294 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b1c);
      fVar325 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b20);
      fVar188 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b24);
      fVar326 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b28);
      fVar342 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b2c);
      fVar327 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b30);
      fVar190 = *(float *)(catmullrom_basis1 + lVar131 + 0x1f9c);
      fVar328 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa0);
      fVar343 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa4);
      fVar271 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa8);
      fVar235 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fac);
      fVar187 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fb0);
      fVar273 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fb4);
      fVar156 = *(float *)(catmullrom_basis1 + lVar131 + 0x1694);
      fVar158 = *(float *)(catmullrom_basis1 + lVar131 + 0x1698);
      fVar160 = *(float *)(catmullrom_basis1 + lVar131 + 0x169c);
      fVar296 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a0);
      fVar298 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a4);
      fVar238 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a8);
      fVar189 = *(float *)(catmullrom_basis1 + lVar131 + 0x16ac);
      fVar299 = *(float *)(catmullrom_basis1 + lVar131 + 0x1210);
      fVar300 = *(float *)(catmullrom_basis1 + lVar131 + 0x1214);
      fVar240 = *(float *)(catmullrom_basis1 + lVar131 + 0x1218);
      fVar162 = *(float *)(catmullrom_basis1 + lVar131 + 0x121c);
      fVar132 = *(float *)(catmullrom_basis1 + lVar131 + 0x1220);
      fVar152 = *(float *)(catmullrom_basis1 + lVar131 + 0x1224);
      fVar244 = *(float *)(catmullrom_basis1 + lVar131 + 0x1228);
      auVar285._0_4_ = fVar165 * fVar299 + fVar156 * fVar157 + fVar164 * fVar292 + fVar241 * fVar190
      ;
      auVar285._4_4_ = fVar180 * fVar300 + fVar158 * fVar269 + fVar179 * fVar294 + fVar293 * fVar328
      ;
      auVar285._8_4_ = fVar183 * fVar240 + fVar160 * fVar270 + fVar182 * fVar325 + fVar295 * fVar343
      ;
      auVar285._12_4_ =
           fVar186 * fVar162 + fVar296 * fVar272 + fVar185 * fVar188 + fVar297 * fVar271;
      auVar285._16_4_ =
           fVar165 * fVar132 + fVar298 * fVar157 + fVar164 * fVar326 + fVar241 * fVar235;
      auVar285._20_4_ =
           fVar180 * fVar152 + fVar238 * fVar269 + fVar179 * fVar342 + fVar293 * fVar187;
      auVar285._24_4_ =
           fVar183 * fVar244 + fVar189 * fVar270 + fVar182 * fVar327 + fVar295 * fVar273;
      auVar285._28_4_ = fVar297 + fVar297 + fVar307 + fVar297;
      auVar303._0_4_ = fVar234 * fVar299 + fVar192 * fVar156 + fVar216 * fVar292 + fVar159 * fVar190
      ;
      auVar303._4_4_ = fVar236 * fVar300 + fVar210 * fVar158 + fVar225 * fVar294 + fVar161 * fVar328
      ;
      auVar303._8_4_ = fVar237 * fVar240 + fVar212 * fVar160 + fVar226 * fVar325 + fVar256 * fVar343
      ;
      auVar303._12_4_ =
           fVar239 * fVar162 + fVar214 * fVar296 + fVar227 * fVar188 + fVar264 * fVar271;
      auVar303._16_4_ =
           fVar234 * fVar132 + fVar192 * fVar298 + fVar216 * fVar326 + fVar159 * fVar235;
      auVar303._20_4_ =
           fVar236 * fVar152 + fVar210 * fVar238 + fVar225 * fVar342 + fVar161 * fVar187;
      auVar303._24_4_ =
           fVar237 * fVar244 + fVar212 * fVar189 + fVar226 * fVar327 + fVar256 * fVar273;
      auVar303._28_4_ = fVar297 + fVar297 + fVar297 + fVar307;
      _local_520 = auVar205;
      auVar231._0_4_ = fVar193 * fVar299 + fVar344 * fVar156 + fVar351 * fVar292 + fVar255 * fVar190
      ;
      auVar231._4_4_ = fVar211 * fVar300 + fVar348 * fVar158 + fVar352 * fVar294 + fVar263 * fVar328
      ;
      auVar231._8_4_ = fVar213 * fVar240 + fVar349 * fVar160 + fVar353 * fVar325 + fVar266 * fVar343
      ;
      auVar231._12_4_ =
           fVar215 * fVar162 + fVar350 * fVar296 + fVar359 * fVar188 + fVar268 * fVar271;
      auVar231._16_4_ =
           fVar193 * fVar132 + fVar344 * fVar298 + fVar351 * fVar326 + fVar255 * fVar235;
      auVar231._20_4_ =
           fVar211 * fVar152 + fVar348 * fVar238 + fVar352 * fVar342 + fVar263 * fVar187;
      auVar231._24_4_ =
           fVar213 * fVar244 + fVar349 * fVar189 + fVar353 * fVar327 + fVar266 * fVar273;
      auVar231._28_4_ =
           *(float *)(catmullrom_basis1 + lVar131 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar131 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar131 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar131 + 0x1fb8);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar206._16_4_ = 0x7fffffff;
      auVar206._20_4_ = 0x7fffffff;
      auVar206._24_4_ = 0x7fffffff;
      auVar206._28_4_ = 0x7fffffff;
      auVar110._4_4_ = fStack_3dc;
      auVar110._0_4_ = local_3e0;
      auVar110._8_4_ = fStack_3d8;
      auVar110._12_4_ = fStack_3d4;
      auVar110._16_4_ = fStack_3d0;
      auVar110._20_4_ = fStack_3cc;
      auVar110._24_4_ = fStack_3c8;
      auVar110._28_4_ = fStack_3c4;
      auVar145 = vandps_avx(auVar110,auVar206);
      auVar28 = vandps_avx(auVar170,auVar206);
      auVar28 = vmaxps_avx(auVar145,auVar28);
      auVar145 = vandps_avx(auVar222,auVar206);
      auVar145 = vmaxps_avx(auVar28,auVar145);
      auVar168 = vpermilps_avx(auVar168,0);
      auVar279._16_16_ = auVar168;
      auVar279._0_16_ = auVar168;
      auVar145 = vcmpps_avx(auVar145,auVar279,1);
      auVar34 = vblendvps_avx(auVar110,auVar26,auVar145);
      auVar17 = vblendvps_avx(auVar170,auVar27,auVar145);
      auVar145 = vandps_avx(auVar285,auVar206);
      auVar28 = vandps_avx(auVar303,auVar206);
      auVar249 = vmaxps_avx(auVar145,auVar28);
      auVar145 = vandps_avx(auVar231,auVar206);
      auVar145 = vmaxps_avx(auVar249,auVar145);
      auVar249 = vcmpps_avx(auVar145,auVar279,1);
      auVar145 = vblendvps_avx(auVar285,auVar26,auVar249);
      auVar26 = vblendvps_avx(auVar303,auVar27,auVar249);
      fVar307 = auVar34._0_4_;
      fVar151 = auVar34._4_4_;
      fVar153 = auVar34._8_4_;
      fVar154 = auVar34._12_4_;
      fVar155 = auVar34._16_4_;
      fVar157 = auVar34._20_4_;
      fVar269 = auVar34._24_4_;
      fVar270 = auVar145._0_4_;
      fVar272 = auVar145._4_4_;
      fVar234 = auVar145._8_4_;
      fVar236 = auVar145._12_4_;
      fVar237 = auVar145._16_4_;
      fVar239 = auVar145._20_4_;
      fVar241 = auVar145._24_4_;
      fVar292 = auVar17._0_4_;
      fVar326 = auVar17._4_4_;
      fVar328 = auVar17._8_4_;
      fVar187 = auVar17._12_4_;
      fVar160 = auVar17._16_4_;
      fVar189 = auVar17._20_4_;
      fVar162 = auVar17._24_4_;
      auVar138._0_4_ = fVar292 * fVar292 + fVar307 * fVar307;
      auVar138._4_4_ = fVar326 * fVar326 + fVar151 * fVar151;
      auVar138._8_4_ = fVar328 * fVar328 + fVar153 * fVar153;
      auVar138._12_4_ = fVar187 * fVar187 + fVar154 * fVar154;
      auVar138._16_4_ = fVar160 * fVar160 + fVar155 * fVar155;
      auVar138._20_4_ = fVar189 * fVar189 + fVar157 * fVar157;
      auVar138._24_4_ = fVar162 * fVar162 + fVar269 * fVar269;
      auVar138._28_4_ = auVar303._28_4_ + auVar34._28_4_;
      auVar27 = vrsqrtps_avx(auVar138);
      fVar294 = auVar27._0_4_;
      fVar325 = auVar27._4_4_;
      auVar29._4_4_ = fVar325 * 1.5;
      auVar29._0_4_ = fVar294 * 1.5;
      fVar188 = auVar27._8_4_;
      auVar29._8_4_ = fVar188 * 1.5;
      fVar342 = auVar27._12_4_;
      auVar29._12_4_ = fVar342 * 1.5;
      fVar327 = auVar27._16_4_;
      auVar29._16_4_ = fVar327 * 1.5;
      fVar190 = auVar27._20_4_;
      auVar29._20_4_ = fVar190 * 1.5;
      fVar343 = auVar27._24_4_;
      auVar29._24_4_ = fVar343 * 1.5;
      auVar29._28_4_ = auVar28._28_4_;
      auVar27._4_4_ = fVar325 * fVar325 * fVar325 * auVar138._4_4_ * 0.5;
      auVar27._0_4_ = fVar294 * fVar294 * fVar294 * auVar138._0_4_ * 0.5;
      auVar27._8_4_ = fVar188 * fVar188 * fVar188 * auVar138._8_4_ * 0.5;
      auVar27._12_4_ = fVar342 * fVar342 * fVar342 * auVar138._12_4_ * 0.5;
      auVar27._16_4_ = fVar327 * fVar327 * fVar327 * auVar138._16_4_ * 0.5;
      auVar27._20_4_ = fVar190 * fVar190 * fVar190 * auVar138._20_4_ * 0.5;
      auVar27._24_4_ = fVar343 * fVar343 * fVar343 * auVar138._24_4_ * 0.5;
      auVar27._28_4_ = auVar138._28_4_;
      auVar27 = vsubps_avx(auVar29,auVar27);
      fVar294 = auVar27._0_4_;
      fVar342 = auVar27._4_4_;
      fVar343 = auVar27._8_4_;
      fVar273 = auVar27._12_4_;
      fVar296 = auVar27._16_4_;
      fVar299 = auVar27._20_4_;
      fVar132 = auVar27._24_4_;
      fVar243 = auVar17._28_4_;
      fVar325 = auVar26._0_4_;
      fVar327 = auVar26._4_4_;
      fVar271 = auVar26._8_4_;
      fVar156 = auVar26._12_4_;
      fVar298 = auVar26._16_4_;
      fVar300 = auVar26._20_4_;
      fVar152 = auVar26._24_4_;
      auVar139._0_4_ = fVar325 * fVar325 + fVar270 * fVar270;
      auVar139._4_4_ = fVar327 * fVar327 + fVar272 * fVar272;
      auVar139._8_4_ = fVar271 * fVar271 + fVar234 * fVar234;
      auVar139._12_4_ = fVar156 * fVar156 + fVar236 * fVar236;
      auVar139._16_4_ = fVar298 * fVar298 + fVar237 * fVar237;
      auVar139._20_4_ = fVar300 * fVar300 + fVar239 * fVar239;
      auVar139._24_4_ = fVar152 * fVar152 + fVar241 * fVar241;
      auVar139._28_4_ = auVar145._28_4_ + auVar27._28_4_;
      auVar145 = vrsqrtps_avx(auVar139);
      fVar188 = auVar145._0_4_;
      fVar190 = auVar145._4_4_;
      auVar30._4_4_ = fVar190 * 1.5;
      auVar30._0_4_ = fVar188 * 1.5;
      fVar235 = auVar145._8_4_;
      auVar30._8_4_ = fVar235 * 1.5;
      fVar158 = auVar145._12_4_;
      auVar30._12_4_ = fVar158 * 1.5;
      fVar238 = auVar145._16_4_;
      auVar30._16_4_ = fVar238 * 1.5;
      fVar240 = auVar145._20_4_;
      auVar30._20_4_ = fVar240 * 1.5;
      fVar244 = auVar145._24_4_;
      auVar30._24_4_ = fVar244 * 1.5;
      auVar30._28_4_ = auVar28._28_4_;
      fVar274 = auVar145._28_4_;
      auVar31._4_4_ = fVar190 * fVar190 * fVar190 * auVar139._4_4_ * 0.5;
      auVar31._0_4_ = fVar188 * fVar188 * fVar188 * auVar139._0_4_ * 0.5;
      auVar31._8_4_ = fVar235 * fVar235 * fVar235 * auVar139._8_4_ * 0.5;
      auVar31._12_4_ = fVar158 * fVar158 * fVar158 * auVar139._12_4_ * 0.5;
      auVar31._16_4_ = fVar238 * fVar238 * fVar238 * auVar139._16_4_ * 0.5;
      auVar31._20_4_ = fVar240 * fVar240 * fVar240 * auVar139._20_4_ * 0.5;
      auVar31._24_4_ = fVar244 * fVar244 * fVar244 * auVar139._24_4_ * 0.5;
      auVar31._28_4_ = auVar139._28_4_;
      auVar145 = vsubps_avx(auVar30,auVar31);
      fVar188 = auVar145._0_4_;
      fVar190 = auVar145._4_4_;
      fVar235 = auVar145._8_4_;
      fVar158 = auVar145._12_4_;
      fVar238 = auVar145._16_4_;
      fVar240 = auVar145._20_4_;
      fVar244 = auVar145._24_4_;
      fVar292 = (float)local_7a0._0_4_ * fVar292 * fVar294;
      fVar326 = (float)local_7a0._4_4_ * fVar326 * fVar342;
      auVar32._4_4_ = fVar326;
      auVar32._0_4_ = fVar292;
      fVar328 = (float)auStack_798._0_4_ * fVar328 * fVar343;
      auVar32._8_4_ = fVar328;
      fVar187 = (float)auStack_798._4_4_ * fVar187 * fVar273;
      auVar32._12_4_ = fVar187;
      fVar160 = fStack_790 * fVar160 * fVar296;
      auVar32._16_4_ = fVar160;
      fVar189 = fStack_78c * fVar189 * fVar299;
      auVar32._20_4_ = fVar189;
      fVar162 = fStack_788 * fVar162 * fVar132;
      auVar32._24_4_ = fVar162;
      auVar32._28_4_ = fVar243;
      local_500._4_4_ = auVar277._4_4_ + fVar326;
      local_500._0_4_ = auVar277._0_4_ + fVar292;
      fStack_4f8 = auVar277._8_4_ + fVar328;
      fStack_4f4 = auVar277._12_4_ + fVar187;
      auStack_4f0._0_4_ = auVar278._16_4_ + fVar160;
      auStack_4f0._4_4_ = auVar278._20_4_ + fVar189;
      fStack_4e8 = auVar278._24_4_ + fVar162;
      fStack_4e4 = auVar278._28_4_ + fVar243;
      fVar292 = (float)local_7a0._0_4_ * fVar294 * -fVar307;
      fVar326 = (float)local_7a0._4_4_ * fVar342 * -fVar151;
      auVar33._4_4_ = fVar326;
      auVar33._0_4_ = fVar292;
      fVar328 = (float)auStack_798._0_4_ * fVar343 * -fVar153;
      auVar33._8_4_ = fVar328;
      fVar187 = (float)auStack_798._4_4_ * fVar273 * -fVar154;
      auVar33._12_4_ = fVar187;
      fVar160 = fStack_790 * fVar296 * -fVar155;
      auVar33._16_4_ = fVar160;
      fVar189 = fStack_78c * fVar299 * -fVar157;
      auVar33._20_4_ = fVar189;
      fVar162 = fStack_788 * fVar132 * -fVar269;
      auVar33._24_4_ = fVar162;
      auVar33._28_4_ = 0x3f000000;
      local_3c0._4_4_ = fVar326 + auVar331._4_4_;
      local_3c0._0_4_ = fVar292 + auVar331._0_4_;
      fStack_3b8 = fVar328 + auVar331._8_4_;
      fStack_3b4 = fVar187 + auVar331._12_4_;
      fStack_3b0 = fVar160 + auVar331._16_4_;
      fStack_3ac = fVar189 + auVar331._20_4_;
      fStack_3a8 = fVar162 + auVar331._24_4_;
      fStack_3a4 = auVar331._28_4_ + 0.5;
      fVar292 = (float)local_7a0._0_4_ * fVar294 * 0.0;
      fVar294 = (float)local_7a0._4_4_ * fVar342 * 0.0;
      auVar35._4_4_ = fVar294;
      auVar35._0_4_ = fVar292;
      fVar326 = (float)auStack_798._0_4_ * fVar343 * 0.0;
      auVar35._8_4_ = fVar326;
      fVar342 = (float)auStack_798._4_4_ * fVar273 * 0.0;
      auVar35._12_4_ = fVar342;
      fVar328 = fStack_790 * fVar296 * 0.0;
      auVar35._16_4_ = fVar328;
      fVar343 = fStack_78c * fVar299 * 0.0;
      auVar35._20_4_ = fVar343;
      fVar187 = fStack_788 * fVar132 * 0.0;
      auVar35._24_4_ = fVar187;
      auVar35._28_4_ = fVar214;
      auVar108._4_4_ = fStack_4dc;
      auVar108._0_4_ = local_4e0;
      auVar108._8_4_ = fStack_4d8;
      auVar108._12_4_ = fStack_4d4;
      auVar108._16_4_ = fStack_4d0;
      auVar108._20_4_ = fStack_4cc;
      auVar108._24_4_ = fStack_4c8;
      auVar108._28_4_ = fStack_4c4;
      auVar286._0_4_ = fVar292 + local_4e0;
      auVar286._4_4_ = fVar294 + fStack_4dc;
      auVar286._8_4_ = fVar326 + fStack_4d8;
      auVar286._12_4_ = fVar342 + fStack_4d4;
      auVar286._16_4_ = fVar328 + fStack_4d0;
      auVar286._20_4_ = fVar343 + fStack_4cc;
      auVar286._24_4_ = fVar187 + fStack_4c8;
      auVar286._28_4_ = fVar214 + fStack_4c4;
      fVar292 = (float)local_420._0_4_ * fVar325 * fVar188;
      fVar294 = (float)local_420._4_4_ * fVar327 * fVar190;
      auVar36._4_4_ = fVar294;
      auVar36._0_4_ = fVar292;
      fVar325 = fStack_418 * fVar271 * fVar235;
      auVar36._8_4_ = fVar325;
      fVar326 = fStack_414 * fVar156 * fVar158;
      auVar36._12_4_ = fVar326;
      fVar342 = fStack_410 * fVar298 * fVar238;
      auVar36._16_4_ = fVar342;
      fVar327 = fStack_40c * fVar300 * fVar240;
      auVar36._20_4_ = fVar327;
      fVar328 = fStack_408 * fVar152 * fVar244;
      auVar36._24_4_ = fVar328;
      auVar36._28_4_ = auVar26._28_4_;
      auVar34 = vsubps_avx(auVar278,auVar32);
      auVar313._0_4_ = (float)local_580._0_4_ + fVar292;
      auVar313._4_4_ = (float)local_580._4_4_ + fVar294;
      auVar313._8_4_ = fStack_578 + fVar325;
      auVar313._12_4_ = fStack_574 + fVar326;
      auVar313._16_4_ = fStack_570 + fVar342;
      auVar313._20_4_ = fStack_56c + fVar327;
      auVar313._24_4_ = fStack_568 + fVar328;
      auVar313._28_4_ = fStack_564 + auVar26._28_4_;
      fVar292 = (float)local_420._0_4_ * -fVar270 * fVar188;
      fVar294 = (float)local_420._4_4_ * -fVar272 * fVar190;
      auVar26._4_4_ = fVar294;
      auVar26._0_4_ = fVar292;
      fVar325 = fStack_418 * -fVar234 * fVar235;
      auVar26._8_4_ = fVar325;
      fVar326 = fStack_414 * -fVar236 * fVar158;
      auVar26._12_4_ = fVar326;
      fVar342 = fStack_410 * -fVar237 * fVar238;
      auVar26._16_4_ = fVar342;
      fVar327 = fStack_40c * -fVar239 * fVar240;
      auVar26._20_4_ = fVar327;
      fVar328 = fStack_408 * -fVar241 * fVar244;
      auVar26._24_4_ = fVar328;
      auVar26._28_4_ = fVar243;
      auVar331 = vsubps_avx(auVar331,auVar33);
      auVar346._0_4_ = (float)local_3a0._0_4_ + fVar292;
      auVar346._4_4_ = (float)local_3a0._4_4_ + fVar294;
      auVar346._8_4_ = fStack_398 + fVar325;
      auVar346._12_4_ = fStack_394 + fVar326;
      auVar346._16_4_ = fStack_390 + fVar342;
      auVar346._20_4_ = fStack_38c + fVar327;
      auVar346._24_4_ = fStack_388 + fVar328;
      auVar346._28_4_ = register0x0000159c + fVar243;
      fVar292 = fVar188 * 0.0 * (float)local_420._0_4_;
      fVar294 = fVar190 * 0.0 * (float)local_420._4_4_;
      auVar37._4_4_ = fVar294;
      auVar37._0_4_ = fVar292;
      fVar325 = fVar235 * 0.0 * fStack_418;
      auVar37._8_4_ = fVar325;
      fVar188 = fVar158 * 0.0 * fStack_414;
      auVar37._12_4_ = fVar188;
      fVar326 = fVar238 * 0.0 * fStack_410;
      auVar37._16_4_ = fVar326;
      fVar342 = fVar240 * 0.0 * fStack_40c;
      auVar37._20_4_ = fVar342;
      fVar327 = fVar244 * 0.0 * fStack_408;
      auVar37._24_4_ = fVar327;
      auVar37._28_4_ = fVar274;
      auVar249 = vsubps_avx(auVar108,auVar35);
      auVar356._0_4_ = (float)local_400._0_4_ + fVar292;
      auVar356._4_4_ = (float)local_400._4_4_ + fVar294;
      auVar356._8_4_ = fStack_3f8 + fVar325;
      auVar356._12_4_ = fStack_3f4 + fVar188;
      auVar356._16_4_ = fStack_3f0 + fVar326;
      auVar356._20_4_ = fStack_3ec + fVar342;
      auVar356._24_4_ = fStack_3e8 + fVar327;
      auVar356._28_4_ = fStack_3e4 + fVar274;
      auVar145 = vsubps_avx(_local_580,auVar36);
      auVar28 = vsubps_avx(_local_3a0,auVar26);
      auVar26 = vsubps_avx(_local_400,auVar37);
      auVar27 = vsubps_avx(auVar346,auVar331);
      auVar17 = vsubps_avx(auVar356,auVar249);
      auVar38._4_4_ = auVar249._4_4_ * auVar27._4_4_;
      auVar38._0_4_ = auVar249._0_4_ * auVar27._0_4_;
      auVar38._8_4_ = auVar249._8_4_ * auVar27._8_4_;
      auVar38._12_4_ = auVar249._12_4_ * auVar27._12_4_;
      auVar38._16_4_ = auVar249._16_4_ * auVar27._16_4_;
      auVar38._20_4_ = auVar249._20_4_ * auVar27._20_4_;
      auVar38._24_4_ = auVar249._24_4_ * auVar27._24_4_;
      auVar38._28_4_ = fVar274;
      auVar39._4_4_ = auVar331._4_4_ * auVar17._4_4_;
      auVar39._0_4_ = auVar331._0_4_ * auVar17._0_4_;
      auVar39._8_4_ = auVar331._8_4_ * auVar17._8_4_;
      auVar39._12_4_ = auVar331._12_4_ * auVar17._12_4_;
      auVar39._16_4_ = auVar331._16_4_ * auVar17._16_4_;
      auVar39._20_4_ = auVar331._20_4_ * auVar17._20_4_;
      auVar39._24_4_ = auVar331._24_4_ * auVar17._24_4_;
      auVar39._28_4_ = register0x0000159c;
      auVar278 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = auVar34._4_4_ * auVar17._4_4_;
      auVar40._0_4_ = auVar34._0_4_ * auVar17._0_4_;
      auVar40._8_4_ = auVar34._8_4_ * auVar17._8_4_;
      auVar40._12_4_ = auVar34._12_4_ * auVar17._12_4_;
      auVar40._16_4_ = auVar34._16_4_ * auVar17._16_4_;
      auVar40._20_4_ = auVar34._20_4_ * auVar17._20_4_;
      auVar40._24_4_ = auVar34._24_4_ * auVar17._24_4_;
      auVar40._28_4_ = auVar17._28_4_;
      auVar29 = vsubps_avx(auVar313,auVar34);
      auVar41._4_4_ = auVar249._4_4_ * auVar29._4_4_;
      auVar41._0_4_ = auVar249._0_4_ * auVar29._0_4_;
      auVar41._8_4_ = auVar249._8_4_ * auVar29._8_4_;
      auVar41._12_4_ = auVar249._12_4_ * auVar29._12_4_;
      auVar41._16_4_ = auVar249._16_4_ * auVar29._16_4_;
      auVar41._20_4_ = auVar249._20_4_ * auVar29._20_4_;
      auVar41._24_4_ = auVar249._24_4_ * auVar29._24_4_;
      auVar41._28_4_ = fStack_564;
      auVar30 = vsubps_avx(auVar41,auVar40);
      auVar42._4_4_ = auVar331._4_4_ * auVar29._4_4_;
      auVar42._0_4_ = auVar331._0_4_ * auVar29._0_4_;
      auVar42._8_4_ = auVar331._8_4_ * auVar29._8_4_;
      auVar42._12_4_ = auVar331._12_4_ * auVar29._12_4_;
      auVar42._16_4_ = auVar331._16_4_ * auVar29._16_4_;
      auVar42._20_4_ = auVar331._20_4_ * auVar29._20_4_;
      auVar42._24_4_ = auVar331._24_4_ * auVar29._24_4_;
      auVar42._28_4_ = auVar17._28_4_;
      auVar43._4_4_ = auVar34._4_4_ * auVar27._4_4_;
      auVar43._0_4_ = auVar34._0_4_ * auVar27._0_4_;
      auVar43._8_4_ = auVar34._8_4_ * auVar27._8_4_;
      auVar43._12_4_ = auVar34._12_4_ * auVar27._12_4_;
      auVar43._16_4_ = auVar34._16_4_ * auVar27._16_4_;
      auVar43._20_4_ = auVar34._20_4_ * auVar27._20_4_;
      auVar43._24_4_ = auVar34._24_4_ * auVar27._24_4_;
      auVar43._28_4_ = auVar27._28_4_;
      auVar27 = vsubps_avx(auVar43,auVar42);
      auVar140._0_4_ = auVar278._0_4_ * 0.0 + auVar27._0_4_ + auVar30._0_4_ * 0.0;
      auVar140._4_4_ = auVar278._4_4_ * 0.0 + auVar27._4_4_ + auVar30._4_4_ * 0.0;
      auVar140._8_4_ = auVar278._8_4_ * 0.0 + auVar27._8_4_ + auVar30._8_4_ * 0.0;
      auVar140._12_4_ = auVar278._12_4_ * 0.0 + auVar27._12_4_ + auVar30._12_4_ * 0.0;
      auVar140._16_4_ = auVar278._16_4_ * 0.0 + auVar27._16_4_ + auVar30._16_4_ * 0.0;
      auVar140._20_4_ = auVar278._20_4_ * 0.0 + auVar27._20_4_ + auVar30._20_4_ * 0.0;
      auVar140._24_4_ = auVar278._24_4_ * 0.0 + auVar27._24_4_ + auVar30._24_4_ * 0.0;
      auVar140._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar30._28_4_;
      auVar278 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
      _local_5e0 = vblendvps_avx(auVar145,_local_500,auVar278);
      _local_4c0 = vblendvps_avx(auVar28,_local_3c0,auVar278);
      auVar145 = vblendvps_avx(auVar26,auVar286,auVar278);
      auVar28 = vblendvps_avx(auVar34,auVar313,auVar278);
      auVar26 = vblendvps_avx(auVar331,auVar346,auVar278);
      auVar27 = vblendvps_avx(auVar249,auVar356,auVar278);
      auVar34 = vblendvps_avx(auVar313,auVar34,auVar278);
      auVar17 = vblendvps_avx(auVar346,auVar331,auVar278);
      auVar168 = vpackssdw_avx(local_2e0._0_16_,local_2e0._16_16_);
      auVar249 = vblendvps_avx(auVar356,auVar249,auVar278);
      auVar34 = vsubps_avx(auVar34,_local_5e0);
      auVar17 = vsubps_avx(auVar17,_local_4c0);
      auVar249 = vsubps_avx(auVar249,auVar145);
      auVar29 = vsubps_avx(_local_4c0,auVar26);
      fVar292 = auVar17._0_4_;
      fVar157 = auVar145._0_4_;
      fVar342 = auVar17._4_4_;
      fVar269 = auVar145._4_4_;
      auVar44._4_4_ = fVar269 * fVar342;
      auVar44._0_4_ = fVar157 * fVar292;
      fVar271 = auVar17._8_4_;
      fVar270 = auVar145._8_4_;
      auVar44._8_4_ = fVar270 * fVar271;
      fVar158 = auVar17._12_4_;
      fVar272 = auVar145._12_4_;
      auVar44._12_4_ = fVar272 * fVar158;
      fVar189 = auVar17._16_4_;
      fVar234 = auVar145._16_4_;
      auVar44._16_4_ = fVar234 * fVar189;
      fVar132 = auVar17._20_4_;
      fVar236 = auVar145._20_4_;
      auVar44._20_4_ = fVar236 * fVar132;
      fVar307 = auVar17._24_4_;
      fVar237 = auVar145._24_4_;
      auVar44._24_4_ = fVar237 * fVar307;
      auVar44._28_4_ = local_2e0._28_4_;
      fVar294 = local_4c0._0_4_;
      fVar213 = auVar249._0_4_;
      fVar327 = local_4c0._4_4_;
      fVar215 = auVar249._4_4_;
      auVar45._4_4_ = fVar215 * fVar327;
      auVar45._0_4_ = fVar213 * fVar294;
      fVar235 = local_4c0._8_4_;
      fVar242 = auVar249._8_4_;
      auVar45._8_4_ = fVar242 * fVar235;
      fVar160 = local_4c0._12_4_;
      fVar255 = auVar249._12_4_;
      auVar45._12_4_ = fVar255 * fVar160;
      fVar299 = local_4c0._16_4_;
      fVar263 = auVar249._16_4_;
      auVar45._16_4_ = fVar263 * fVar299;
      fVar152 = local_4c0._20_4_;
      fVar266 = auVar249._20_4_;
      auVar45._20_4_ = fVar266 * fVar152;
      fVar151 = local_4c0._24_4_;
      fVar268 = auVar249._24_4_;
      uVar130 = auVar331._28_4_;
      auVar45._24_4_ = fVar268 * fVar151;
      auVar45._28_4_ = uVar130;
      auVar331 = vsubps_avx(auVar45,auVar44);
      fVar325 = local_5e0._0_4_;
      fVar190 = local_5e0._4_4_;
      auVar46._4_4_ = fVar215 * fVar190;
      auVar46._0_4_ = fVar213 * fVar325;
      fVar187 = local_5e0._8_4_;
      auVar46._8_4_ = fVar242 * fVar187;
      fVar296 = local_5e0._12_4_;
      auVar46._12_4_ = fVar255 * fVar296;
      fVar300 = local_5e0._16_4_;
      auVar46._16_4_ = fVar263 * fVar300;
      fVar244 = local_5e0._20_4_;
      auVar46._20_4_ = fVar266 * fVar244;
      fVar153 = local_5e0._24_4_;
      auVar46._24_4_ = fVar268 * fVar153;
      auVar46._28_4_ = uVar130;
      fVar188 = auVar34._0_4_;
      fVar328 = auVar34._4_4_;
      auVar47._4_4_ = fVar269 * fVar328;
      auVar47._0_4_ = fVar157 * fVar188;
      fVar273 = auVar34._8_4_;
      auVar47._8_4_ = fVar270 * fVar273;
      fVar298 = auVar34._12_4_;
      auVar47._12_4_ = fVar272 * fVar298;
      fVar240 = auVar34._16_4_;
      auVar47._16_4_ = fVar234 * fVar240;
      fVar243 = auVar34._20_4_;
      auVar47._20_4_ = fVar236 * fVar243;
      fVar154 = auVar34._24_4_;
      auVar47._24_4_ = fVar237 * fVar154;
      auVar47._28_4_ = auVar346._28_4_;
      auVar30 = vsubps_avx(auVar47,auVar46);
      auVar48._4_4_ = fVar327 * fVar328;
      auVar48._0_4_ = fVar294 * fVar188;
      auVar48._8_4_ = fVar235 * fVar273;
      auVar48._12_4_ = fVar160 * fVar298;
      auVar48._16_4_ = fVar299 * fVar240;
      auVar48._20_4_ = fVar152 * fVar243;
      auVar48._24_4_ = fVar151 * fVar154;
      auVar48._28_4_ = uVar130;
      auVar49._4_4_ = fVar190 * fVar342;
      auVar49._0_4_ = fVar325 * fVar292;
      auVar49._8_4_ = fVar187 * fVar271;
      auVar49._12_4_ = fVar296 * fVar158;
      auVar49._16_4_ = fVar300 * fVar189;
      auVar49._20_4_ = fVar244 * fVar132;
      auVar49._24_4_ = fVar153 * fVar307;
      auVar49._28_4_ = auVar356._28_4_;
      auVar31 = vsubps_avx(auVar49,auVar48);
      auVar32 = vsubps_avx(auVar145,auVar27);
      fVar326 = auVar31._28_4_ + auVar30._28_4_;
      auVar232._0_4_ = auVar31._0_4_ + auVar30._0_4_ * 0.0 + auVar331._0_4_ * 0.0;
      auVar232._4_4_ = auVar31._4_4_ + auVar30._4_4_ * 0.0 + auVar331._4_4_ * 0.0;
      auVar232._8_4_ = auVar31._8_4_ + auVar30._8_4_ * 0.0 + auVar331._8_4_ * 0.0;
      auVar232._12_4_ = auVar31._12_4_ + auVar30._12_4_ * 0.0 + auVar331._12_4_ * 0.0;
      auVar232._16_4_ = auVar31._16_4_ + auVar30._16_4_ * 0.0 + auVar331._16_4_ * 0.0;
      auVar232._20_4_ = auVar31._20_4_ + auVar30._20_4_ * 0.0 + auVar331._20_4_ * 0.0;
      auVar232._24_4_ = auVar31._24_4_ + auVar30._24_4_ * 0.0 + auVar331._24_4_ * 0.0;
      auVar232._28_4_ = fVar326 + 0.0;
      fVar239 = auVar29._0_4_;
      fVar241 = auVar29._4_4_;
      auVar50._4_4_ = fVar241 * auVar27._4_4_;
      auVar50._0_4_ = fVar239 * auVar27._0_4_;
      fVar293 = auVar29._8_4_;
      auVar50._8_4_ = fVar293 * auVar27._8_4_;
      fVar295 = auVar29._12_4_;
      auVar50._12_4_ = fVar295 * auVar27._12_4_;
      fVar297 = auVar29._16_4_;
      auVar50._16_4_ = fVar297 * auVar27._16_4_;
      fVar193 = auVar29._20_4_;
      auVar50._20_4_ = fVar193 * auVar27._20_4_;
      fVar211 = auVar29._24_4_;
      auVar50._24_4_ = fVar211 * auVar27._24_4_;
      auVar50._28_4_ = fVar326;
      fVar326 = auVar32._0_4_;
      fVar343 = auVar32._4_4_;
      auVar51._4_4_ = auVar26._4_4_ * fVar343;
      auVar51._0_4_ = auVar26._0_4_ * fVar326;
      fVar156 = auVar32._8_4_;
      auVar51._8_4_ = auVar26._8_4_ * fVar156;
      fVar238 = auVar32._12_4_;
      auVar51._12_4_ = auVar26._12_4_ * fVar238;
      fVar162 = auVar32._16_4_;
      auVar51._16_4_ = auVar26._16_4_ * fVar162;
      fVar274 = auVar32._20_4_;
      auVar51._20_4_ = auVar26._20_4_ * fVar274;
      fVar155 = auVar32._24_4_;
      auVar51._24_4_ = auVar26._24_4_ * fVar155;
      auVar51._28_4_ = auVar31._28_4_;
      auVar331 = vsubps_avx(auVar51,auVar50);
      auVar29 = vsubps_avx(_local_5e0,auVar28);
      fVar344 = auVar29._0_4_;
      fVar348 = auVar29._4_4_;
      auVar52._4_4_ = fVar348 * auVar27._4_4_;
      auVar52._0_4_ = fVar344 * auVar27._0_4_;
      fVar349 = auVar29._8_4_;
      auVar52._8_4_ = fVar349 * auVar27._8_4_;
      fVar350 = auVar29._12_4_;
      auVar52._12_4_ = fVar350 * auVar27._12_4_;
      fVar351 = auVar29._16_4_;
      auVar52._16_4_ = fVar351 * auVar27._16_4_;
      fVar352 = auVar29._20_4_;
      auVar52._20_4_ = fVar352 * auVar27._20_4_;
      fVar353 = auVar29._24_4_;
      auVar52._24_4_ = fVar353 * auVar27._24_4_;
      auVar52._28_4_ = auVar27._28_4_;
      auVar53._4_4_ = auVar28._4_4_ * fVar343;
      auVar53._0_4_ = auVar28._0_4_ * fVar326;
      auVar53._8_4_ = auVar28._8_4_ * fVar156;
      auVar53._12_4_ = auVar28._12_4_ * fVar238;
      auVar53._16_4_ = auVar28._16_4_ * fVar162;
      auVar53._20_4_ = auVar28._20_4_ * fVar274;
      auVar53._24_4_ = auVar28._24_4_ * fVar155;
      auVar53._28_4_ = 0;
      auVar29 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = auVar26._4_4_ * fVar348;
      auVar54._0_4_ = auVar26._0_4_ * fVar344;
      auVar54._8_4_ = auVar26._8_4_ * fVar349;
      auVar54._12_4_ = auVar26._12_4_ * fVar350;
      auVar54._16_4_ = auVar26._16_4_ * fVar351;
      auVar54._20_4_ = auVar26._20_4_ * fVar352;
      auVar54._24_4_ = auVar26._24_4_ * fVar353;
      auVar54._28_4_ = auVar27._28_4_;
      auVar55._4_4_ = auVar28._4_4_ * fVar241;
      auVar55._0_4_ = auVar28._0_4_ * fVar239;
      auVar55._8_4_ = auVar28._8_4_ * fVar293;
      auVar55._12_4_ = auVar28._12_4_ * fVar295;
      auVar55._16_4_ = auVar28._16_4_ * fVar297;
      auVar55._20_4_ = auVar28._20_4_ * fVar193;
      auVar55._24_4_ = auVar28._24_4_ * fVar211;
      auVar55._28_4_ = auVar28._28_4_;
      auVar28 = vsubps_avx(auVar55,auVar54);
      auVar207._0_4_ = auVar331._0_4_ * 0.0 + auVar28._0_4_ + auVar29._0_4_ * 0.0;
      auVar207._4_4_ = auVar331._4_4_ * 0.0 + auVar28._4_4_ + auVar29._4_4_ * 0.0;
      auVar207._8_4_ = auVar331._8_4_ * 0.0 + auVar28._8_4_ + auVar29._8_4_ * 0.0;
      auVar207._12_4_ = auVar331._12_4_ * 0.0 + auVar28._12_4_ + auVar29._12_4_ * 0.0;
      auVar207._16_4_ = auVar331._16_4_ * 0.0 + auVar28._16_4_ + auVar29._16_4_ * 0.0;
      auVar207._20_4_ = auVar331._20_4_ * 0.0 + auVar28._20_4_ + auVar29._20_4_ * 0.0;
      auVar207._24_4_ = auVar331._24_4_ * 0.0 + auVar28._24_4_ + auVar29._24_4_ * 0.0;
      auVar207._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar29._28_4_;
      auVar28 = vmaxps_avx(auVar232,auVar207);
      auVar28 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,2);
      auVar201 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
      auVar168 = vpand_avx(auVar168,auVar201);
      auVar201 = vpmovsxwd_avx(auVar168);
      auVar202 = vpunpckhwd_avx(auVar168,auVar168);
      auVar141._16_16_ = auVar202;
      auVar141._0_16_ = auVar201;
      if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar141 >> 0x7f,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar202 >> 0x3f,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar202[0xf]
         ) {
LAB_00936010:
        auVar172._8_8_ = local_480[1]._8_8_;
        auVar172._0_8_ = local_480[1]._0_8_;
        auVar172._16_8_ = local_480[1]._16_8_;
        auVar172._24_8_ = local_480[1]._24_8_;
        auVar289 = ZEXT3264(local_6e0);
        auVar306 = ZEXT3264(local_680);
      }
      else {
        _local_580 = auVar232;
        auVar56._4_4_ = fVar343 * fVar342;
        auVar56._0_4_ = fVar326 * fVar292;
        auVar56._8_4_ = fVar156 * fVar271;
        auVar56._12_4_ = fVar238 * fVar158;
        auVar56._16_4_ = fVar162 * fVar189;
        auVar56._20_4_ = fVar274 * fVar132;
        auVar56._24_4_ = fVar155 * fVar307;
        auVar56._28_4_ = auVar202._12_4_;
        auVar332._0_4_ = fVar239 * fVar213;
        auVar332._4_4_ = fVar241 * fVar215;
        auVar332._8_4_ = fVar293 * fVar242;
        auVar332._12_4_ = fVar295 * fVar255;
        auVar332._16_4_ = fVar297 * fVar263;
        auVar332._20_4_ = fVar193 * fVar266;
        auVar332._24_4_ = fVar211 * fVar268;
        auVar332._28_4_ = 0;
        auVar26 = vsubps_avx(auVar332,auVar56);
        auVar57._4_4_ = fVar348 * fVar215;
        auVar57._0_4_ = fVar344 * fVar213;
        auVar57._8_4_ = fVar349 * fVar242;
        auVar57._12_4_ = fVar350 * fVar255;
        auVar57._16_4_ = fVar351 * fVar263;
        auVar57._20_4_ = fVar352 * fVar266;
        auVar57._24_4_ = fVar353 * fVar268;
        auVar57._28_4_ = auVar249._28_4_;
        auVar58._4_4_ = fVar343 * fVar328;
        auVar58._0_4_ = fVar326 * fVar188;
        auVar58._8_4_ = fVar156 * fVar273;
        auVar58._12_4_ = fVar238 * fVar298;
        auVar58._16_4_ = fVar162 * fVar240;
        auVar58._20_4_ = fVar274 * fVar243;
        auVar58._24_4_ = fVar155 * fVar154;
        auVar58._28_4_ = auVar32._28_4_;
        auVar27 = vsubps_avx(auVar58,auVar57);
        auVar59._4_4_ = fVar241 * fVar328;
        auVar59._0_4_ = fVar239 * fVar188;
        auVar59._8_4_ = fVar293 * fVar273;
        auVar59._12_4_ = fVar295 * fVar298;
        auVar59._16_4_ = fVar297 * fVar240;
        auVar59._20_4_ = fVar193 * fVar243;
        auVar59._24_4_ = fVar211 * fVar154;
        auVar59._28_4_ = auVar34._28_4_;
        auVar60._4_4_ = fVar348 * fVar342;
        auVar60._0_4_ = fVar344 * fVar292;
        auVar60._8_4_ = fVar349 * fVar271;
        auVar60._12_4_ = fVar350 * fVar158;
        auVar60._16_4_ = fVar351 * fVar189;
        auVar60._20_4_ = fVar352 * fVar132;
        auVar60._24_4_ = fVar353 * fVar307;
        auVar60._28_4_ = auVar17._28_4_;
        auVar249 = vsubps_avx(auVar60,auVar59);
        auVar280._0_4_ = auVar26._0_4_ * 0.0 + auVar249._0_4_ + auVar27._0_4_ * 0.0;
        auVar280._4_4_ = auVar26._4_4_ * 0.0 + auVar249._4_4_ + auVar27._4_4_ * 0.0;
        auVar280._8_4_ = auVar26._8_4_ * 0.0 + auVar249._8_4_ + auVar27._8_4_ * 0.0;
        auVar280._12_4_ = auVar26._12_4_ * 0.0 + auVar249._12_4_ + auVar27._12_4_ * 0.0;
        auVar280._16_4_ = auVar26._16_4_ * 0.0 + auVar249._16_4_ + auVar27._16_4_ * 0.0;
        auVar280._20_4_ = auVar26._20_4_ * 0.0 + auVar249._20_4_ + auVar27._20_4_ * 0.0;
        auVar280._24_4_ = auVar26._24_4_ * 0.0 + auVar249._24_4_ + auVar27._24_4_ * 0.0;
        auVar280._28_4_ = auVar17._28_4_ + auVar249._28_4_ + auVar34._28_4_;
        auVar28 = vrcpps_avx(auVar280);
        fVar188 = auVar28._0_4_;
        fVar326 = auVar28._4_4_;
        auVar61._4_4_ = auVar280._4_4_ * fVar326;
        auVar61._0_4_ = auVar280._0_4_ * fVar188;
        fVar342 = auVar28._8_4_;
        auVar61._8_4_ = auVar280._8_4_ * fVar342;
        fVar328 = auVar28._12_4_;
        auVar61._12_4_ = auVar280._12_4_ * fVar328;
        fVar343 = auVar28._16_4_;
        auVar61._16_4_ = auVar280._16_4_ * fVar343;
        fVar271 = auVar28._20_4_;
        auVar61._20_4_ = auVar280._20_4_ * fVar271;
        fVar273 = auVar28._24_4_;
        auVar61._24_4_ = auVar280._24_4_ * fVar273;
        auVar61._28_4_ = auVar32._28_4_;
        auVar333._8_4_ = 0x3f800000;
        auVar333._0_8_ = 0x3f8000003f800000;
        auVar333._12_4_ = 0x3f800000;
        auVar333._16_4_ = 0x3f800000;
        auVar333._20_4_ = 0x3f800000;
        auVar333._24_4_ = 0x3f800000;
        auVar333._28_4_ = 0x3f800000;
        auVar28 = vsubps_avx(auVar333,auVar61);
        fVar188 = auVar28._0_4_ * fVar188 + fVar188;
        fVar326 = auVar28._4_4_ * fVar326 + fVar326;
        fVar342 = auVar28._8_4_ * fVar342 + fVar342;
        fVar328 = auVar28._12_4_ * fVar328 + fVar328;
        fVar343 = auVar28._16_4_ * fVar343 + fVar343;
        fVar271 = auVar28._20_4_ * fVar271 + fVar271;
        fVar273 = auVar28._24_4_ * fVar273 + fVar273;
        auVar62._4_4_ =
             (auVar26._4_4_ * fVar190 + auVar27._4_4_ * fVar327 + auVar249._4_4_ * fVar269) *
             fVar326;
        auVar62._0_4_ =
             (auVar26._0_4_ * fVar325 + auVar27._0_4_ * fVar294 + auVar249._0_4_ * fVar157) *
             fVar188;
        auVar62._8_4_ =
             (auVar26._8_4_ * fVar187 + auVar27._8_4_ * fVar235 + auVar249._8_4_ * fVar270) *
             fVar342;
        auVar62._12_4_ =
             (auVar26._12_4_ * fVar296 + auVar27._12_4_ * fVar160 + auVar249._12_4_ * fVar272) *
             fVar328;
        auVar62._16_4_ =
             (auVar26._16_4_ * fVar300 + auVar27._16_4_ * fVar299 + auVar249._16_4_ * fVar234) *
             fVar343;
        auVar62._20_4_ =
             (auVar26._20_4_ * fVar244 + auVar27._20_4_ * fVar152 + auVar249._20_4_ * fVar236) *
             fVar271;
        auVar62._24_4_ =
             (auVar26._24_4_ * fVar153 + auVar27._24_4_ * fVar151 + auVar249._24_4_ * fVar237) *
             fVar273;
        auVar62._28_4_ = auVar232._28_4_ + auVar145._28_4_;
        auVar142._16_16_ = auVar18;
        auVar142._0_16_ = auVar18;
        auVar145 = vcmpps_avx(auVar142,auVar62,2);
        fVar292 = (local_7c0->super_RayK<1>).tfar;
        auVar171._4_4_ = fVar292;
        auVar171._0_4_ = fVar292;
        auVar171._8_4_ = fVar292;
        auVar171._12_4_ = fVar292;
        auVar171._16_4_ = fVar292;
        auVar171._20_4_ = fVar292;
        auVar171._24_4_ = fVar292;
        auVar171._28_4_ = fVar292;
        auVar28 = vcmpps_avx(auVar62,auVar171,2);
        auVar145 = vandps_avx(auVar28,auVar145);
        auVar201 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
        auVar168 = vpand_avx(auVar168,auVar201);
        auVar201 = vpmovsxwd_avx(auVar168);
        auVar202 = vpshufd_avx(auVar168,0xee);
        auVar202 = vpmovsxwd_avx(auVar202);
        auVar143._16_16_ = auVar202;
        auVar143._0_16_ = auVar201;
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar143 >> 0x7f,0) == '\0') &&
              (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar202 >> 0x3f,0) == '\0') &&
            (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar202[0xf]) goto LAB_00936010;
        auVar145 = vcmpps_avx(ZEXT832(0) << 0x20,auVar280,4);
        auVar201 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
        auVar168 = vpand_avx(auVar168,auVar201);
        auVar201 = vpmovsxwd_avx(auVar168);
        auVar168 = vpunpckhwd_avx(auVar168,auVar168);
        auVar250._16_16_ = auVar168;
        auVar250._0_16_ = auVar201;
        auVar172._8_8_ = local_480[1]._8_8_;
        auVar172._0_8_ = local_480[1]._0_8_;
        auVar172._16_8_ = local_480[1]._16_8_;
        auVar172._24_8_ = local_480[1]._24_8_;
        auVar289 = ZEXT3264(local_6e0);
        auVar306 = ZEXT3264(local_680);
        if ((((((((auVar250 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar250 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar250 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar250 >> 0x7f,0) != '\0') ||
              (auVar250 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar168 >> 0x3f,0) != '\0') ||
            (auVar250 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar168[0xf] < '\0') {
          auVar144._0_4_ = fVar188 * auVar232._0_4_;
          auVar144._4_4_ = fVar326 * auVar232._4_4_;
          auVar144._8_4_ = fVar342 * auVar232._8_4_;
          auVar144._12_4_ = fVar328 * auVar232._12_4_;
          auVar144._16_4_ = fVar343 * auVar232._16_4_;
          auVar144._20_4_ = fVar271 * auVar232._20_4_;
          auVar144._24_4_ = fVar273 * auVar232._24_4_;
          auVar144._28_4_ = 0;
          auVar63._4_4_ = auVar207._4_4_ * fVar326;
          auVar63._0_4_ = auVar207._0_4_ * fVar188;
          auVar63._8_4_ = auVar207._8_4_ * fVar342;
          auVar63._12_4_ = auVar207._12_4_ * fVar328;
          auVar63._16_4_ = auVar207._16_4_ * fVar343;
          auVar63._20_4_ = auVar207._20_4_ * fVar271;
          auVar63._24_4_ = auVar207._24_4_ * fVar273;
          auVar63._28_4_ = SUB84(local_480[1]._24_8_,4);
          auVar260._8_4_ = 0x3f800000;
          auVar260._0_8_ = 0x3f8000003f800000;
          auVar260._12_4_ = 0x3f800000;
          auVar260._16_4_ = 0x3f800000;
          auVar260._20_4_ = 0x3f800000;
          auVar260._24_4_ = 0x3f800000;
          auVar260._28_4_ = 0x3f800000;
          auVar145 = vsubps_avx(auVar260,auVar144);
          auVar145 = vblendvps_avx(auVar145,auVar144,auVar278);
          auVar289 = ZEXT3264(auVar145);
          auVar145 = vsubps_avx(auVar260,auVar63);
          _local_300 = vblendvps_avx(auVar145,auVar63,auVar278);
          auVar306 = ZEXT3264(auVar62);
          auVar172 = auVar250;
        }
      }
      auVar336 = ZEXT1664(auVar330);
      auVar316 = ZEXT3264(auVar205);
      if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar172 >> 0x7f,0) == '\0') &&
            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar172 >> 0xbf,0) == '\0') &&
          (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar172[0x1f]) {
        auVar341 = ZEXT3264(_local_660);
      }
      else {
        auVar145 = vsubps_avx(_local_420,_local_7a0);
        fVar294 = (float)local_7a0._0_4_ + auVar289._0_4_ * auVar145._0_4_;
        fVar325 = (float)local_7a0._4_4_ + auVar289._4_4_ * auVar145._4_4_;
        fVar188 = (float)auStack_798._0_4_ + auVar289._8_4_ * auVar145._8_4_;
        fVar326 = (float)auStack_798._4_4_ + auVar289._12_4_ * auVar145._12_4_;
        fVar342 = fStack_790 + auVar289._16_4_ * auVar145._16_4_;
        fVar327 = fStack_78c + auVar289._20_4_ * auVar145._20_4_;
        fVar190 = fStack_788 + auVar289._24_4_ * auVar145._24_4_;
        fVar328 = auVar145._28_4_ + 0.0;
        fVar292 = local_738->depth_scale;
        auVar64._4_4_ = (fVar325 + fVar325) * fVar292;
        auVar64._0_4_ = (fVar294 + fVar294) * fVar292;
        auVar64._8_4_ = (fVar188 + fVar188) * fVar292;
        auVar64._12_4_ = (fVar326 + fVar326) * fVar292;
        auVar64._16_4_ = (fVar342 + fVar342) * fVar292;
        auVar64._20_4_ = (fVar327 + fVar327) * fVar292;
        auVar64._24_4_ = (fVar190 + fVar190) * fVar292;
        auVar64._28_4_ = fVar328 + fVar328;
        local_200 = auVar306._0_32_;
        auVar145 = vcmpps_avx(local_200,auVar64,6);
        auVar28 = auVar172 & auVar145;
        auVar341 = ZEXT3264(_local_660);
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0x7f,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar28 >> 0xbf,0) != '\0') ||
            (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar28[0x1f] < '\0') {
          local_300._0_4_ = (float)local_300._0_4_ + (float)local_300._0_4_ + -1.0;
          local_300._4_4_ = (float)local_300._4_4_ + (float)local_300._4_4_ + -1.0;
          uStack_2f8._0_4_ = (float)uStack_2f8 + (float)uStack_2f8 + -1.0;
          uStack_2f8._4_4_ = uStack_2f8._4_4_ + uStack_2f8._4_4_ + -1.0;
          uStack_2f0._0_4_ = (float)uStack_2f0 + (float)uStack_2f0 + -1.0;
          uStack_2f0._4_4_ = uStack_2f0._4_4_ + uStack_2f0._4_4_ + -1.0;
          uStack_2e8._0_4_ = (float)uStack_2e8 + (float)uStack_2e8 + -1.0;
          uStack_2e8._4_4_ = uStack_2e8._4_4_ + uStack_2e8._4_4_ + -1.0;
          local_240 = auVar289._0_32_;
          auVar118 = _local_300;
          auVar28 = _local_300;
          local_220 = (float)local_300._0_4_;
          fStack_21c = (float)local_300._4_4_;
          fStack_218 = (float)uStack_2f8;
          fStack_214 = uStack_2f8._4_4_;
          fStack_210 = (float)uStack_2f0;
          fStack_20c = uStack_2f0._4_4_;
          fStack_208 = (float)uStack_2e8;
          fStack_204 = uStack_2e8._4_4_;
          local_1e0 = 0;
          local_1dc = uVar124;
          uStack_748 = auVar248._8_8_;
          local_1d0 = auVar248._0_8_;
          uStack_1c8 = uStack_748;
          uStack_758 = auVar284._8_8_;
          local_1c0 = auVar284._0_8_;
          uStack_1b8 = uStack_758;
          uStack_688 = auVar355._8_8_;
          local_1b0 = auVar355._0_8_;
          uStack_1a8 = uStack_688;
          uStack_698 = auVar198._8_8_;
          local_1a0 = auVar198._0_8_;
          uStack_198 = uStack_698;
          local_730.ray = (RTCRayN *)local_7c0;
          _local_760 = auVar21;
          _local_750 = auVar22;
          _local_6a0 = auVar24;
          _local_690 = auVar19;
          if ((pGVar14->mask & (local_7c0->super_RayK<1>).mask) != 0) {
            auVar145 = vandps_avx(auVar145,auVar172);
            local_480[0] = auVar145;
            auVar199._0_4_ = 1.0 / auVar330._0_4_;
            auVar199._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar168 = vshufps_avx(auVar199,auVar199,0);
            local_160[0] = auVar168._0_4_ * (auVar289._0_4_ + 0.0);
            local_160[1] = auVar168._4_4_ * (auVar289._4_4_ + 1.0);
            local_160[2] = auVar168._8_4_ * (auVar289._8_4_ + 2.0);
            local_160[3] = auVar168._12_4_ * (auVar289._12_4_ + 3.0);
            fStack_150 = auVar168._0_4_ * (auVar289._16_4_ + 4.0);
            fStack_14c = auVar168._4_4_ * (auVar289._20_4_ + 5.0);
            fStack_148 = auVar168._8_4_ * (auVar289._24_4_ + 6.0);
            fStack_144 = auVar289._28_4_ + 7.0;
            uStack_2f0 = auVar118._16_8_;
            uStack_2e8 = auVar28._24_8_;
            local_140 = local_300;
            uStack_138 = uStack_2f8;
            uStack_130 = uStack_2f0;
            uStack_128 = uStack_2e8;
            local_120 = local_200;
            auVar173._8_4_ = 0x7f800000;
            auVar173._0_8_ = 0x7f8000007f800000;
            auVar173._12_4_ = 0x7f800000;
            auVar173._16_4_ = 0x7f800000;
            auVar173._20_4_ = 0x7f800000;
            auVar173._24_4_ = 0x7f800000;
            auVar173._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar173,local_200,auVar145);
            auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
            auVar27 = vminps_avx(auVar26,auVar27);
            auVar34 = vshufpd_avx(auVar27,auVar27,5);
            auVar27 = vminps_avx(auVar27,auVar34);
            auVar34 = vperm2f128_avx(auVar27,auVar27,1);
            auVar27 = vminps_avx(auVar27,auVar34);
            auVar26 = vcmpps_avx(auVar26,auVar27,0);
            auVar27 = auVar145 & auVar26;
            local_7ac = uVar124;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar145 = vandps_avx(auVar26,auVar145);
            }
            uVar119 = vmovmskps_avx(auVar145);
            uVar124 = 0;
            if (uVar119 != 0) {
              for (; (uVar119 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
              }
            }
            uVar123 = (ulong)uVar124;
            _local_300 = auVar28;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_680 = local_200;
              _local_7a0 = ZEXT432((uint)(local_7c0->super_RayK<1>).tfar);
              local_6e0 = auVar289._0_32_;
              do {
                local_604 = local_160[uVar123];
                local_600 = *(undefined4 *)((long)&local_140 + uVar123 * 4);
                (((RayHit *)local_730.ray)->super_RayK<1>).tfar =
                     *(float *)(local_120 + uVar123 * 4);
                fVar317 = 1.0 - local_604;
                fVar308 = local_604 * 3.0;
                auVar168 = ZEXT416((uint)((fVar317 * -2.0 * local_604 + local_604 * local_604) * 0.5
                                         ));
                auVar168 = vshufps_avx(auVar168,auVar168,0);
                auVar201 = ZEXT416((uint)(((fVar317 + fVar317) * (fVar308 + 2.0) +
                                          fVar317 * fVar317 * -3.0) * 0.5));
                auVar201 = vshufps_avx(auVar201,auVar201,0);
                auVar202 = ZEXT416((uint)(((local_604 + local_604) * (fVar308 + -5.0) +
                                          local_604 * fVar308) * 0.5));
                auVar202 = vshufps_avx(auVar202,auVar202,0);
                auVar221 = ZEXT416((uint)((local_604 * (fVar317 + fVar317) - fVar317 * fVar317) *
                                         0.5));
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                auVar204._0_4_ =
                     auVar221._0_4_ * (float)local_750._0_4_ +
                     auVar202._0_4_ * (float)local_760._0_4_ +
                     auVar168._0_4_ * (float)local_6a0._0_4_ +
                     auVar201._0_4_ * (float)local_690._0_4_;
                auVar204._4_4_ =
                     auVar221._4_4_ * (float)local_750._4_4_ +
                     auVar202._4_4_ * (float)local_760._4_4_ +
                     auVar168._4_4_ * (float)local_6a0._4_4_ +
                     auVar201._4_4_ * (float)local_690._4_4_;
                auVar204._8_4_ =
                     auVar221._8_4_ * (float)uStack_748 +
                     auVar202._8_4_ * (float)uStack_758 +
                     auVar168._8_4_ * (float)uStack_698 + auVar201._8_4_ * (float)uStack_688;
                auVar204._12_4_ =
                     auVar221._12_4_ * uStack_748._4_4_ +
                     auVar202._12_4_ * uStack_758._4_4_ +
                     auVar168._12_4_ * uStack_698._4_4_ + auVar201._12_4_ * uStack_688._4_4_;
                local_730.context = context->user;
                local_610 = vmovlps_avx(auVar204);
                local_608 = vextractps_avx(auVar204,2);
                local_5fc = (int)local_7a8;
                local_5f8 = (int)local_7b8;
                local_5f4 = (local_730.context)->instID[0];
                local_5f0 = (local_730.context)->instPrimID[0];
                local_7c4 = -1;
                local_730.valid = &local_7c4;
                local_730.geometryUserPtr = pGVar14->userPtr;
                local_730.hit = (RTCHitN *)&local_610;
                local_730.N = 1;
                pRVar127 = (RayHit *)local_730.ray;
                if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0093626c:
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var16)(&local_730);
                    auVar336 = ZEXT1664(local_560._0_16_);
                    auVar316 = ZEXT3264(_local_520);
                    auVar289 = ZEXT3264(local_6e0);
                    pRVar127 = local_7c0;
                    fVar192 = (float)local_640._0_4_;
                    fVar210 = (float)local_640._4_4_;
                    fVar212 = fStack_638;
                    fVar214 = fStack_634;
                    fVar254 = fStack_630;
                    fVar262 = fStack_62c;
                    fVar265 = fStack_628;
                    fVar216 = (float)local_780._0_4_;
                    fVar225 = (float)local_780._4_4_;
                    fVar226 = fStack_778;
                    fVar227 = fStack_774;
                    fVar253 = fStack_770;
                    fVar309 = fStack_76c;
                    fVar318 = fStack_768;
                    if (*local_730.valid == 0) goto LAB_00936341;
                  }
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                       *(float *)local_730.hit;
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_730.hit + 4);
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_730.hit + 8);
                  *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                  *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                  *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                  *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                  *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                  *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                  local_730.ray = (RTCRayN *)pRVar127;
                }
                else {
                  (*pGVar14->intersectionFilterN)(&local_730);
                  auVar336 = ZEXT1664(local_560._0_16_);
                  auVar316 = ZEXT3264(_local_520);
                  auVar289 = ZEXT3264(local_6e0);
                  pRVar127 = local_7c0;
                  fVar192 = (float)local_640._0_4_;
                  fVar210 = (float)local_640._4_4_;
                  fVar212 = fStack_638;
                  fVar214 = fStack_634;
                  fVar254 = fStack_630;
                  fVar262 = fStack_62c;
                  fVar265 = fStack_628;
                  fVar216 = (float)local_780._0_4_;
                  fVar225 = (float)local_780._4_4_;
                  fVar226 = fStack_778;
                  fVar227 = fStack_774;
                  fVar253 = fStack_770;
                  fVar309 = fStack_76c;
                  fVar318 = fStack_768;
                  if (*local_730.valid != 0) goto LAB_0093626c;
LAB_00936341:
                  (local_7c0->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                  local_730.ray = (RTCRayN *)local_7c0;
                }
                auVar330._0_4_ = auVar336._0_4_;
                auVar205 = auVar316._0_32_;
                *(undefined4 *)(local_480[0] + uVar123 * 4) = 0;
                auVar26 = local_480[0];
                fVar308 = (((RayHit *)local_730.ray)->super_RayK<1>).tfar;
                auVar150._4_4_ = fVar308;
                auVar150._0_4_ = fVar308;
                auVar150._8_4_ = fVar308;
                auVar150._12_4_ = fVar308;
                auVar150._16_4_ = fVar308;
                auVar150._20_4_ = fVar308;
                auVar150._24_4_ = fVar308;
                auVar150._28_4_ = fVar308;
                auVar306 = ZEXT3264(local_680);
                auVar28 = vcmpps_avx(local_680,auVar150,2);
                auVar145 = vandps_avx(auVar28,local_480[0]);
                local_480[0] = auVar145;
                auVar26 = auVar26 & auVar28;
                fVar165 = (float)local_5a0._0_4_;
                fVar180 = (float)local_5a0._4_4_;
                fVar183 = fStack_598;
                fVar186 = fStack_594;
                fVar163 = fStack_590;
                fVar178 = fStack_58c;
                fVar181 = fStack_588;
                fVar184 = fStack_584;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0x7f,0) == '\0') &&
                      (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0xbf,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar26[0x1f]) goto LAB_00934f5d;
                _local_7a0 = *(undefined1 (*) [32])&(((RayHit *)local_730.ray)->super_RayK<1>).tfar;
                auVar177._8_4_ = 0x7f800000;
                auVar177._0_8_ = 0x7f8000007f800000;
                auVar177._12_4_ = 0x7f800000;
                auVar177._16_4_ = 0x7f800000;
                auVar177._20_4_ = 0x7f800000;
                auVar177._24_4_ = 0x7f800000;
                auVar177._28_4_ = 0x7f800000;
                auVar28 = vblendvps_avx(auVar177,local_680,auVar145);
                auVar26 = vshufps_avx(auVar28,auVar28,0xb1);
                auVar26 = vminps_avx(auVar28,auVar26);
                auVar27 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar28 = vcmpps_avx(auVar28,auVar26,0);
                auVar26 = auVar145 & auVar28;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0xbf,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar145 = vandps_avx(auVar28,auVar145);
                }
                uVar120 = vmovmskps_avx(auVar145);
                uVar122 = 0;
                if (uVar120 != 0) {
                  for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                  }
                }
                uVar123 = (ulong)uVar122;
              } while( true );
            }
            fVar308 = local_160[uVar123];
            fVar320 = 1.0 - fVar308;
            fVar317 = fVar308 * 3.0;
            auVar168 = ZEXT416((uint)((fVar320 * -2.0 * fVar308 + fVar308 * fVar308) * 0.5));
            auVar168 = vshufps_avx(auVar168,auVar168,0);
            auVar201 = ZEXT416((uint)(((fVar320 + fVar320) * (fVar317 + 2.0) +
                                      fVar320 * fVar320 * -3.0) * 0.5));
            auVar201 = vshufps_avx(auVar201,auVar201,0);
            auVar202 = ZEXT416((uint)(((fVar308 + fVar308) * (fVar317 + -5.0) + fVar308 * fVar317) *
                                     0.5));
            auVar202 = vshufps_avx(auVar202,auVar202,0);
            fVar317 = *(float *)((long)&local_140 + uVar123 * 4);
            auVar221 = ZEXT416((uint)((fVar308 * (fVar320 + fVar320) - fVar320 * fVar320) * 0.5));
            auVar221 = vshufps_avx(auVar221,auVar221,0);
            auVar167._0_4_ =
                 auVar221._0_4_ * fVar245 +
                 auVar202._0_4_ * fVar282 + auVar168._0_4_ * fVar191 + auVar201._0_4_ * fVar354;
            auVar167._4_4_ =
                 auVar221._4_4_ * fVar252 +
                 auVar202._4_4_ * fVar291 + auVar168._4_4_ * fVar209 + auVar201._4_4_ * fVar358;
            auVar167._8_4_ =
                 auVar221._8_4_ * auVar248._8_4_ +
                 auVar202._8_4_ * auVar284._8_4_ +
                 auVar168._8_4_ * auVar198._8_4_ + auVar201._8_4_ * auVar355._8_4_;
            auVar167._12_4_ =
                 auVar221._12_4_ * auVar248._12_4_ +
                 auVar202._12_4_ * auVar284._12_4_ +
                 auVar168._12_4_ * auVar198._12_4_ + auVar201._12_4_ * auVar355._12_4_;
            (local_7c0->super_RayK<1>).tfar = *(float *)(local_120 + uVar123 * 4);
            uVar11 = vmovlps_avx(auVar167);
            *(undefined8 *)&(local_7c0->Ng).field_0 = uVar11;
            fVar320 = (float)vextractps_avx(auVar167,2);
            (local_7c0->Ng).field_0.field_0.z = fVar320;
            local_7c0->u = fVar308;
            local_7c0->v = fVar317;
            local_7c0->primID = uVar120;
            local_7c0->geomID = uVar122;
            local_7c0->instID[0] = context->user->instID[0];
            local_7c0->instPrimID[0] = context->user->instPrimID[0];
LAB_00934f5d:
            auVar341 = ZEXT3264(_local_660);
            prim = local_740;
            uVar124 = local_7ac;
            auVar18 = _local_700;
          }
          _local_700 = auVar18;
          ray = (RayHit *)local_730.ray;
          fVar159 = (float)local_4a0._0_4_;
          fVar161 = (float)local_4a0._4_4_;
          fVar256 = fStack_498;
          fVar264 = fStack_494;
          fVar308 = fStack_490;
          fVar317 = fStack_48c;
          fVar320 = fStack_488;
          fVar321 = fStack_484;
          fVar164 = (float)local_6c0._0_4_;
          fVar179 = (float)local_6c0._4_4_;
          fVar182 = fStack_6b8;
          fVar185 = fStack_6b4;
          fVar267 = fStack_6b0;
          fVar281 = fStack_6ac;
          fVar290 = fStack_6a8;
          auVar18 = _local_700;
        }
      }
      _local_700 = auVar18;
      auVar168 = local_5c0._0_16_;
    }
    if (8 < (int)uVar124) {
      _local_500 = vpshufd_avx(ZEXT416(uVar124),0);
      auVar168 = vshufps_avx(auVar168,auVar168,0);
      register0x00001210 = auVar168;
      _local_400 = auVar168;
      local_2e0._16_8_ = local_700;
      local_2e0._0_16_ = _local_700;
      local_2e0._24_8_ = uStack_6f8;
      auVar137._0_4_ = 1.0 / auVar330._0_4_;
      auVar137._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar168 = vshufps_avx(auVar137,auVar137,0);
      register0x00001210 = auVar168;
      _local_c0 = auVar168;
      lVar126 = 8;
      local_6e0 = auVar289._0_32_;
      local_680 = auVar306._0_32_;
      _local_660 = auVar341._0_32_;
      _local_520 = auVar205;
LAB_00935055:
      if (lVar126 < lVar125) {
        pauVar7 = (undefined1 (*) [28])(catmullrom_basis0 + lVar126 * 4 + lVar131);
        fVar292 = *(float *)*pauVar7;
        fVar294 = *(float *)(*pauVar7 + 4);
        fVar325 = *(float *)(*pauVar7 + 8);
        fVar188 = *(float *)(*pauVar7 + 0xc);
        fVar326 = *(float *)(*pauVar7 + 0x10);
        fVar342 = *(float *)(*pauVar7 + 0x14);
        fVar327 = *(float *)(*pauVar7 + 0x18);
        auVar116 = *pauVar7;
        pauVar9 = (undefined1 (*) [28])(lVar131 + 0x22047f0 + lVar126 * 4);
        fVar190 = *(float *)*pauVar9;
        fVar328 = *(float *)(*pauVar9 + 4);
        fVar343 = *(float *)(*pauVar9 + 8);
        fVar271 = *(float *)(*pauVar9 + 0xc);
        fVar235 = *(float *)(*pauVar9 + 0x10);
        fVar187 = *(float *)(*pauVar9 + 0x14);
        fVar273 = *(float *)(*pauVar9 + 0x18);
        auVar115 = *pauVar9;
        pauVar10 = (undefined1 (*) [28])(lVar131 + 0x2204c74 + lVar126 * 4);
        fVar156 = *(float *)*pauVar10;
        fVar158 = *(float *)(*pauVar10 + 4);
        fVar160 = *(float *)(*pauVar10 + 8);
        fVar296 = *(float *)(*pauVar10 + 0xc);
        fVar298 = *(float *)(*pauVar10 + 0x10);
        fVar238 = *(float *)(*pauVar10 + 0x14);
        fVar189 = *(float *)(*pauVar10 + 0x18);
        auVar114 = *pauVar10;
        pauVar10 = (undefined1 (*) [28])(lVar131 + 0x22050f8 + lVar126 * 4);
        fVar299 = *(float *)*pauVar10;
        fVar300 = *(float *)(*pauVar10 + 4);
        fVar240 = *(float *)(*pauVar10 + 8);
        fVar162 = *(float *)(*pauVar10 + 0xc);
        fVar132 = *(float *)(*pauVar10 + 0x10);
        fVar152 = *(float *)(*pauVar10 + 0x14);
        fVar244 = *(float *)(*pauVar10 + 0x18);
        auVar113 = *pauVar10;
        fVar243 = fVar321 + fVar321 + *(float *)pauVar10[1];
        local_7a0._0_4_ =
             fVar165 * fVar292 +
             fVar190 * (float)local_360._0_4_ + fVar164 * fVar156 + (float)local_380._0_4_ * fVar299
        ;
        local_7a0._4_4_ =
             fVar180 * fVar294 +
             fVar328 * (float)local_360._4_4_ + fVar179 * fVar158 + (float)local_380._4_4_ * fVar300
        ;
        auStack_798._0_4_ =
             fVar183 * fVar325 + fVar343 * fStack_358 + fVar182 * fVar160 + fStack_378 * fVar240;
        auStack_798._4_4_ =
             fVar186 * fVar188 + fVar271 * fStack_354 + fVar185 * fVar296 + fStack_374 * fVar162;
        fStack_790 = fVar163 * fVar326 +
                     fVar235 * fStack_350 + fVar267 * fVar298 + fStack_370 * fVar132;
        fStack_78c = fVar178 * fVar342 +
                     fVar187 * fStack_34c + fVar281 * fVar238 + fStack_36c * fVar152;
        fStack_788 = fVar181 * fVar327 +
                     fVar273 * fStack_348 + fVar290 * fVar189 + fStack_368 * fVar244;
        fStack_784 = *(float *)pauVar9[1] + fVar321 + fVar321 + fStack_364;
        fVar307 = auVar341._0_4_;
        fVar151 = auVar341._4_4_;
        fVar153 = auVar341._8_4_;
        fVar154 = auVar341._12_4_;
        fVar155 = auVar341._16_4_;
        fVar191 = auVar341._20_4_;
        fVar157 = auVar341._24_4_;
        local_5c0._0_4_ =
             fVar307 * fVar292 + fVar192 * fVar190 + fVar216 * fVar156 + fVar159 * fVar299;
        local_5c0._4_4_ =
             fVar151 * fVar294 + fVar210 * fVar328 + fVar225 * fVar158 + fVar161 * fVar300;
        local_5c0._8_4_ =
             fVar153 * fVar325 + fVar212 * fVar343 + fVar226 * fVar160 + fVar256 * fVar240;
        local_5c0._12_4_ =
             fVar154 * fVar188 + fVar214 * fVar271 + fVar227 * fVar296 + fVar264 * fVar162;
        local_5c0._16_4_ =
             fVar155 * fVar326 + fVar254 * fVar235 + fVar253 * fVar298 + fVar308 * fVar132;
        local_5c0._20_4_ =
             fVar191 * fVar342 + fVar262 * fVar187 + fVar309 * fVar238 + fVar317 * fVar152;
        local_5c0._24_4_ =
             fVar157 * fVar327 + fVar265 * fVar273 + fVar318 * fVar189 + fVar320 * fVar244;
        local_5c0._28_4_ = fStack_784 + fVar321 + fVar321 + fStack_424;
        local_700._0_4_ =
             fVar292 * (float)local_100._0_4_ +
             (float)local_a0._0_4_ * fVar190 +
             fVar156 * (float)local_e0._0_4_ + (float)local_80._0_4_ * fVar299;
        local_700._4_4_ =
             fVar294 * (float)local_100._4_4_ +
             (float)local_a0._4_4_ * fVar328 +
             fVar158 * (float)local_e0._4_4_ + (float)local_80._4_4_ * fVar300;
        uStack_6f8._0_4_ =
             fVar325 * fStack_f8 + fStack_98 * fVar343 + fVar160 * fStack_d8 + fStack_78 * fVar240;
        uStack_6f8._4_4_ =
             fVar188 * fStack_f4 + fStack_94 * fVar271 + fVar296 * fStack_d4 + fStack_74 * fVar162;
        fStack_6f0 = fVar326 * fStack_f0 +
                     fStack_90 * fVar235 + fVar298 * fStack_d0 + fStack_70 * fVar132;
        fStack_6ec = fVar342 * fStack_ec +
                     fStack_8c * fVar187 + fVar238 * fStack_cc + fStack_6c * fVar152;
        fStack_6e8 = fVar327 * fStack_e8 +
                     fStack_88 * fVar273 + fVar189 * fStack_c8 + fStack_68 * fVar244;
        fStack_6e4 = fStack_784 + fVar243;
        pfVar1 = (float *)(catmullrom_basis1 + lVar126 * 4 + lVar131);
        fVar292 = *pfVar1;
        fVar294 = pfVar1[1];
        fVar325 = pfVar1[2];
        fVar188 = pfVar1[3];
        fVar326 = pfVar1[4];
        fVar342 = pfVar1[5];
        fVar327 = pfVar1[6];
        pfVar1 = (float *)(lVar131 + 0x2206c10 + lVar126 * 4);
        fVar190 = *pfVar1;
        fVar328 = pfVar1[1];
        fVar343 = pfVar1[2];
        fVar271 = pfVar1[3];
        fVar235 = pfVar1[4];
        fVar187 = pfVar1[5];
        fVar273 = pfVar1[6];
        pauVar9 = (undefined1 (*) [28])(lVar131 + 0x2207094 + lVar126 * 4);
        fVar321 = *(float *)*pauVar9;
        fVar156 = *(float *)(*pauVar9 + 4);
        fVar158 = *(float *)(*pauVar9 + 8);
        fVar160 = *(float *)(*pauVar9 + 0xc);
        fVar296 = *(float *)(*pauVar9 + 0x10);
        fVar298 = *(float *)(*pauVar9 + 0x14);
        fVar238 = *(float *)(*pauVar9 + 0x18);
        auVar117 = *pauVar9;
        pfVar2 = (float *)(lVar131 + 0x2207518 + lVar126 * 4);
        fVar189 = *pfVar2;
        fVar299 = pfVar2[1];
        fVar300 = pfVar2[2];
        fVar240 = pfVar2[3];
        fVar162 = pfVar2[4];
        fVar132 = pfVar2[5];
        fVar152 = pfVar2[6];
        fVar274 = fVar184 + fStack_64;
        fVar244 = fVar184 + fVar184 + fVar243;
        auVar338._0_4_ =
             fVar165 * fVar292 +
             (float)local_360._0_4_ * fVar190 + fVar164 * fVar321 + (float)local_380._0_4_ * fVar189
        ;
        auVar338._4_4_ =
             fVar180 * fVar294 +
             (float)local_360._4_4_ * fVar328 + fVar179 * fVar156 + (float)local_380._4_4_ * fVar299
        ;
        auVar338._8_4_ =
             fVar183 * fVar325 + fStack_358 * fVar343 + fVar182 * fVar158 + fStack_378 * fVar300;
        auVar338._12_4_ =
             fVar186 * fVar188 + fStack_354 * fVar271 + fVar185 * fVar160 + fStack_374 * fVar240;
        auVar338._16_4_ =
             fVar163 * fVar326 + fStack_350 * fVar235 + fVar267 * fVar296 + fStack_370 * fVar162;
        auVar338._20_4_ =
             fVar178 * fVar342 + fStack_34c * fVar187 + fVar281 * fVar298 + fStack_36c * fVar132;
        auVar338._24_4_ =
             fVar181 * fVar327 + fStack_348 * fVar273 + fVar290 * fVar238 + fStack_368 * fVar152;
        auVar338._28_4_ = fVar274 + fVar244;
        local_560._0_4_ =
             fVar307 * fVar292 + fVar192 * fVar190 + fVar216 * fVar321 + fVar159 * fVar189;
        local_560._4_4_ =
             fVar151 * fVar294 + fVar210 * fVar328 + fVar225 * fVar156 + fVar161 * fVar299;
        local_560._8_4_ =
             fVar153 * fVar325 + fVar212 * fVar343 + fVar226 * fVar158 + fVar256 * fVar300;
        local_560._12_4_ =
             fVar154 * fVar188 + fVar214 * fVar271 + fVar227 * fVar160 + fVar264 * fVar240;
        local_560._16_4_ =
             fVar155 * fVar326 + fVar254 * fVar235 + fVar253 * fVar296 + fVar308 * fVar162;
        local_560._20_4_ =
             fVar191 * fVar342 + fVar262 * fVar187 + fVar309 * fVar298 + fVar317 * fVar132;
        local_560._24_4_ =
             fVar157 * fVar327 + fVar265 * fVar273 + fVar318 * fVar238 + fVar320 * fVar152;
        local_560._28_4_ = fVar244 + fVar184 + fVar184 + *(float *)pauVar7[1];
        auVar347._0_4_ =
             (float)local_a0._0_4_ * fVar190 +
             fVar321 * (float)local_e0._0_4_ + (float)local_80._0_4_ * fVar189 +
             fVar292 * (float)local_100._0_4_;
        auVar347._4_4_ =
             (float)local_a0._4_4_ * fVar328 +
             fVar156 * (float)local_e0._4_4_ + (float)local_80._4_4_ * fVar299 +
             fVar294 * (float)local_100._4_4_;
        auVar347._8_4_ =
             fStack_98 * fVar343 + fVar158 * fStack_d8 + fStack_78 * fVar300 + fVar325 * fStack_f8;
        auVar347._12_4_ =
             fStack_94 * fVar271 + fVar160 * fStack_d4 + fStack_74 * fVar240 + fVar188 * fStack_f4;
        auVar347._16_4_ =
             fStack_90 * fVar235 + fVar296 * fStack_d0 + fStack_70 * fVar162 + fVar326 * fStack_f0;
        auVar347._20_4_ =
             fStack_8c * fVar187 + fVar298 * fStack_cc + fStack_6c * fVar132 + fVar342 * fStack_ec;
        auVar347._24_4_ =
             fStack_88 * fVar273 + fVar238 * fStack_c8 + fStack_68 * fVar152 + fVar327 * fStack_e8;
        auVar347._28_4_ = fVar184 + fVar274 + fVar244;
        auVar28 = vsubps_avx(auVar338,_local_7a0);
        auVar26 = vsubps_avx(local_560,local_5c0);
        fVar308 = auVar28._0_4_;
        fVar317 = auVar28._4_4_;
        auVar65._4_4_ = local_5c0._4_4_ * fVar317;
        auVar65._0_4_ = local_5c0._0_4_ * fVar308;
        fVar320 = auVar28._8_4_;
        auVar65._8_4_ = local_5c0._8_4_ * fVar320;
        fVar321 = auVar28._12_4_;
        auVar65._12_4_ = local_5c0._12_4_ * fVar321;
        fVar163 = auVar28._16_4_;
        auVar65._16_4_ = local_5c0._16_4_ * fVar163;
        fVar178 = auVar28._20_4_;
        auVar65._20_4_ = local_5c0._20_4_ * fVar178;
        fVar181 = auVar28._24_4_;
        auVar65._24_4_ = local_5c0._24_4_ * fVar181;
        auVar65._28_4_ = fVar244;
        fVar184 = auVar26._0_4_;
        fVar254 = auVar26._4_4_;
        auVar66._4_4_ = fVar254 * (float)local_7a0._4_4_;
        auVar66._0_4_ = fVar184 * (float)local_7a0._0_4_;
        fVar262 = auVar26._8_4_;
        auVar66._8_4_ = fVar262 * (float)auStack_798._0_4_;
        fVar265 = auVar26._12_4_;
        auVar66._12_4_ = fVar265 * (float)auStack_798._4_4_;
        fVar267 = auVar26._16_4_;
        auVar66._16_4_ = fVar267 * fStack_790;
        fVar281 = auVar26._20_4_;
        auVar66._20_4_ = fVar281 * fStack_78c;
        fVar290 = auVar26._24_4_;
        auVar66._24_4_ = fVar290 * fStack_788;
        auVar66._28_4_ = local_560._28_4_;
        auVar27 = vsubps_avx(auVar65,auVar66);
        auVar145 = vmaxps_avx(_local_700,auVar347);
        auVar67._4_4_ = auVar145._4_4_ * auVar145._4_4_ * (fVar317 * fVar317 + fVar254 * fVar254);
        auVar67._0_4_ = auVar145._0_4_ * auVar145._0_4_ * (fVar308 * fVar308 + fVar184 * fVar184);
        auVar67._8_4_ = auVar145._8_4_ * auVar145._8_4_ * (fVar320 * fVar320 + fVar262 * fVar262);
        auVar67._12_4_ = auVar145._12_4_ * auVar145._12_4_ * (fVar321 * fVar321 + fVar265 * fVar265)
        ;
        auVar67._16_4_ = auVar145._16_4_ * auVar145._16_4_ * (fVar163 * fVar163 + fVar267 * fVar267)
        ;
        auVar67._20_4_ = auVar145._20_4_ * auVar145._20_4_ * (fVar178 * fVar178 + fVar281 * fVar281)
        ;
        auVar67._24_4_ = auVar145._24_4_ * auVar145._24_4_ * (fVar181 * fVar181 + fVar290 * fVar290)
        ;
        auVar67._28_4_ = fVar274 + local_560._28_4_;
        auVar68._4_4_ = auVar27._4_4_ * auVar27._4_4_;
        auVar68._0_4_ = auVar27._0_4_ * auVar27._0_4_;
        auVar68._8_4_ = auVar27._8_4_ * auVar27._8_4_;
        auVar68._12_4_ = auVar27._12_4_ * auVar27._12_4_;
        auVar68._16_4_ = auVar27._16_4_ * auVar27._16_4_;
        auVar68._20_4_ = auVar27._20_4_ * auVar27._20_4_;
        auVar68._24_4_ = auVar27._24_4_ * auVar27._24_4_;
        auVar68._28_4_ = auVar27._28_4_;
        _local_3c0 = vcmpps_avx(auVar68,auVar67,2);
        local_1e0 = (uint)lVar126;
        auVar201 = vpshufd_avx(ZEXT416(local_1e0),0);
        auVar168 = vpor_avx(auVar201,_DAT_01f4ad30);
        auVar201 = vpor_avx(auVar201,_DAT_01f7afa0);
        auVar168 = vpcmpgtd_avx(_local_500,auVar168);
        auVar201 = vpcmpgtd_avx(_local_500,auVar201);
        auVar208._16_16_ = auVar201;
        auVar208._0_16_ = auVar168;
        auVar145 = auVar208 & _local_3c0;
        fVar165 = (float)local_5a0._0_4_;
        fVar180 = (float)local_5a0._4_4_;
        fVar183 = fStack_598;
        fVar186 = fStack_594;
        fVar163 = fStack_590;
        fVar178 = fStack_58c;
        fVar181 = fStack_588;
        fVar184 = fStack_584;
        fVar192 = (float)local_640._0_4_;
        fVar210 = (float)local_640._4_4_;
        fVar212 = fStack_638;
        fVar214 = fStack_634;
        fVar254 = fStack_630;
        fVar262 = fStack_62c;
        fVar265 = fStack_628;
        fVar164 = (float)local_6c0._0_4_;
        fVar179 = (float)local_6c0._4_4_;
        fVar182 = fStack_6b8;
        fVar185 = fStack_6b4;
        fVar267 = fStack_6b0;
        fVar281 = fStack_6ac;
        fVar290 = fStack_6a8;
        fVar216 = (float)local_780._0_4_;
        fVar225 = (float)local_780._4_4_;
        fVar226 = fStack_778;
        fVar227 = fStack_774;
        fVar253 = fStack_770;
        fVar309 = fStack_76c;
        fVar318 = fStack_768;
        if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0x7f,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar145 >> 0xbf,0) != '\0') ||
            (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar145[0x1f] < '\0') {
          local_3a0._0_4_ = auVar117._0_4_;
          local_3a0._4_4_ = auVar117._4_4_;
          fStack_398 = auVar117._8_4_;
          fStack_394 = auVar117._12_4_;
          fStack_390 = auVar117._16_4_;
          fStack_38c = auVar117._20_4_;
          fStack_388 = auVar117._24_4_;
          fVar308 = (float)local_2a0._0_4_ * (float)local_3a0._0_4_;
          fVar317 = (float)local_2a0._4_4_ * (float)local_3a0._4_4_;
          fVar320 = fStack_298 * fStack_398;
          fVar321 = fStack_294 * fStack_394;
          fVar156 = fStack_290 * fStack_390;
          fVar158 = fStack_28c * fStack_38c;
          fVar160 = fStack_288 * fStack_388;
          _local_3a0 = auVar208;
          local_4e0 = fVar292 * (float)local_520._0_4_ +
                      fVar190 * (float)local_280._0_4_ + fVar308 + (float)local_540._0_4_ * fVar189;
          fStack_4dc = fVar294 * (float)local_520._4_4_ +
                       fVar328 * (float)local_280._4_4_ + fVar317 + (float)local_540._4_4_ * fVar299
          ;
          fStack_4d8 = fVar325 * fStack_518 + fVar343 * fStack_278 + fVar320 + fStack_538 * fVar300;
          fStack_4d4 = fVar188 * fStack_514 + fVar271 * fStack_274 + fVar321 + fStack_534 * fVar240;
          fStack_4d0 = fVar326 * fStack_510 + fVar235 * fStack_270 + fVar156 + fStack_530 * fVar162;
          fStack_4cc = fVar342 * fStack_50c + fVar187 * fStack_26c + fVar158 + fStack_52c * fVar132;
          fStack_4c8 = fVar327 * fStack_508 + fVar273 * fStack_268 + fVar160 + fStack_528 * fVar152;
          fStack_4c4 = pfVar1[7] + fStack_6e4 + *(float *)pauVar9[1] + 0.0;
          local_4c0._0_4_ = auVar115._0_4_;
          local_4c0._4_4_ = auVar115._4_4_;
          fStack_4b8 = auVar115._8_4_;
          fStack_4b4 = auVar115._12_4_;
          fStack_4b0 = auVar115._16_4_;
          fStack_4ac = auVar115._20_4_;
          fStack_4a8 = auVar115._24_4_;
          fVar132 = (float)local_280._0_4_ * (float)local_4c0._0_4_;
          fVar152 = (float)local_280._4_4_ * (float)local_4c0._4_4_;
          fVar244 = fStack_278 * fStack_4b8;
          fVar243 = fStack_274 * fStack_4b4;
          fVar274 = fStack_270 * fStack_4b0;
          fVar159 = fStack_26c * fStack_4ac;
          fVar161 = fStack_268 * fStack_4a8;
          local_580._0_4_ = auVar114._0_4_;
          local_580._4_4_ = auVar114._4_4_;
          fStack_578 = auVar114._8_4_;
          fStack_574 = auVar114._12_4_;
          fStack_570 = auVar114._16_4_;
          fStack_56c = auVar114._20_4_;
          fStack_568 = auVar114._24_4_;
          local_5e0._0_4_ = auVar113._0_4_;
          local_5e0._4_4_ = auVar113._4_4_;
          fStack_5d8 = auVar113._8_4_;
          fStack_5d4 = auVar113._12_4_;
          fStack_5d0 = auVar113._16_4_;
          fStack_5cc = auVar113._20_4_;
          fStack_5c8 = auVar113._24_4_;
          fVar256 = (float)local_540._0_4_ * (float)local_5e0._0_4_;
          fVar264 = (float)local_540._4_4_ * (float)local_5e0._4_4_;
          fVar209 = fStack_538 * fStack_5d8;
          fVar269 = fStack_534 * fStack_5d4;
          fVar270 = fStack_530 * fStack_5d0;
          fVar272 = fStack_52c * fStack_5cc;
          fVar245 = fStack_528 * fStack_5c8;
          pfVar1 = (float *)(lVar131 + 0x2205e84 + lVar126 * 4);
          fVar308 = *pfVar1;
          fVar317 = pfVar1[1];
          fVar320 = pfVar1[2];
          fVar321 = pfVar1[3];
          fVar292 = pfVar1[4];
          fVar294 = pfVar1[5];
          fVar325 = pfVar1[6];
          pfVar2 = (float *)(lVar131 + 0x2206308 + lVar126 * 4);
          fVar188 = *pfVar2;
          fVar326 = pfVar2[1];
          fVar342 = pfVar2[2];
          fVar327 = pfVar2[3];
          fVar190 = pfVar2[4];
          fVar328 = pfVar2[5];
          fVar343 = pfVar2[6];
          _local_4c0 = auVar338;
          _local_5e0 = auVar347;
          pfVar3 = (float *)(lVar131 + 0x2205a00 + lVar126 * 4);
          fVar271 = *pfVar3;
          fVar235 = pfVar3[1];
          fVar187 = pfVar3[2];
          fVar273 = pfVar3[3];
          fVar156 = pfVar3[4];
          fVar158 = pfVar3[5];
          fVar160 = pfVar3[6];
          fVar162 = pfVar1[7] + pfVar2[7];
          fStack_2a4 = pfVar2[7] + auVar347._28_4_ + 0.0;
          fVar252 = auVar347._28_4_ + auVar338._28_4_ + auVar347._28_4_ + 0.0;
          pfVar1 = (float *)(lVar131 + 0x220557c + lVar126 * 4);
          fVar296 = *pfVar1;
          fVar298 = pfVar1[1];
          fVar238 = pfVar1[2];
          fVar189 = pfVar1[3];
          fVar299 = pfVar1[4];
          fVar300 = pfVar1[5];
          fVar240 = pfVar1[6];
          local_3e0 = fVar296 * (float)local_5a0._0_4_ +
                      (float)local_360._0_4_ * fVar271 +
                      (float)local_6c0._0_4_ * fVar308 + (float)local_380._0_4_ * fVar188;
          fStack_3dc = fVar298 * (float)local_5a0._4_4_ +
                       (float)local_360._4_4_ * fVar235 +
                       (float)local_6c0._4_4_ * fVar317 + (float)local_380._4_4_ * fVar326;
          fStack_3d8 = fVar238 * fStack_598 +
                       fStack_358 * fVar187 + fStack_6b8 * fVar320 + fStack_378 * fVar342;
          fStack_3d4 = fVar189 * fStack_594 +
                       fStack_354 * fVar273 + fStack_6b4 * fVar321 + fStack_374 * fVar327;
          fStack_3d0 = fVar299 * fStack_590 +
                       fStack_350 * fVar156 + fStack_6b0 * fVar292 + fStack_370 * fVar190;
          fStack_3cc = fVar300 * fStack_58c +
                       fStack_34c * fVar158 + fStack_6ac * fVar294 + fStack_36c * fVar328;
          fStack_3c8 = fVar240 * fStack_588 +
                       fStack_348 * fVar160 + fStack_6a8 * fVar325 + fStack_368 * fVar343;
          fStack_3c4 = fVar162 + fStack_2a4;
          local_2c0 = fVar307 * fVar296 +
                      fVar308 * (float)local_780._0_4_ + (float)local_4a0._0_4_ * fVar188 +
                      fVar271 * (float)local_640._0_4_;
          fStack_2bc = fVar151 * fVar298 +
                       fVar317 * (float)local_780._4_4_ + (float)local_4a0._4_4_ * fVar326 +
                       fVar235 * (float)local_640._4_4_;
          fStack_2b8 = fVar153 * fVar238 +
                       fVar320 * fStack_778 + fStack_498 * fVar342 + fVar187 * fStack_638;
          fStack_2b4 = fVar154 * fVar189 +
                       fVar321 * fStack_774 + fStack_494 * fVar327 + fVar273 * fStack_634;
          fStack_2b0 = fVar155 * fVar299 +
                       fVar292 * fStack_770 + fStack_490 * fVar190 + fVar156 * fStack_630;
          fStack_2ac = fVar191 * fVar300 +
                       fVar294 * fStack_76c + fStack_48c * fVar328 + fVar158 * fStack_62c;
          fStack_2a8 = fVar157 * fVar240 +
                       fVar325 * fStack_768 + fStack_488 * fVar343 + fVar160 * fStack_628;
          fStack_2a4 = fStack_2a4 + fVar252;
          auVar339._0_4_ =
               fVar271 * (float)local_280._0_4_ +
               (float)local_2a0._0_4_ * fVar308 + (float)local_540._0_4_ * fVar188 +
               fVar296 * (float)local_520._0_4_;
          auVar339._4_4_ =
               fVar235 * (float)local_280._4_4_ +
               (float)local_2a0._4_4_ * fVar317 + (float)local_540._4_4_ * fVar326 +
               fVar298 * (float)local_520._4_4_;
          auVar339._8_4_ =
               fVar187 * fStack_278 + fStack_298 * fVar320 + fStack_538 * fVar342 +
               fVar238 * fStack_518;
          auVar339._12_4_ =
               fVar273 * fStack_274 + fStack_294 * fVar321 + fStack_534 * fVar327 +
               fVar189 * fStack_514;
          auVar339._16_4_ =
               fVar156 * fStack_270 + fStack_290 * fVar292 + fStack_530 * fVar190 +
               fVar299 * fStack_510;
          auVar339._20_4_ =
               fVar158 * fStack_26c + fStack_28c * fVar294 + fStack_52c * fVar328 +
               fVar300 * fStack_50c;
          auVar339._24_4_ =
               fVar160 * fStack_268 + fStack_288 * fVar325 + fStack_528 * fVar343 +
               fVar240 * fStack_508;
          auVar339._28_4_ = pfVar3[7] + fVar162 + fVar252;
          pfVar1 = (float *)(lVar131 + 0x22082a4 + lVar126 * 4);
          fVar317 = *pfVar1;
          fVar320 = pfVar1[1];
          fVar321 = pfVar1[2];
          fVar292 = pfVar1[3];
          fVar294 = pfVar1[4];
          fVar325 = pfVar1[5];
          fVar188 = pfVar1[6];
          pfVar2 = (float *)(lVar131 + 0x2208728 + lVar126 * 4);
          fVar326 = *pfVar2;
          fVar342 = pfVar2[1];
          fVar327 = pfVar2[2];
          fVar190 = pfVar2[3];
          fVar328 = pfVar2[4];
          fVar343 = pfVar2[5];
          fVar271 = pfVar2[6];
          pfVar3 = (float *)(lVar131 + 0x2207e20 + lVar126 * 4);
          fVar235 = *pfVar3;
          fVar187 = pfVar3[1];
          fVar273 = pfVar3[2];
          fVar156 = pfVar3[3];
          fVar158 = pfVar3[4];
          fVar160 = pfVar3[5];
          fVar296 = pfVar3[6];
          fVar308 = auVar341._28_4_;
          pfVar4 = (float *)(lVar131 + 0x220799c + lVar126 * 4);
          fVar298 = *pfVar4;
          fVar238 = pfVar4[1];
          fVar189 = pfVar4[2];
          fVar299 = pfVar4[3];
          fVar300 = pfVar4[4];
          fVar240 = pfVar4[5];
          fVar162 = pfVar4[6];
          auVar304._0_4_ =
               fVar298 * (float)local_5a0._0_4_ +
               (float)local_360._0_4_ * fVar235 +
               (float)local_6c0._0_4_ * fVar317 + (float)local_380._0_4_ * fVar326;
          auVar304._4_4_ =
               fVar238 * (float)local_5a0._4_4_ +
               (float)local_360._4_4_ * fVar187 +
               (float)local_6c0._4_4_ * fVar320 + (float)local_380._4_4_ * fVar342;
          auVar304._8_4_ =
               fVar189 * fStack_598 +
               fStack_358 * fVar273 + fStack_6b8 * fVar321 + fStack_378 * fVar327;
          auVar304._12_4_ =
               fVar299 * fStack_594 +
               fStack_354 * fVar156 + fStack_6b4 * fVar292 + fStack_374 * fVar190;
          auVar304._16_4_ =
               fVar300 * fStack_590 +
               fStack_350 * fVar158 + fStack_6b0 * fVar294 + fStack_370 * fVar328;
          auVar304._20_4_ =
               fVar240 * fStack_58c +
               fStack_34c * fVar160 + fStack_6ac * fVar325 + fStack_36c * fVar343;
          auVar304._24_4_ =
               fVar162 * fStack_588 +
               fStack_348 * fVar296 + fStack_6a8 * fVar188 + fStack_368 * fVar271;
          auVar304._28_4_ = fVar308 + fVar308 + fStack_364 + fStack_2a4;
          auVar334._0_4_ =
               fVar298 * (float)local_660._0_4_ +
               fVar235 * (float)local_640._0_4_ +
               fVar317 * (float)local_780._0_4_ + (float)local_4a0._0_4_ * fVar326;
          auVar334._4_4_ =
               fVar238 * (float)local_660._4_4_ +
               fVar187 * (float)local_640._4_4_ +
               fVar320 * (float)local_780._4_4_ + (float)local_4a0._4_4_ * fVar342;
          auVar334._8_4_ =
               fVar189 * fStack_658 +
               fVar273 * fStack_638 + fVar321 * fStack_778 + fStack_498 * fVar327;
          auVar334._12_4_ =
               fVar299 * fStack_654 +
               fVar156 * fStack_634 + fVar292 * fStack_774 + fStack_494 * fVar190;
          auVar334._16_4_ =
               fVar300 * fStack_650 +
               fVar158 * fStack_630 + fVar294 * fStack_770 + fStack_490 * fVar328;
          auVar334._20_4_ =
               fVar240 * fStack_64c +
               fVar160 * fStack_62c + fVar325 * fStack_76c + fStack_48c * fVar343;
          auVar334._24_4_ =
               fVar162 * fStack_648 +
               fVar296 * fStack_628 + fVar188 * fStack_768 + fStack_488 * fVar271;
          auVar334._28_4_ = fVar308 + fVar308 + fStack_484 + fStack_2a4;
          auVar251._8_4_ = 0x7fffffff;
          auVar251._0_8_ = 0x7fffffff7fffffff;
          auVar251._12_4_ = 0x7fffffff;
          auVar251._16_4_ = 0x7fffffff;
          auVar251._20_4_ = 0x7fffffff;
          auVar251._24_4_ = 0x7fffffff;
          auVar251._28_4_ = 0x7fffffff;
          auVar111._4_4_ = fStack_3dc;
          auVar111._0_4_ = local_3e0;
          auVar111._8_4_ = fStack_3d8;
          auVar111._12_4_ = fStack_3d4;
          auVar111._16_4_ = fStack_3d0;
          auVar111._20_4_ = fStack_3cc;
          auVar111._24_4_ = fStack_3c8;
          auVar111._28_4_ = fStack_3c4;
          auVar145 = vandps_avx(auVar111,auVar251);
          auVar112._4_4_ = fStack_2bc;
          auVar112._0_4_ = local_2c0;
          auVar112._8_4_ = fStack_2b8;
          auVar112._12_4_ = fStack_2b4;
          auVar112._16_4_ = fStack_2b0;
          auVar112._20_4_ = fStack_2ac;
          auVar112._24_4_ = fStack_2a8;
          auVar112._28_4_ = fStack_2a4;
          auVar27 = vandps_avx(auVar112,auVar251);
          auVar27 = vmaxps_avx(auVar145,auVar27);
          auVar145 = vandps_avx(auVar339,auVar251);
          auVar27 = vmaxps_avx(auVar27,auVar145);
          auVar27 = vcmpps_avx(auVar27,_local_400,1);
          auVar34 = vblendvps_avx(auVar111,auVar28,auVar27);
          auVar146._0_4_ =
               fVar298 * (float)local_520._0_4_ +
               fVar235 * (float)local_280._0_4_ +
               fVar326 * (float)local_540._0_4_ + (float)local_2a0._0_4_ * fVar317;
          auVar146._4_4_ =
               fVar238 * (float)local_520._4_4_ +
               fVar187 * (float)local_280._4_4_ +
               fVar342 * (float)local_540._4_4_ + (float)local_2a0._4_4_ * fVar320;
          auVar146._8_4_ =
               fVar189 * fStack_518 +
               fVar273 * fStack_278 + fVar327 * fStack_538 + fStack_298 * fVar321;
          auVar146._12_4_ =
               fVar299 * fStack_514 +
               fVar156 * fStack_274 + fVar190 * fStack_534 + fStack_294 * fVar292;
          auVar146._16_4_ =
               fVar300 * fStack_510 +
               fVar158 * fStack_270 + fVar328 * fStack_530 + fStack_290 * fVar294;
          auVar146._20_4_ =
               fVar240 * fStack_50c +
               fVar160 * fStack_26c + fVar343 * fStack_52c + fStack_28c * fVar325;
          auVar146._24_4_ =
               fVar162 * fStack_508 +
               fVar296 * fStack_268 + fVar271 * fStack_528 + fStack_288 * fVar188;
          auVar146._28_4_ = auVar145._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar17 = vblendvps_avx(auVar112,auVar26,auVar27);
          auVar145 = vandps_avx(auVar304,auVar251);
          auVar27 = vandps_avx(auVar334,auVar251);
          auVar205 = vmaxps_avx(auVar145,auVar27);
          auVar145 = vandps_avx(auVar146,auVar251);
          auVar145 = vmaxps_avx(auVar205,auVar145);
          local_420._0_4_ = auVar116._0_4_;
          local_420._4_4_ = auVar116._4_4_;
          fStack_418 = auVar116._8_4_;
          fStack_414 = auVar116._12_4_;
          fStack_410 = auVar116._16_4_;
          fStack_40c = auVar116._20_4_;
          fStack_408 = auVar116._24_4_;
          auVar27 = vcmpps_avx(auVar145,_local_400,1);
          auVar145 = vblendvps_avx(auVar304,auVar28,auVar27);
          auVar147._0_4_ =
               (float)local_520._0_4_ * (float)local_420._0_4_ +
               fVar132 + (float)local_2a0._0_4_ * (float)local_580._0_4_ + fVar256;
          auVar147._4_4_ =
               (float)local_520._4_4_ * (float)local_420._4_4_ +
               fVar152 + (float)local_2a0._4_4_ * (float)local_580._4_4_ + fVar264;
          auVar147._8_4_ = fStack_518 * fStack_418 + fVar244 + fStack_298 * fStack_578 + fVar209;
          auVar147._12_4_ = fStack_514 * fStack_414 + fVar243 + fStack_294 * fStack_574 + fVar269;
          auVar147._16_4_ = fStack_510 * fStack_410 + fVar274 + fStack_290 * fStack_570 + fVar270;
          auVar147._20_4_ = fStack_50c * fStack_40c + fVar159 + fStack_28c * fStack_56c + fVar272;
          auVar147._24_4_ = fStack_508 * fStack_408 + fVar161 + fStack_288 * fStack_568 + fVar245;
          auVar147._28_4_ = auVar205._28_4_ + fStack_4c4 + *(float *)pauVar9[1] + 0.0;
          auVar28 = vblendvps_avx(auVar334,auVar26,auVar27);
          fVar151 = auVar34._0_4_;
          fVar153 = auVar34._4_4_;
          fVar154 = auVar34._8_4_;
          fVar155 = auVar34._12_4_;
          fVar159 = auVar34._16_4_;
          fVar161 = auVar34._20_4_;
          fVar256 = auVar34._24_4_;
          fVar264 = auVar34._28_4_;
          fVar271 = auVar145._0_4_;
          fVar187 = auVar145._4_4_;
          fVar156 = auVar145._8_4_;
          fVar160 = auVar145._12_4_;
          fVar298 = auVar145._16_4_;
          fVar189 = auVar145._20_4_;
          fVar300 = auVar145._24_4_;
          fVar308 = auVar17._0_4_;
          fVar320 = auVar17._4_4_;
          fVar292 = auVar17._8_4_;
          fVar325 = auVar17._12_4_;
          fVar326 = auVar17._16_4_;
          fVar327 = auVar17._20_4_;
          fVar328 = auVar17._24_4_;
          auVar314._0_4_ = fVar308 * fVar308 + fVar151 * fVar151;
          auVar314._4_4_ = fVar320 * fVar320 + fVar153 * fVar153;
          auVar314._8_4_ = fVar292 * fVar292 + fVar154 * fVar154;
          auVar314._12_4_ = fVar325 * fVar325 + fVar155 * fVar155;
          auVar314._16_4_ = fVar326 * fVar326 + fVar159 * fVar159;
          auVar314._20_4_ = fVar327 * fVar327 + fVar161 * fVar161;
          auVar314._24_4_ = fVar328 * fVar328 + fVar256 * fVar256;
          auVar314._28_4_ = fStack_344 + auVar26._28_4_;
          auVar26 = vrsqrtps_avx(auVar314);
          fVar317 = auVar26._0_4_;
          fVar321 = auVar26._4_4_;
          auVar69._4_4_ = fVar321 * 1.5;
          auVar69._0_4_ = fVar317 * 1.5;
          fVar294 = auVar26._8_4_;
          auVar69._8_4_ = fVar294 * 1.5;
          fVar188 = auVar26._12_4_;
          auVar69._12_4_ = fVar188 * 1.5;
          fVar342 = auVar26._16_4_;
          auVar69._16_4_ = fVar342 * 1.5;
          fVar190 = auVar26._20_4_;
          auVar69._20_4_ = fVar190 * 1.5;
          fVar343 = auVar26._24_4_;
          auVar69._24_4_ = fVar343 * 1.5;
          auVar69._28_4_ = auVar334._28_4_;
          auVar70._4_4_ = fVar321 * fVar321 * fVar321 * auVar314._4_4_ * 0.5;
          auVar70._0_4_ = fVar317 * fVar317 * fVar317 * auVar314._0_4_ * 0.5;
          auVar70._8_4_ = fVar294 * fVar294 * fVar294 * auVar314._8_4_ * 0.5;
          auVar70._12_4_ = fVar188 * fVar188 * fVar188 * auVar314._12_4_ * 0.5;
          auVar70._16_4_ = fVar342 * fVar342 * fVar342 * auVar314._16_4_ * 0.5;
          auVar70._20_4_ = fVar190 * fVar190 * fVar190 * auVar314._20_4_ * 0.5;
          auVar70._24_4_ = fVar343 * fVar343 * fVar343 * auVar314._24_4_ * 0.5;
          auVar70._28_4_ = auVar314._28_4_;
          auVar27 = vsubps_avx(auVar69,auVar70);
          fVar162 = auVar27._0_4_;
          fVar132 = auVar27._4_4_;
          fVar152 = auVar27._8_4_;
          fVar244 = auVar27._12_4_;
          fVar243 = auVar27._16_4_;
          fVar274 = auVar27._20_4_;
          fVar307 = auVar27._24_4_;
          fVar317 = auVar28._0_4_;
          fVar321 = auVar28._4_4_;
          fVar294 = auVar28._8_4_;
          fVar188 = auVar28._12_4_;
          fVar342 = auVar28._16_4_;
          fVar190 = auVar28._20_4_;
          fVar343 = auVar28._24_4_;
          auVar287._0_4_ = fVar317 * fVar317 + fVar271 * fVar271;
          auVar287._4_4_ = fVar321 * fVar321 + fVar187 * fVar187;
          auVar287._8_4_ = fVar294 * fVar294 + fVar156 * fVar156;
          auVar287._12_4_ = fVar188 * fVar188 + fVar160 * fVar160;
          auVar287._16_4_ = fVar342 * fVar342 + fVar298 * fVar298;
          auVar287._20_4_ = fVar190 * fVar190 + fVar189 * fVar189;
          auVar287._24_4_ = fVar343 * fVar343 + fVar300 * fVar300;
          auVar287._28_4_ = auVar26._28_4_ + auVar145._28_4_;
          auVar145 = vrsqrtps_avx(auVar287);
          fVar235 = auVar145._0_4_;
          fVar273 = auVar145._4_4_;
          auVar71._4_4_ = fVar273 * 1.5;
          auVar71._0_4_ = fVar235 * 1.5;
          fVar158 = auVar145._8_4_;
          auVar71._8_4_ = fVar158 * 1.5;
          fVar296 = auVar145._12_4_;
          auVar71._12_4_ = fVar296 * 1.5;
          fVar238 = auVar145._16_4_;
          auVar71._16_4_ = fVar238 * 1.5;
          fVar299 = auVar145._20_4_;
          auVar71._20_4_ = fVar299 * 1.5;
          fVar240 = auVar145._24_4_;
          auVar71._24_4_ = fVar240 * 1.5;
          auVar71._28_4_ = auVar334._28_4_;
          auVar72._4_4_ = fVar273 * fVar273 * fVar273 * auVar287._4_4_ * 0.5;
          auVar72._0_4_ = fVar235 * fVar235 * fVar235 * auVar287._0_4_ * 0.5;
          auVar72._8_4_ = fVar158 * fVar158 * fVar158 * auVar287._8_4_ * 0.5;
          auVar72._12_4_ = fVar296 * fVar296 * fVar296 * auVar287._12_4_ * 0.5;
          auVar72._16_4_ = fVar238 * fVar238 * fVar238 * auVar287._16_4_ * 0.5;
          auVar72._20_4_ = fVar299 * fVar299 * fVar299 * auVar287._20_4_ * 0.5;
          auVar72._24_4_ = fVar240 * fVar240 * fVar240 * auVar287._24_4_ * 0.5;
          auVar72._28_4_ = auVar287._28_4_;
          auVar28 = vsubps_avx(auVar71,auVar72);
          fVar235 = auVar28._0_4_;
          fVar273 = auVar28._4_4_;
          fVar158 = auVar28._8_4_;
          fVar296 = auVar28._12_4_;
          fVar238 = auVar28._16_4_;
          fVar299 = auVar28._20_4_;
          fVar240 = auVar28._24_4_;
          fVar308 = (float)local_700._0_4_ * fVar162 * fVar308;
          fVar320 = (float)local_700._4_4_ * fVar132 * fVar320;
          auVar73._4_4_ = fVar320;
          auVar73._0_4_ = fVar308;
          fVar292 = (float)uStack_6f8 * fVar152 * fVar292;
          auVar73._8_4_ = fVar292;
          fVar325 = uStack_6f8._4_4_ * fVar244 * fVar325;
          auVar73._12_4_ = fVar325;
          fVar326 = fStack_6f0 * fVar243 * fVar326;
          auVar73._16_4_ = fVar326;
          fVar327 = fStack_6ec * fVar274 * fVar327;
          auVar73._20_4_ = fVar327;
          fVar328 = fStack_6e8 * fVar307 * fVar328;
          auVar73._24_4_ = fVar328;
          auVar73._28_4_ = auVar145._28_4_;
          local_420._4_4_ = fVar320 + (float)local_7a0._4_4_;
          local_420._0_4_ = fVar308 + (float)local_7a0._0_4_;
          fStack_418 = fVar292 + (float)auStack_798._0_4_;
          fStack_414 = fVar325 + (float)auStack_798._4_4_;
          fStack_410 = fVar326 + fStack_790;
          fStack_40c = fVar327 + fStack_78c;
          fStack_408 = fVar328 + fStack_788;
          fStack_404 = auVar145._28_4_ + fStack_784;
          fVar308 = (float)local_700._0_4_ * fVar162 * -fVar151;
          fVar320 = (float)local_700._4_4_ * fVar132 * -fVar153;
          auVar74._4_4_ = fVar320;
          auVar74._0_4_ = fVar308;
          fVar292 = (float)uStack_6f8 * fVar152 * -fVar154;
          auVar74._8_4_ = fVar292;
          fVar325 = uStack_6f8._4_4_ * fVar244 * -fVar155;
          auVar74._12_4_ = fVar325;
          fVar326 = fStack_6f0 * fVar243 * -fVar159;
          auVar74._16_4_ = fVar326;
          fVar327 = fStack_6ec * fVar274 * -fVar161;
          auVar74._20_4_ = fVar327;
          fVar328 = fStack_6e8 * fVar307 * -fVar256;
          auVar74._24_4_ = fVar328;
          auVar74._28_4_ = -fVar264;
          local_580._4_4_ = local_5c0._4_4_ + fVar320;
          local_580._0_4_ = local_5c0._0_4_ + fVar308;
          fStack_578 = local_5c0._8_4_ + fVar292;
          fStack_574 = local_5c0._12_4_ + fVar325;
          fStack_570 = local_5c0._16_4_ + fVar326;
          fStack_56c = local_5c0._20_4_ + fVar327;
          fStack_568 = local_5c0._24_4_ + fVar328;
          fStack_564 = local_5c0._28_4_ + -fVar264;
          fVar308 = fVar162 * 0.0 * (float)local_700._0_4_;
          fVar320 = fVar132 * 0.0 * (float)local_700._4_4_;
          auVar75._4_4_ = fVar320;
          auVar75._0_4_ = fVar308;
          fVar292 = fVar152 * 0.0 * (float)uStack_6f8;
          auVar75._8_4_ = fVar292;
          fVar325 = fVar244 * 0.0 * uStack_6f8._4_4_;
          auVar75._12_4_ = fVar325;
          fVar326 = fVar243 * 0.0 * fStack_6f0;
          auVar75._16_4_ = fVar326;
          fVar327 = fVar274 * 0.0 * fStack_6ec;
          auVar75._20_4_ = fVar327;
          fVar328 = fVar307 * 0.0 * fStack_6e8;
          auVar75._24_4_ = fVar328;
          auVar75._28_4_ = fVar264;
          auVar205 = vsubps_avx(_local_7a0,auVar73);
          auVar357._0_4_ = fVar308 + auVar147._0_4_;
          auVar357._4_4_ = fVar320 + auVar147._4_4_;
          auVar357._8_4_ = fVar292 + auVar147._8_4_;
          auVar357._12_4_ = fVar325 + auVar147._12_4_;
          auVar357._16_4_ = fVar326 + auVar147._16_4_;
          auVar357._20_4_ = fVar327 + auVar147._20_4_;
          auVar357._24_4_ = fVar328 + auVar147._24_4_;
          auVar357._28_4_ = fVar264 + auVar147._28_4_;
          fVar308 = auVar347._0_4_ * fVar235 * fVar317;
          fVar317 = auVar347._4_4_ * fVar273 * fVar321;
          auVar76._4_4_ = fVar317;
          auVar76._0_4_ = fVar308;
          fVar320 = auVar347._8_4_ * fVar158 * fVar294;
          auVar76._8_4_ = fVar320;
          fVar321 = auVar347._12_4_ * fVar296 * fVar188;
          auVar76._12_4_ = fVar321;
          fVar292 = auVar347._16_4_ * fVar238 * fVar342;
          auVar76._16_4_ = fVar292;
          fVar294 = auVar347._20_4_ * fVar299 * fVar190;
          auVar76._20_4_ = fVar294;
          fVar325 = auVar347._24_4_ * fVar240 * fVar343;
          auVar76._24_4_ = fVar325;
          auVar76._28_4_ = fStack_784;
          auVar29 = vsubps_avx(local_5c0,auVar74);
          auVar340._0_4_ = auVar338._0_4_ + fVar308;
          auVar340._4_4_ = auVar338._4_4_ + fVar317;
          auVar340._8_4_ = auVar338._8_4_ + fVar320;
          auVar340._12_4_ = auVar338._12_4_ + fVar321;
          auVar340._16_4_ = auVar338._16_4_ + fVar292;
          auVar340._20_4_ = auVar338._20_4_ + fVar294;
          auVar340._24_4_ = auVar338._24_4_ + fVar325;
          auVar340._28_4_ = auVar338._28_4_ + fStack_784;
          fVar308 = fVar235 * -fVar271 * auVar347._0_4_;
          fVar317 = fVar273 * -fVar187 * auVar347._4_4_;
          auVar77._4_4_ = fVar317;
          auVar77._0_4_ = fVar308;
          fVar320 = fVar158 * -fVar156 * auVar347._8_4_;
          auVar77._8_4_ = fVar320;
          fVar321 = fVar296 * -fVar160 * auVar347._12_4_;
          auVar77._12_4_ = fVar321;
          fVar292 = fVar238 * -fVar298 * auVar347._16_4_;
          auVar77._16_4_ = fVar292;
          fVar294 = fVar299 * -fVar189 * auVar347._20_4_;
          auVar77._20_4_ = fVar294;
          fVar325 = fVar240 * -fVar300 * auVar347._24_4_;
          auVar77._24_4_ = fVar325;
          auVar77._28_4_ = fStack_6e4;
          auVar30 = vsubps_avx(auVar147,auVar75);
          auVar233._0_4_ = local_560._0_4_ + fVar308;
          auVar233._4_4_ = local_560._4_4_ + fVar317;
          auVar233._8_4_ = local_560._8_4_ + fVar320;
          auVar233._12_4_ = local_560._12_4_ + fVar321;
          auVar233._16_4_ = local_560._16_4_ + fVar292;
          auVar233._20_4_ = local_560._20_4_ + fVar294;
          auVar233._24_4_ = local_560._24_4_ + fVar325;
          auVar233._28_4_ = local_560._28_4_ + fStack_6e4;
          fVar308 = fVar235 * 0.0 * auVar347._0_4_;
          fVar317 = fVar273 * 0.0 * auVar347._4_4_;
          auVar78._4_4_ = fVar317;
          auVar78._0_4_ = fVar308;
          fVar320 = fVar158 * 0.0 * auVar347._8_4_;
          auVar78._8_4_ = fVar320;
          fVar321 = fVar296 * 0.0 * auVar347._12_4_;
          auVar78._12_4_ = fVar321;
          fVar292 = fVar238 * 0.0 * auVar347._16_4_;
          auVar78._16_4_ = fVar292;
          fVar294 = fVar299 * 0.0 * auVar347._20_4_;
          auVar78._20_4_ = fVar294;
          fVar325 = fVar240 * 0.0 * auVar347._24_4_;
          auVar78._24_4_ = fVar325;
          auVar78._28_4_ = auVar147._28_4_;
          auVar145 = vsubps_avx(auVar338,auVar76);
          auVar109._4_4_ = fStack_4dc;
          auVar109._0_4_ = local_4e0;
          auVar109._8_4_ = fStack_4d8;
          auVar109._12_4_ = fStack_4d4;
          auVar109._16_4_ = fStack_4d0;
          auVar109._20_4_ = fStack_4cc;
          auVar109._24_4_ = fStack_4c8;
          auVar109._28_4_ = fStack_4c4;
          auVar305._0_4_ = local_4e0 + fVar308;
          auVar305._4_4_ = fStack_4dc + fVar317;
          auVar305._8_4_ = fStack_4d8 + fVar320;
          auVar305._12_4_ = fStack_4d4 + fVar321;
          auVar305._16_4_ = fStack_4d0 + fVar292;
          auVar305._20_4_ = fStack_4cc + fVar294;
          auVar305._24_4_ = fStack_4c8 + fVar325;
          auVar305._28_4_ = fStack_4c4 + auVar147._28_4_;
          auVar26 = vsubps_avx(local_560,auVar77);
          auVar27 = vsubps_avx(auVar109,auVar78);
          auVar34 = vsubps_avx(auVar233,auVar29);
          auVar17 = vsubps_avx(auVar305,auVar30);
          auVar79._4_4_ = auVar30._4_4_ * auVar34._4_4_;
          auVar79._0_4_ = auVar30._0_4_ * auVar34._0_4_;
          auVar79._8_4_ = auVar30._8_4_ * auVar34._8_4_;
          auVar79._12_4_ = auVar30._12_4_ * auVar34._12_4_;
          auVar79._16_4_ = auVar30._16_4_ * auVar34._16_4_;
          auVar79._20_4_ = auVar30._20_4_ * auVar34._20_4_;
          auVar79._24_4_ = auVar30._24_4_ * auVar34._24_4_;
          auVar79._28_4_ = auVar334._28_4_;
          auVar80._4_4_ = auVar29._4_4_ * auVar17._4_4_;
          auVar80._0_4_ = auVar29._0_4_ * auVar17._0_4_;
          auVar80._8_4_ = auVar29._8_4_ * auVar17._8_4_;
          auVar80._12_4_ = auVar29._12_4_ * auVar17._12_4_;
          auVar80._16_4_ = auVar29._16_4_ * auVar17._16_4_;
          auVar80._20_4_ = auVar29._20_4_ * auVar17._20_4_;
          auVar80._24_4_ = auVar29._24_4_ * auVar17._24_4_;
          auVar80._28_4_ = local_560._28_4_;
          auVar249 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = auVar205._4_4_ * auVar17._4_4_;
          auVar81._0_4_ = auVar205._0_4_ * auVar17._0_4_;
          auVar81._8_4_ = auVar205._8_4_ * auVar17._8_4_;
          auVar81._12_4_ = auVar205._12_4_ * auVar17._12_4_;
          auVar81._16_4_ = auVar205._16_4_ * auVar17._16_4_;
          auVar81._20_4_ = auVar205._20_4_ * auVar17._20_4_;
          auVar81._24_4_ = auVar205._24_4_ * auVar17._24_4_;
          auVar81._28_4_ = auVar17._28_4_;
          auVar17 = vsubps_avx(auVar340,auVar205);
          auVar82._4_4_ = auVar30._4_4_ * auVar17._4_4_;
          auVar82._0_4_ = auVar30._0_4_ * auVar17._0_4_;
          auVar82._8_4_ = auVar30._8_4_ * auVar17._8_4_;
          auVar82._12_4_ = auVar30._12_4_ * auVar17._12_4_;
          auVar82._16_4_ = auVar30._16_4_ * auVar17._16_4_;
          auVar82._20_4_ = auVar30._20_4_ * auVar17._20_4_;
          auVar82._24_4_ = auVar30._24_4_ * auVar17._24_4_;
          auVar82._28_4_ = auVar28._28_4_;
          auVar278 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = auVar29._4_4_ * auVar17._4_4_;
          auVar83._0_4_ = auVar29._0_4_ * auVar17._0_4_;
          auVar83._8_4_ = auVar29._8_4_ * auVar17._8_4_;
          auVar83._12_4_ = auVar29._12_4_ * auVar17._12_4_;
          auVar83._16_4_ = auVar29._16_4_ * auVar17._16_4_;
          auVar83._20_4_ = auVar29._20_4_ * auVar17._20_4_;
          auVar83._24_4_ = auVar29._24_4_ * auVar17._24_4_;
          auVar83._28_4_ = auVar28._28_4_;
          auVar84._4_4_ = auVar205._4_4_ * auVar34._4_4_;
          auVar84._0_4_ = auVar205._0_4_ * auVar34._0_4_;
          auVar84._8_4_ = auVar205._8_4_ * auVar34._8_4_;
          auVar84._12_4_ = auVar205._12_4_ * auVar34._12_4_;
          auVar84._16_4_ = auVar205._16_4_ * auVar34._16_4_;
          auVar84._20_4_ = auVar205._20_4_ * auVar34._20_4_;
          auVar84._24_4_ = auVar205._24_4_ * auVar34._24_4_;
          auVar84._28_4_ = auVar34._28_4_;
          auVar28 = vsubps_avx(auVar84,auVar83);
          auVar174._0_4_ = auVar249._0_4_ * 0.0 + auVar28._0_4_ + auVar278._0_4_ * 0.0;
          auVar174._4_4_ = auVar249._4_4_ * 0.0 + auVar28._4_4_ + auVar278._4_4_ * 0.0;
          auVar174._8_4_ = auVar249._8_4_ * 0.0 + auVar28._8_4_ + auVar278._8_4_ * 0.0;
          auVar174._12_4_ = auVar249._12_4_ * 0.0 + auVar28._12_4_ + auVar278._12_4_ * 0.0;
          auVar174._16_4_ = auVar249._16_4_ * 0.0 + auVar28._16_4_ + auVar278._16_4_ * 0.0;
          auVar174._20_4_ = auVar249._20_4_ * 0.0 + auVar28._20_4_ + auVar278._20_4_ * 0.0;
          auVar174._24_4_ = auVar249._24_4_ * 0.0 + auVar28._24_4_ + auVar278._24_4_ * 0.0;
          auVar174._28_4_ = auVar249._28_4_ + auVar28._28_4_ + auVar278._28_4_;
          auVar331 = vcmpps_avx(auVar174,ZEXT832(0) << 0x20,2);
          auVar145 = vblendvps_avx(auVar145,_local_420,auVar331);
          auVar28 = vblendvps_avx(auVar26,_local_580,auVar331);
          auVar26 = vblendvps_avx(auVar27,auVar357,auVar331);
          auVar27 = vblendvps_avx(auVar205,auVar340,auVar331);
          auVar34 = vblendvps_avx(auVar29,auVar233,auVar331);
          auVar17 = vblendvps_avx(auVar30,auVar305,auVar331);
          auVar205 = vblendvps_avx(auVar340,auVar205,auVar331);
          auVar249 = vblendvps_avx(auVar233,auVar29,auVar331);
          auVar278 = vblendvps_avx(auVar305,auVar30,auVar331);
          _local_7a0 = vandps_avx(auVar208,_local_3c0);
          auVar205 = vsubps_avx(auVar205,auVar145);
          auVar31 = vsubps_avx(auVar249,auVar28);
          auVar278 = vsubps_avx(auVar278,auVar26);
          auVar32 = vsubps_avx(auVar28,auVar34);
          fVar308 = auVar31._0_4_;
          fVar245 = auVar26._0_4_;
          fVar188 = auVar31._4_4_;
          fVar252 = auVar26._4_4_;
          auVar85._4_4_ = fVar252 * fVar188;
          auVar85._0_4_ = fVar245 * fVar308;
          fVar271 = auVar31._8_4_;
          fVar282 = auVar26._8_4_;
          auVar85._8_4_ = fVar282 * fVar271;
          fVar296 = auVar31._12_4_;
          fVar234 = auVar26._12_4_;
          auVar85._12_4_ = fVar234 * fVar296;
          fVar162 = auVar31._16_4_;
          fVar291 = auVar26._16_4_;
          auVar85._16_4_ = fVar291 * fVar162;
          fVar151 = auVar31._20_4_;
          fVar236 = auVar26._20_4_;
          auVar85._20_4_ = fVar236 * fVar151;
          fVar264 = auVar31._24_4_;
          fVar237 = auVar26._24_4_;
          auVar85._24_4_ = fVar237 * fVar264;
          auVar85._28_4_ = auVar249._28_4_;
          fVar317 = auVar28._0_4_;
          fVar239 = auVar278._0_4_;
          fVar326 = auVar28._4_4_;
          auVar330._0_4_ = auVar278._4_4_;
          auVar86._4_4_ = auVar330._0_4_ * fVar326;
          auVar86._0_4_ = fVar239 * fVar317;
          fVar235 = auVar28._8_4_;
          fVar241 = auVar278._8_4_;
          auVar86._8_4_ = fVar241 * fVar235;
          fVar298 = auVar28._12_4_;
          fVar293 = auVar278._12_4_;
          auVar86._12_4_ = fVar293 * fVar298;
          fVar132 = auVar28._16_4_;
          fVar295 = auVar278._16_4_;
          auVar86._16_4_ = fVar295 * fVar132;
          fVar153 = auVar28._20_4_;
          fVar297 = auVar278._20_4_;
          auVar86._20_4_ = fVar297 * fVar153;
          fVar191 = auVar28._24_4_;
          fVar354 = auVar278._24_4_;
          uVar130 = auVar29._28_4_;
          auVar86._24_4_ = fVar354 * fVar191;
          auVar86._28_4_ = uVar130;
          auVar249 = vsubps_avx(auVar86,auVar85);
          fVar320 = auVar145._0_4_;
          fVar342 = auVar145._4_4_;
          auVar87._4_4_ = auVar330._0_4_ * fVar342;
          auVar87._0_4_ = fVar239 * fVar320;
          fVar187 = auVar145._8_4_;
          auVar87._8_4_ = fVar241 * fVar187;
          fVar238 = auVar145._12_4_;
          auVar87._12_4_ = fVar293 * fVar238;
          fVar152 = auVar145._16_4_;
          auVar87._16_4_ = fVar295 * fVar152;
          fVar154 = auVar145._20_4_;
          auVar87._20_4_ = fVar297 * fVar154;
          fVar157 = auVar145._24_4_;
          auVar87._24_4_ = fVar354 * fVar157;
          auVar87._28_4_ = uVar130;
          fVar321 = auVar205._0_4_;
          fVar327 = auVar205._4_4_;
          auVar88._4_4_ = fVar252 * fVar327;
          auVar88._0_4_ = fVar245 * fVar321;
          fVar273 = auVar205._8_4_;
          auVar88._8_4_ = fVar282 * fVar273;
          fVar189 = auVar205._12_4_;
          auVar88._12_4_ = fVar234 * fVar189;
          fVar244 = auVar205._16_4_;
          auVar88._16_4_ = fVar291 * fVar244;
          fVar155 = auVar205._20_4_;
          auVar88._20_4_ = fVar236 * fVar155;
          fVar209 = auVar205._24_4_;
          auVar88._24_4_ = fVar237 * fVar209;
          auVar88._28_4_ = auVar340._28_4_;
          auVar29 = vsubps_avx(auVar88,auVar87);
          auVar89._4_4_ = fVar326 * fVar327;
          auVar89._0_4_ = fVar317 * fVar321;
          auVar89._8_4_ = fVar235 * fVar273;
          auVar89._12_4_ = fVar298 * fVar189;
          auVar89._16_4_ = fVar132 * fVar244;
          auVar89._20_4_ = fVar153 * fVar155;
          auVar89._24_4_ = fVar191 * fVar209;
          auVar89._28_4_ = uVar130;
          auVar90._4_4_ = fVar342 * fVar188;
          auVar90._0_4_ = fVar320 * fVar308;
          auVar90._8_4_ = fVar187 * fVar271;
          auVar90._12_4_ = fVar238 * fVar296;
          auVar90._16_4_ = fVar152 * fVar162;
          auVar90._20_4_ = fVar154 * fVar151;
          auVar90._24_4_ = fVar157 * fVar264;
          auVar90._28_4_ = auVar30._28_4_;
          auVar30 = vsubps_avx(auVar90,auVar89);
          auVar33 = vsubps_avx(auVar26,auVar17);
          fVar294 = auVar30._28_4_ + auVar29._28_4_;
          auVar315._0_4_ = auVar30._0_4_ + auVar29._0_4_ * 0.0 + auVar249._0_4_ * 0.0;
          auVar315._4_4_ = auVar30._4_4_ + auVar29._4_4_ * 0.0 + auVar249._4_4_ * 0.0;
          auVar315._8_4_ = auVar30._8_4_ + auVar29._8_4_ * 0.0 + auVar249._8_4_ * 0.0;
          auVar315._12_4_ = auVar30._12_4_ + auVar29._12_4_ * 0.0 + auVar249._12_4_ * 0.0;
          auVar315._16_4_ = auVar30._16_4_ + auVar29._16_4_ * 0.0 + auVar249._16_4_ * 0.0;
          auVar315._20_4_ = auVar30._20_4_ + auVar29._20_4_ * 0.0 + auVar249._20_4_ * 0.0;
          auVar315._24_4_ = auVar30._24_4_ + auVar29._24_4_ * 0.0 + auVar249._24_4_ * 0.0;
          auVar315._28_4_ = fVar294 + auVar249._28_4_;
          fVar292 = auVar32._0_4_;
          fVar190 = auVar32._4_4_;
          auVar91._4_4_ = auVar17._4_4_ * fVar190;
          auVar91._0_4_ = auVar17._0_4_ * fVar292;
          fVar156 = auVar32._8_4_;
          auVar91._8_4_ = auVar17._8_4_ * fVar156;
          fVar299 = auVar32._12_4_;
          auVar91._12_4_ = auVar17._12_4_ * fVar299;
          fVar243 = auVar32._16_4_;
          auVar91._16_4_ = auVar17._16_4_ * fVar243;
          fVar159 = auVar32._20_4_;
          auVar91._20_4_ = auVar17._20_4_ * fVar159;
          fVar269 = auVar32._24_4_;
          auVar91._24_4_ = auVar17._24_4_ * fVar269;
          auVar91._28_4_ = fVar294;
          fVar294 = auVar33._0_4_;
          fVar328 = auVar33._4_4_;
          auVar92._4_4_ = auVar34._4_4_ * fVar328;
          auVar92._0_4_ = auVar34._0_4_ * fVar294;
          fVar158 = auVar33._8_4_;
          auVar92._8_4_ = auVar34._8_4_ * fVar158;
          fVar300 = auVar33._12_4_;
          auVar92._12_4_ = auVar34._12_4_ * fVar300;
          fVar274 = auVar33._16_4_;
          auVar92._16_4_ = auVar34._16_4_ * fVar274;
          fVar161 = auVar33._20_4_;
          auVar92._20_4_ = auVar34._20_4_ * fVar161;
          fVar270 = auVar33._24_4_;
          auVar92._24_4_ = auVar34._24_4_ * fVar270;
          auVar92._28_4_ = auVar30._28_4_;
          auVar26 = vsubps_avx(auVar92,auVar91);
          auVar145 = vsubps_avx(auVar145,auVar27);
          fVar325 = auVar145._0_4_;
          fVar343 = auVar145._4_4_;
          auVar93._4_4_ = auVar17._4_4_ * fVar343;
          auVar93._0_4_ = auVar17._0_4_ * fVar325;
          fVar160 = auVar145._8_4_;
          auVar93._8_4_ = auVar17._8_4_ * fVar160;
          fVar240 = auVar145._12_4_;
          auVar93._12_4_ = auVar17._12_4_ * fVar240;
          fVar307 = auVar145._16_4_;
          auVar93._16_4_ = auVar17._16_4_ * fVar307;
          fVar256 = auVar145._20_4_;
          auVar93._20_4_ = auVar17._20_4_ * fVar256;
          fVar272 = auVar145._24_4_;
          auVar93._24_4_ = auVar17._24_4_ * fVar272;
          auVar93._28_4_ = auVar17._28_4_;
          auVar94._4_4_ = fVar328 * auVar27._4_4_;
          auVar94._0_4_ = fVar294 * auVar27._0_4_;
          auVar94._8_4_ = fVar158 * auVar27._8_4_;
          auVar94._12_4_ = fVar300 * auVar27._12_4_;
          auVar94._16_4_ = fVar274 * auVar27._16_4_;
          auVar94._20_4_ = fVar161 * auVar27._20_4_;
          auVar94._24_4_ = fVar270 * auVar27._24_4_;
          auVar94._28_4_ = auVar249._28_4_;
          auVar145 = vsubps_avx(auVar93,auVar94);
          auVar95._4_4_ = auVar34._4_4_ * fVar343;
          auVar95._0_4_ = auVar34._0_4_ * fVar325;
          auVar95._8_4_ = auVar34._8_4_ * fVar160;
          auVar95._12_4_ = auVar34._12_4_ * fVar240;
          auVar95._16_4_ = auVar34._16_4_ * fVar307;
          auVar95._20_4_ = auVar34._20_4_ * fVar256;
          auVar95._24_4_ = auVar34._24_4_ * fVar272;
          auVar95._28_4_ = auVar34._28_4_;
          auVar96._4_4_ = fVar190 * auVar27._4_4_;
          auVar96._0_4_ = fVar292 * auVar27._0_4_;
          auVar96._8_4_ = fVar156 * auVar27._8_4_;
          auVar96._12_4_ = fVar299 * auVar27._12_4_;
          auVar96._16_4_ = fVar243 * auVar27._16_4_;
          auVar96._20_4_ = fVar159 * auVar27._20_4_;
          auVar96._24_4_ = fVar269 * auVar27._24_4_;
          auVar96._28_4_ = auVar27._28_4_;
          auVar27 = vsubps_avx(auVar96,auVar95);
          auVar148._0_4_ = auVar26._0_4_ * 0.0 + auVar27._0_4_ + auVar145._0_4_ * 0.0;
          auVar148._4_4_ = auVar26._4_4_ * 0.0 + auVar27._4_4_ + auVar145._4_4_ * 0.0;
          auVar148._8_4_ = auVar26._8_4_ * 0.0 + auVar27._8_4_ + auVar145._8_4_ * 0.0;
          auVar148._12_4_ = auVar26._12_4_ * 0.0 + auVar27._12_4_ + auVar145._12_4_ * 0.0;
          auVar148._16_4_ = auVar26._16_4_ * 0.0 + auVar27._16_4_ + auVar145._16_4_ * 0.0;
          auVar148._20_4_ = auVar26._20_4_ * 0.0 + auVar27._20_4_ + auVar145._20_4_ * 0.0;
          auVar148._24_4_ = auVar26._24_4_ * 0.0 + auVar27._24_4_ + auVar145._24_4_ * 0.0;
          auVar148._28_4_ = auVar145._28_4_ + auVar27._28_4_ + auVar145._28_4_;
          auVar145 = vmaxps_avx(auVar315,auVar148);
          auVar26 = vcmpps_avx(auVar145,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar27 = _local_7a0 & auVar26;
          auVar145 = auVar315;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
LAB_00935c8b:
            auVar319 = auVar145._4_12_;
            auVar224._8_8_ = local_480[1]._8_8_;
            auVar224._0_8_ = local_480[1]._0_8_;
            auVar224._16_8_ = local_480[1]._16_8_;
            auVar224._24_8_ = local_480[1]._24_8_;
          }
          else {
            auVar145 = vandps_avx(auVar26,_local_7a0);
            auVar319 = auVar145._4_12_;
            auVar97._4_4_ = fVar328 * fVar188;
            auVar97._0_4_ = fVar294 * fVar308;
            auVar97._8_4_ = fVar158 * fVar271;
            auVar97._12_4_ = fVar300 * fVar296;
            auVar97._16_4_ = fVar274 * fVar162;
            auVar97._20_4_ = fVar161 * fVar151;
            auVar97._24_4_ = fVar270 * fVar264;
            auVar97._28_4_ = local_7a0._28_4_;
            auVar98._4_4_ = fVar190 * auVar330._0_4_;
            auVar98._0_4_ = fVar292 * fVar239;
            auVar98._8_4_ = fVar156 * fVar241;
            auVar98._12_4_ = fVar299 * fVar293;
            auVar98._16_4_ = fVar243 * fVar295;
            auVar98._20_4_ = fVar159 * fVar297;
            auVar98._24_4_ = fVar269 * fVar354;
            auVar98._28_4_ = auVar26._28_4_;
            auVar27 = vsubps_avx(auVar98,auVar97);
            auVar99._4_4_ = fVar343 * auVar330._0_4_;
            auVar99._0_4_ = fVar325 * fVar239;
            auVar99._8_4_ = fVar160 * fVar241;
            auVar99._12_4_ = fVar240 * fVar293;
            auVar99._16_4_ = fVar307 * fVar295;
            auVar99._20_4_ = fVar256 * fVar297;
            auVar99._24_4_ = fVar272 * fVar354;
            auVar99._28_4_ = auVar278._28_4_;
            auVar100._4_4_ = fVar328 * fVar327;
            auVar100._0_4_ = fVar294 * fVar321;
            auVar100._8_4_ = fVar158 * fVar273;
            auVar100._12_4_ = fVar300 * fVar189;
            auVar100._16_4_ = fVar274 * fVar244;
            auVar100._20_4_ = fVar161 * fVar155;
            auVar100._24_4_ = fVar270 * fVar209;
            auVar100._28_4_ = auVar33._28_4_;
            auVar34 = vsubps_avx(auVar100,auVar99);
            auVar101._4_4_ = fVar190 * fVar327;
            auVar101._0_4_ = fVar292 * fVar321;
            auVar101._8_4_ = fVar156 * fVar273;
            auVar101._12_4_ = fVar299 * fVar189;
            auVar101._16_4_ = fVar243 * fVar244;
            auVar101._20_4_ = fVar159 * fVar155;
            auVar101._24_4_ = fVar269 * fVar209;
            auVar101._28_4_ = auVar205._28_4_;
            auVar102._4_4_ = fVar343 * fVar188;
            auVar102._0_4_ = fVar325 * fVar308;
            auVar102._8_4_ = fVar160 * fVar271;
            auVar102._12_4_ = fVar240 * fVar296;
            auVar102._16_4_ = fVar307 * fVar162;
            auVar102._20_4_ = fVar256 * fVar151;
            auVar102._24_4_ = fVar272 * fVar264;
            auVar102._28_4_ = auVar31._28_4_;
            auVar17 = vsubps_avx(auVar102,auVar101);
            auVar288._0_4_ = auVar27._0_4_ * 0.0 + auVar17._0_4_ + auVar34._0_4_ * 0.0;
            auVar288._4_4_ = auVar27._4_4_ * 0.0 + auVar17._4_4_ + auVar34._4_4_ * 0.0;
            auVar288._8_4_ = auVar27._8_4_ * 0.0 + auVar17._8_4_ + auVar34._8_4_ * 0.0;
            auVar288._12_4_ = auVar27._12_4_ * 0.0 + auVar17._12_4_ + auVar34._12_4_ * 0.0;
            auVar288._16_4_ = auVar27._16_4_ * 0.0 + auVar17._16_4_ + auVar34._16_4_ * 0.0;
            auVar288._20_4_ = auVar27._20_4_ * 0.0 + auVar17._20_4_ + auVar34._20_4_ * 0.0;
            auVar288._24_4_ = auVar27._24_4_ * 0.0 + auVar17._24_4_ + auVar34._24_4_ * 0.0;
            auVar288._28_4_ = auVar32._28_4_ + auVar17._28_4_ + auVar205._28_4_;
            auVar26 = vrcpps_avx(auVar288);
            fVar321 = auVar26._0_4_;
            fVar292 = auVar26._4_4_;
            auVar103._4_4_ = auVar288._4_4_ * fVar292;
            auVar103._0_4_ = auVar288._0_4_ * fVar321;
            fVar294 = auVar26._8_4_;
            auVar103._8_4_ = auVar288._8_4_ * fVar294;
            fVar325 = auVar26._12_4_;
            auVar103._12_4_ = auVar288._12_4_ * fVar325;
            fVar188 = auVar26._16_4_;
            auVar103._16_4_ = auVar288._16_4_ * fVar188;
            fVar327 = auVar26._20_4_;
            auVar103._20_4_ = auVar288._20_4_ * fVar327;
            fVar190 = auVar26._24_4_;
            auVar103._24_4_ = auVar288._24_4_ * fVar190;
            auVar103._28_4_ = auVar33._28_4_;
            auVar335._8_4_ = 0x3f800000;
            auVar335._0_8_ = 0x3f8000003f800000;
            auVar335._12_4_ = 0x3f800000;
            auVar335._16_4_ = 0x3f800000;
            auVar335._20_4_ = 0x3f800000;
            auVar335._24_4_ = 0x3f800000;
            auVar335._28_4_ = 0x3f800000;
            auVar26 = vsubps_avx(auVar335,auVar103);
            fVar321 = auVar26._0_4_ * fVar321 + fVar321;
            fVar292 = auVar26._4_4_ * fVar292 + fVar292;
            fVar294 = auVar26._8_4_ * fVar294 + fVar294;
            fVar325 = auVar26._12_4_ * fVar325 + fVar325;
            fVar188 = auVar26._16_4_ * fVar188 + fVar188;
            fVar327 = auVar26._20_4_ * fVar327 + fVar327;
            fVar190 = auVar26._24_4_ * fVar190 + fVar190;
            auVar104._4_4_ =
                 (fVar342 * auVar27._4_4_ + auVar34._4_4_ * fVar326 + fVar252 * auVar17._4_4_) *
                 fVar292;
            auVar104._0_4_ =
                 (fVar320 * auVar27._0_4_ + auVar34._0_4_ * fVar317 + fVar245 * auVar17._0_4_) *
                 fVar321;
            auVar104._8_4_ =
                 (fVar187 * auVar27._8_4_ + auVar34._8_4_ * fVar235 + fVar282 * auVar17._8_4_) *
                 fVar294;
            auVar104._12_4_ =
                 (fVar238 * auVar27._12_4_ + auVar34._12_4_ * fVar298 + fVar234 * auVar17._12_4_) *
                 fVar325;
            auVar104._16_4_ =
                 (fVar152 * auVar27._16_4_ + auVar34._16_4_ * fVar132 + fVar291 * auVar17._16_4_) *
                 fVar188;
            auVar104._20_4_ =
                 (fVar154 * auVar27._20_4_ + auVar34._20_4_ * fVar153 + fVar236 * auVar17._20_4_) *
                 fVar327;
            auVar104._24_4_ =
                 (fVar157 * auVar27._24_4_ + auVar34._24_4_ * fVar191 + fVar237 * auVar17._24_4_) *
                 fVar190;
            auVar104._28_4_ = auVar28._28_4_ + auVar17._28_4_;
            fVar308 = (ray->super_RayK<1>).tfar;
            auVar223._4_4_ = fVar308;
            auVar223._0_4_ = fVar308;
            auVar223._8_4_ = fVar308;
            auVar223._12_4_ = fVar308;
            auVar223._16_4_ = fVar308;
            auVar223._20_4_ = fVar308;
            auVar223._24_4_ = fVar308;
            auVar223._28_4_ = fVar308;
            auVar26 = vcmpps_avx(local_2e0,auVar104,2);
            auVar28 = vcmpps_avx(auVar104,auVar223,2);
            auVar28 = vandps_avx(auVar26,auVar28);
            auVar27 = auVar145 & auVar28;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) goto LAB_00935c8b;
            auVar145 = vandps_avx(auVar145,auVar28);
            auVar28 = vcmpps_avx(auVar288,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar27 = auVar145 & auVar28;
            auVar224._8_8_ = local_480[1]._8_8_;
            auVar224._0_8_ = local_480[1]._0_8_;
            auVar224._16_8_ = local_480[1]._16_8_;
            auVar224._24_8_ = local_480[1]._24_8_;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar224 = vandps_avx(auVar28,auVar145);
              auVar105._4_4_ = auVar315._4_4_ * fVar292;
              auVar105._0_4_ = auVar315._0_4_ * fVar321;
              auVar105._8_4_ = auVar315._8_4_ * fVar294;
              auVar105._12_4_ = auVar315._12_4_ * fVar325;
              auVar105._16_4_ = auVar315._16_4_ * fVar188;
              auVar105._20_4_ = auVar315._20_4_ * fVar327;
              auVar105._24_4_ = auVar315._24_4_ * fVar190;
              auVar105._28_4_ = auVar26._28_4_;
              auVar106._4_4_ = auVar148._4_4_ * fVar292;
              auVar106._0_4_ = auVar148._0_4_ * fVar321;
              auVar106._8_4_ = auVar148._8_4_ * fVar294;
              auVar106._12_4_ = auVar148._12_4_ * fVar325;
              auVar106._16_4_ = auVar148._16_4_ * fVar188;
              auVar106._20_4_ = auVar148._20_4_ * fVar327;
              auVar106._24_4_ = auVar148._24_4_ * fVar190;
              auVar106._28_4_ = auVar148._28_4_;
              auVar261._8_4_ = 0x3f800000;
              auVar261._0_8_ = 0x3f8000003f800000;
              auVar261._12_4_ = 0x3f800000;
              auVar261._16_4_ = 0x3f800000;
              auVar261._20_4_ = 0x3f800000;
              auVar261._24_4_ = 0x3f800000;
              auVar261._28_4_ = 0x3f800000;
              auVar145 = vsubps_avx(auVar261,auVar105);
              _local_440 = vblendvps_avx(auVar145,auVar105,auVar331);
              auVar145 = vsubps_avx(auVar261,auVar106);
              _local_340 = vblendvps_avx(auVar145,auVar106,auVar331);
              local_320 = auVar104;
            }
          }
          auVar306 = ZEXT3264(local_680);
          auVar289 = ZEXT3264(local_6e0);
          if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar224 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar224 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar224 >> 0x7f,0) == '\0') &&
                (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar224 >> 0xbf,0) == '\0') &&
              (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar224[0x1f]) {
LAB_00935988:
            auVar341 = ZEXT3264(_local_660);
            goto LAB_00935991;
          }
          auVar145 = vsubps_avx(auVar347,_local_700);
          local_700._0_4_ = (float)local_700._0_4_ + auVar145._0_4_ * (float)local_440._0_4_;
          local_700._4_4_ = (float)local_700._4_4_ + auVar145._4_4_ * (float)local_440._4_4_;
          uStack_6f8._0_4_ = (float)uStack_6f8 + auVar145._8_4_ * fStack_438;
          uStack_6f8._4_4_ = uStack_6f8._4_4_ + auVar145._12_4_ * fStack_434;
          fStack_6f0 = fStack_6f0 + auVar145._16_4_ * fStack_430;
          fStack_6ec = fStack_6ec + auVar145._20_4_ * fStack_42c;
          fStack_6e8 = fStack_6e8 + auVar145._24_4_ * fStack_428;
          fStack_6e4 = fStack_6e4 + auVar145._28_4_;
          fVar308 = local_738->depth_scale;
          auVar107._4_4_ = ((float)local_700._4_4_ + (float)local_700._4_4_) * fVar308;
          auVar107._0_4_ = ((float)local_700._0_4_ + (float)local_700._0_4_) * fVar308;
          auVar107._8_4_ = ((float)uStack_6f8 + (float)uStack_6f8) * fVar308;
          auVar107._12_4_ = (uStack_6f8._4_4_ + uStack_6f8._4_4_) * fVar308;
          auVar107._16_4_ = (fStack_6f0 + fStack_6f0) * fVar308;
          auVar107._20_4_ = (fStack_6ec + fStack_6ec) * fVar308;
          auVar107._24_4_ = (fStack_6e8 + fStack_6e8) * fVar308;
          auVar107._28_4_ = fStack_6e4 + fStack_6e4;
          auVar145 = vcmpps_avx(local_320,auVar107,6);
          auVar28 = auVar224 & auVar145;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) goto LAB_00935988;
          local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
          local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
          uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
          uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
          uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
          uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
          uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
          uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
          local_240 = _local_440;
          auVar118 = _local_340;
          auVar28 = _local_340;
          local_220 = (float)local_340._0_4_;
          fStack_21c = (float)local_340._4_4_;
          fStack_218 = (float)uStack_338;
          fStack_214 = uStack_338._4_4_;
          fStack_210 = (float)uStack_330;
          fStack_20c = uStack_330._4_4_;
          fStack_208 = (float)uStack_328;
          fStack_204 = uStack_328._4_4_;
          local_200 = local_320;
          local_1dc = uVar124;
          local_1d0 = local_750;
          uStack_1c8 = uStack_748;
          local_1c0 = local_760;
          uStack_1b8 = uStack_758;
          local_1b0 = local_690;
          uStack_1a8 = uStack_688;
          local_1a0 = local_6a0;
          uStack_198 = uStack_698;
          auVar129 = (undefined1  [8])(context->scene->geometries).items[local_7b8].ptr;
          if ((((Geometry *)auVar129)->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar145 = vandps_avx(auVar145,auVar224);
            local_480[0] = auVar145;
            auVar200._0_4_ = (float)(int)local_1e0;
            auVar200._4_12_ = auVar319;
            auVar168 = vshufps_avx(auVar200,auVar200,0);
            local_160[0] = (auVar168._0_4_ + (float)local_440._0_4_ + 0.0) * (float)local_c0._0_4_;
            local_160[1] = (auVar168._4_4_ + (float)local_440._4_4_ + 1.0) * (float)local_c0._4_4_;
            local_160[2] = (auVar168._8_4_ + fStack_438 + 2.0) * fStack_b8;
            local_160[3] = (auVar168._12_4_ + fStack_434 + 3.0) * fStack_b4;
            fStack_150 = (auVar168._0_4_ + fStack_430 + 4.0) * fStack_b0;
            fStack_14c = (auVar168._4_4_ + fStack_42c + 5.0) * fStack_ac;
            fStack_148 = (auVar168._8_4_ + fStack_428 + 6.0) * fStack_a8;
            fStack_144 = auVar168._12_4_ + fStack_424 + 7.0;
            uStack_330 = auVar118._16_8_;
            uStack_328 = auVar28._24_8_;
            local_140 = local_340;
            uStack_138 = uStack_338;
            uStack_130 = uStack_330;
            uStack_128 = uStack_328;
            local_120 = local_320;
            auVar175._8_4_ = 0x7f800000;
            auVar175._0_8_ = 0x7f8000007f800000;
            auVar175._12_4_ = 0x7f800000;
            auVar175._16_4_ = 0x7f800000;
            auVar175._20_4_ = 0x7f800000;
            auVar175._24_4_ = 0x7f800000;
            auVar175._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar175,local_320,auVar145);
            auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
            auVar27 = vminps_avx(auVar26,auVar27);
            auVar34 = vshufpd_avx(auVar27,auVar27,5);
            auVar27 = vminps_avx(auVar27,auVar34);
            auVar34 = vperm2f128_avx(auVar27,auVar27,1);
            auVar27 = vminps_avx(auVar27,auVar34);
            auVar26 = vcmpps_avx(auVar26,auVar27,0);
            auVar27 = auVar145 & auVar26;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar145 = vandps_avx(auVar26,auVar145);
            }
            uVar120 = vmovmskps_avx(auVar145);
            uVar122 = 0;
            if (uVar120 != 0) {
              for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
              }
            }
            uVar123 = (ulong)uVar122;
            _local_340 = auVar28;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (((Geometry *)auVar129)->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_5c0._0_8_ = lVar125;
              _local_700 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_7a0 = auVar129;
              do {
                local_604 = local_160[uVar123];
                local_600 = *(undefined4 *)((long)&local_140 + uVar123 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_120 + uVar123 * 4);
                fVar317 = 1.0 - local_604;
                fVar308 = local_604 * 3.0;
                auVar168 = ZEXT416((uint)((fVar317 * -2.0 * local_604 + local_604 * local_604) * 0.5
                                         ));
                auVar168 = vshufps_avx(auVar168,auVar168,0);
                auVar201 = ZEXT416((uint)(((fVar317 + fVar317) * (fVar308 + 2.0) +
                                          fVar317 * fVar317 * -3.0) * 0.5));
                auVar201 = vshufps_avx(auVar201,auVar201,0);
                auVar202 = ZEXT416((uint)(((local_604 + local_604) * (fVar308 + -5.0) +
                                          local_604 * fVar308) * 0.5));
                auVar202 = vshufps_avx(auVar202,auVar202,0);
                auVar221 = ZEXT416((uint)((local_604 * (fVar317 + fVar317) - fVar317 * fVar317) *
                                         0.5));
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                auVar203._0_4_ =
                     auVar221._0_4_ * (float)local_750._0_4_ +
                     auVar202._0_4_ * (float)local_760._0_4_ +
                     auVar168._0_4_ * (float)local_6a0._0_4_ +
                     auVar201._0_4_ * (float)local_690._0_4_;
                auVar203._4_4_ =
                     auVar221._4_4_ * (float)local_750._4_4_ +
                     auVar202._4_4_ * (float)local_760._4_4_ +
                     auVar168._4_4_ * (float)local_6a0._4_4_ +
                     auVar201._4_4_ * (float)local_690._4_4_;
                auVar203._8_4_ =
                     auVar221._8_4_ * (float)uStack_748 +
                     auVar202._8_4_ * (float)uStack_758 +
                     auVar168._8_4_ * (float)uStack_698 + auVar201._8_4_ * (float)uStack_688;
                auVar203._12_4_ =
                     auVar221._12_4_ * uStack_748._4_4_ +
                     auVar202._12_4_ * uStack_758._4_4_ +
                     auVar168._12_4_ * uStack_698._4_4_ + auVar201._12_4_ * uStack_688._4_4_;
                local_730.context = context->user;
                local_610 = vmovlps_avx(auVar203);
                local_608 = vextractps_avx(auVar203,2);
                local_5fc = (int)local_7a8;
                local_5f8 = (int)local_7b8;
                local_5f4 = (local_730.context)->instID[0];
                local_5f0 = (local_730.context)->instPrimID[0];
                local_7c4 = -1;
                local_730.valid = &local_7c4;
                local_730.geometryUserPtr = ((Geometry *)auVar129)->userPtr;
                local_730.ray = (RTCRayN *)ray;
                local_730.hit = (RTCHitN *)&local_610;
                local_730.N = 1;
                if (((Geometry *)auVar129)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00935e8e:
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((((Geometry *)auVar129)->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var16)(&local_730);
                    ray = local_7c0;
                    auVar129 = local_7a0;
                    if (*local_730.valid == 0) goto LAB_00935f2b;
                  }
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                       *(float *)local_730.hit;
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_730.hit + 4);
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_730.hit + 8);
                  *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                  *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                  *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                  *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                  *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                  *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                }
                else {
                  (*((Geometry *)auVar129)->intersectionFilterN)(&local_730);
                  ray = local_7c0;
                  auVar129 = local_7a0;
                  if (*local_730.valid != 0) goto LAB_00935e8e;
LAB_00935f2b:
                  (local_7c0->super_RayK<1>).tfar = (float)local_700._0_4_;
                  ray = local_7c0;
                  auVar129 = local_7a0;
                }
                *(undefined4 *)(local_480[0] + uVar123 * 4) = 0;
                auVar26 = local_480[0];
                fVar308 = (ray->super_RayK<1>).tfar;
                auVar149._4_4_ = fVar308;
                auVar149._0_4_ = fVar308;
                auVar149._8_4_ = fVar308;
                auVar149._12_4_ = fVar308;
                auVar149._16_4_ = fVar308;
                auVar149._20_4_ = fVar308;
                auVar149._24_4_ = fVar308;
                auVar149._28_4_ = fVar308;
                auVar28 = vcmpps_avx(local_320,auVar149,2);
                auVar145 = vandps_avx(auVar28,local_480[0]);
                local_480[0] = auVar145;
                auVar26 = auVar26 & auVar28;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0x7f,0) == '\0') &&
                      (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0xbf,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar26[0x1f]) goto LAB_00935fcb;
                auVar176._8_4_ = 0x7f800000;
                auVar176._0_8_ = 0x7f8000007f800000;
                auVar176._12_4_ = 0x7f800000;
                auVar176._16_4_ = 0x7f800000;
                auVar176._20_4_ = 0x7f800000;
                auVar176._24_4_ = 0x7f800000;
                auVar176._28_4_ = 0x7f800000;
                auVar28 = vblendvps_avx(auVar176,local_320,auVar145);
                auVar26 = vshufps_avx(auVar28,auVar28,0xb1);
                auVar26 = vminps_avx(auVar28,auVar26);
                auVar27 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar28 = vcmpps_avx(auVar28,auVar26,0);
                auVar26 = auVar145 & auVar28;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0xbf,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar145 = vandps_avx(auVar28,auVar145);
                }
                _local_700 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar120 = vmovmskps_avx(auVar145);
                uVar122 = 0;
                if (uVar120 != 0) {
                  for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                  }
                }
                uVar123 = (ulong)uVar122;
              } while( true );
            }
            fVar308 = local_160[uVar123];
            fVar320 = 1.0 - fVar308;
            fVar317 = fVar308 * 3.0;
            auVar168 = ZEXT416((uint)((fVar320 * -2.0 * fVar308 + fVar308 * fVar308) * 0.5));
            auVar168 = vshufps_avx(auVar168,auVar168,0);
            auVar201 = ZEXT416((uint)(((fVar320 + fVar320) * (fVar317 + 2.0) +
                                      fVar320 * fVar320 * -3.0) * 0.5));
            auVar201 = vshufps_avx(auVar201,auVar201,0);
            auVar202 = ZEXT416((uint)(((fVar308 + fVar308) * (fVar317 + -5.0) + fVar308 * fVar317) *
                                     0.5));
            auVar202 = vshufps_avx(auVar202,auVar202,0);
            fVar317 = *(float *)((long)&local_140 + uVar123 * 4);
            auVar221 = ZEXT416((uint)((fVar308 * (fVar320 + fVar320) - fVar320 * fVar320) * 0.5));
            auVar221 = vshufps_avx(auVar221,auVar221,0);
            auVar169._0_4_ =
                 auVar221._0_4_ * (float)local_750._0_4_ +
                 auVar202._0_4_ * (float)local_760._0_4_ +
                 auVar168._0_4_ * (float)local_6a0._0_4_ + auVar201._0_4_ * (float)local_690._0_4_;
            auVar169._4_4_ =
                 auVar221._4_4_ * (float)local_750._4_4_ +
                 auVar202._4_4_ * (float)local_760._4_4_ +
                 auVar168._4_4_ * (float)local_6a0._4_4_ + auVar201._4_4_ * (float)local_690._4_4_;
            auVar169._8_4_ =
                 auVar221._8_4_ * (float)uStack_748 +
                 auVar202._8_4_ * (float)uStack_758 +
                 auVar168._8_4_ * (float)uStack_698 + auVar201._8_4_ * (float)uStack_688;
            auVar169._12_4_ =
                 auVar221._12_4_ * uStack_748._4_4_ +
                 auVar202._12_4_ * uStack_758._4_4_ +
                 auVar168._12_4_ * uStack_698._4_4_ + auVar201._12_4_ * uStack_688._4_4_;
            (ray->super_RayK<1>).tfar = *(float *)(local_120 + uVar123 * 4);
            uVar11 = vmovlps_avx(auVar169);
            *(undefined8 *)&(ray->Ng).field_0 = uVar11;
            fVar320 = (float)vextractps_avx(auVar169,2);
            (ray->Ng).field_0.field_0.z = fVar320;
            ray->u = fVar308;
            ray->v = fVar317;
            ray->primID = (uint)local_7a8;
            ray->geomID = (uint)local_7b8;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            goto LAB_00935c60;
          }
          goto LAB_00935c7a;
        }
        auVar289 = ZEXT3264(local_6e0);
        auVar306 = ZEXT3264(local_680);
        auVar341 = ZEXT3264(auVar341._0_32_);
        goto LAB_00935991;
      }
    }
    fVar308 = (ray->super_RayK<1>).tfar;
    auVar136._4_4_ = fVar308;
    auVar136._0_4_ = fVar308;
    auVar136._8_4_ = fVar308;
    auVar136._12_4_ = fVar308;
    auVar168 = vcmpps_avx(local_250,auVar136,2);
    uVar122 = vmovmskps_avx(auVar168);
    uVar121 = (ulong)((uint)uVar121 & (uint)uVar121 + 0xf & uVar122);
  } while( true );
LAB_00935fcb:
  auVar289 = ZEXT3264(local_6e0);
  auVar306 = ZEXT3264(local_680);
  lVar125 = local_5c0._0_8_;
  fVar165 = (float)local_5a0._0_4_;
  fVar180 = (float)local_5a0._4_4_;
  fVar183 = fStack_598;
  fVar186 = fStack_594;
  fVar163 = fStack_590;
  fVar178 = fStack_58c;
  fVar181 = fStack_588;
  fVar184 = fStack_584;
  fVar192 = (float)local_640._0_4_;
  fVar210 = (float)local_640._4_4_;
  fVar212 = fStack_638;
  fVar214 = fStack_634;
  fVar254 = fStack_630;
  fVar262 = fStack_62c;
  fVar265 = fStack_628;
  fVar216 = (float)local_780._0_4_;
  fVar225 = (float)local_780._4_4_;
  fVar226 = fStack_778;
  fVar227 = fStack_774;
  fVar253 = fStack_770;
  fVar309 = fStack_76c;
  fVar318 = fStack_768;
LAB_00935c60:
  prim = local_740;
LAB_00935c7a:
  auVar341 = ZEXT3264(_local_660);
  fVar164 = (float)local_6c0._0_4_;
  fVar179 = (float)local_6c0._4_4_;
  fVar182 = fStack_6b8;
  fVar185 = fStack_6b4;
  fVar267 = fStack_6b0;
  fVar281 = fStack_6ac;
  fVar290 = fStack_6a8;
LAB_00935991:
  lVar126 = lVar126 + 8;
  fVar159 = (float)local_4a0._0_4_;
  fVar161 = (float)local_4a0._4_4_;
  fVar256 = fStack_498;
  fVar264 = fStack_494;
  fVar308 = fStack_490;
  fVar317 = fStack_48c;
  fVar320 = fStack_488;
  fVar321 = fStack_484;
  goto LAB_00935055;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }